

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiMBIntersectorK<8,16>::
     occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::CatmullRomCurveT,16>,embree::avx512::Occluded1KEpilog1<16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  float *pfVar1;
  Primitive PVar2;
  Geometry *pGVar3;
  __int_type_conflict _Var4;
  long lVar5;
  long lVar6;
  RTCFilterFunctionN p_Var7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  int iVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  byte bVar55;
  byte bVar56;
  byte bVar57;
  byte bVar58;
  uint uVar59;
  ulong uVar60;
  long lVar61;
  byte bVar62;
  uint uVar63;
  uint uVar64;
  uint uVar65;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  int iVar66;
  byte bVar67;
  long lVar68;
  bool bVar69;
  bool bVar70;
  ulong uVar71;
  uint uVar72;
  uint uVar147;
  uint uVar148;
  uint uVar149;
  uint uVar150;
  uint uVar151;
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  uint uVar152;
  undefined1 auVar140 [64];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar141 [64];
  undefined1 auVar143 [64];
  undefined1 auVar144 [64];
  undefined1 auVar146 [64];
  float pp;
  float fVar153;
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar168 [32];
  undefined1 auVar169 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined4 uVar170;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar171 [16];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  float fVar187;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  float fVar211;
  float fVar212;
  float fVar228;
  float fVar229;
  undefined1 auVar214 [16];
  float fVar213;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  float fVar230;
  float fVar231;
  float fVar232;
  undefined1 auVar227 [32];
  float fVar233;
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [32];
  float fVar244;
  undefined1 auVar242 [16];
  float fVar245;
  float fVar246;
  float fVar247;
  undefined1 auVar243 [32];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [32];
  undefined1 auVar253 [64];
  float fVar254;
  float fVar261;
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  float fVar259;
  float fVar260;
  undefined1 auVar257 [64];
  float fVar262;
  undefined1 auVar263 [64];
  undefined1 auVar264 [16];
  undefined1 auVar265 [64];
  float s;
  undefined1 auVar272 [32];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [32];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [32];
  undefined1 auVar273 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vint<16> mask;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloatx_conflict vu0;
  StackEntry stack [3];
  float local_c80;
  float local_aa0;
  float fStack_a9c;
  float fStack_a98;
  float fStack_a94;
  float fStack_a90;
  float fStack_a8c;
  float fStack_a88;
  RTCFilterFunctionNArguments local_a50;
  undefined1 local_a20 [8];
  float fStack_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  float fStack_a08;
  float fStack_a04;
  undefined1 local_a00 [32];
  undefined1 local_9e0 [16];
  undefined1 local_9d0 [16];
  undefined1 local_9c0 [8];
  float fStack_9b8;
  float fStack_9b4;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_930 [16];
  undefined1 local_920 [16];
  float local_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined1 local_900 [16];
  Primitive *local_8f0;
  ulong local_8e8;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  undefined1 local_800 [64];
  undefined1 local_7c0 [64];
  undefined1 local_780 [32];
  float local_760;
  float fStack_75c;
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_730 [16];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [64];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  RTCHitN local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  byte abStack_1a0 [32];
  undefined1 auStack_180 [32];
  ulong uStack_160;
  int aiStack_158 [74];
  undefined1 auVar124 [32];
  undefined1 auVar142 [64];
  undefined1 auVar145 [64];
  undefined1 auVar258 [64];
  
  PVar2 = prim[1];
  uVar60 = (ulong)(byte)PVar2;
  lVar61 = uVar60 * 0x25;
  fVar212 = *(float *)(prim + lVar61 + 0x12);
  auVar73 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar73 = vinsertps_avx(auVar73,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar15 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar80 = vinsertps_avx(auVar15,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar81 = vsubps_avx(auVar73,*(undefined1 (*) [16])(prim + lVar61 + 6));
  fVar211 = fVar212 * auVar81._0_4_;
  fVar153 = fVar212 * auVar80._0_4_;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar60 * 4 + 6);
  auVar91 = vpmovsxbd_avx2(auVar73);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar60 * 5 + 6);
  auVar88 = vpmovsxbd_avx2(auVar15);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar60 * 6 + 6);
  auVar89 = vpmovsxbd_avx2(auVar75);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar60 * 0xf + 6);
  auVar90 = vpmovsxbd_avx2(auVar76);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + 6);
  auVar97 = vpmovsxbd_avx2(auVar77);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar92 = vcvtdq2ps_avx(auVar97);
  auVar264._8_8_ = 0;
  auVar264._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + uVar60 + 6);
  auVar93 = vpmovsxbd_avx2(auVar264);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar60 * 0x1a + 6);
  auVar94 = vpmovsxbd_avx2(auVar74);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar60 * 0x1b + 6);
  auVar95 = vpmovsxbd_avx2(auVar78);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar60 * 0x1c + 6);
  auVar87 = vpmovsxbd_avx2(auVar79);
  auVar96 = vcvtdq2ps_avx(auVar87);
  auVar104._4_4_ = fVar153;
  auVar104._0_4_ = fVar153;
  auVar104._8_4_ = fVar153;
  auVar104._12_4_ = fVar153;
  auVar104._16_4_ = fVar153;
  auVar104._20_4_ = fVar153;
  auVar104._24_4_ = fVar153;
  auVar104._28_4_ = fVar153;
  auVar109._8_4_ = 1;
  auVar109._0_8_ = 0x100000001;
  auVar109._12_4_ = 1;
  auVar109._16_4_ = 1;
  auVar109._20_4_ = 1;
  auVar109._24_4_ = 1;
  auVar109._28_4_ = 1;
  auVar85 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar99 = ZEXT1632(CONCAT412(fVar212 * auVar80._12_4_,
                               CONCAT48(fVar212 * auVar80._8_4_,
                                        CONCAT44(fVar212 * auVar80._4_4_,fVar153))));
  auVar98 = vpermps_avx2(auVar109,auVar99);
  auVar86 = vpermps_avx512vl(auVar85,auVar99);
  fVar233 = auVar86._0_4_;
  fVar213 = auVar86._4_4_;
  auVar99._4_4_ = fVar213 * auVar89._4_4_;
  auVar99._0_4_ = fVar233 * auVar89._0_4_;
  fVar228 = auVar86._8_4_;
  auVar99._8_4_ = fVar228 * auVar89._8_4_;
  fVar229 = auVar86._12_4_;
  auVar99._12_4_ = fVar229 * auVar89._12_4_;
  fVar230 = auVar86._16_4_;
  auVar99._16_4_ = fVar230 * auVar89._16_4_;
  fVar231 = auVar86._20_4_;
  auVar99._20_4_ = fVar231 * auVar89._20_4_;
  fVar232 = auVar86._24_4_;
  auVar99._24_4_ = fVar232 * auVar89._24_4_;
  auVar99._28_4_ = auVar97._28_4_;
  auVar97._4_4_ = auVar93._4_4_ * fVar213;
  auVar97._0_4_ = auVar93._0_4_ * fVar233;
  auVar97._8_4_ = auVar93._8_4_ * fVar228;
  auVar97._12_4_ = auVar93._12_4_ * fVar229;
  auVar97._16_4_ = auVar93._16_4_ * fVar230;
  auVar97._20_4_ = auVar93._20_4_ * fVar231;
  auVar97._24_4_ = auVar93._24_4_ * fVar232;
  auVar97._28_4_ = auVar87._28_4_;
  auVar87._4_4_ = auVar96._4_4_ * fVar213;
  auVar87._0_4_ = auVar96._0_4_ * fVar233;
  auVar87._8_4_ = auVar96._8_4_ * fVar228;
  auVar87._12_4_ = auVar96._12_4_ * fVar229;
  auVar87._16_4_ = auVar96._16_4_ * fVar230;
  auVar87._20_4_ = auVar96._20_4_ * fVar231;
  auVar87._24_4_ = auVar96._24_4_ * fVar232;
  auVar87._28_4_ = auVar86._28_4_;
  auVar73 = vfmadd231ps_fma(auVar99,auVar98,auVar88);
  auVar15 = vfmadd231ps_fma(auVar97,auVar98,auVar92);
  auVar75 = vfmadd231ps_fma(auVar87,auVar95,auVar98);
  auVar73 = vfmadd231ps_fma(ZEXT1632(auVar73),auVar104,auVar91);
  auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar104,auVar90);
  auVar75 = vfmadd231ps_fma(ZEXT1632(auVar75),auVar94,auVar104);
  auVar108._4_4_ = fVar211;
  auVar108._0_4_ = fVar211;
  auVar108._8_4_ = fVar211;
  auVar108._12_4_ = fVar211;
  auVar108._16_4_ = fVar211;
  auVar108._20_4_ = fVar211;
  auVar108._24_4_ = fVar211;
  auVar108._28_4_ = fVar211;
  auVar87 = ZEXT1632(CONCAT412(fVar212 * auVar81._12_4_,
                               CONCAT48(fVar212 * auVar81._8_4_,
                                        CONCAT44(fVar212 * auVar81._4_4_,fVar211))));
  auVar97 = vpermps_avx2(auVar109,auVar87);
  auVar87 = vpermps_avx512vl(auVar85,auVar87);
  fVar212 = auVar87._0_4_;
  fVar233 = auVar87._4_4_;
  auVar98._4_4_ = fVar233 * auVar89._4_4_;
  auVar98._0_4_ = fVar212 * auVar89._0_4_;
  fVar213 = auVar87._8_4_;
  auVar98._8_4_ = fVar213 * auVar89._8_4_;
  fVar228 = auVar87._12_4_;
  auVar98._12_4_ = fVar228 * auVar89._12_4_;
  fVar229 = auVar87._16_4_;
  auVar98._16_4_ = fVar229 * auVar89._16_4_;
  fVar230 = auVar87._20_4_;
  auVar98._20_4_ = fVar230 * auVar89._20_4_;
  fVar231 = auVar87._24_4_;
  auVar98._24_4_ = fVar231 * auVar89._24_4_;
  auVar98._28_4_ = fVar153;
  auVar85._4_4_ = auVar93._4_4_ * fVar233;
  auVar85._0_4_ = auVar93._0_4_ * fVar212;
  auVar85._8_4_ = auVar93._8_4_ * fVar213;
  auVar85._12_4_ = auVar93._12_4_ * fVar228;
  auVar85._16_4_ = auVar93._16_4_ * fVar229;
  auVar85._20_4_ = auVar93._20_4_ * fVar230;
  auVar85._24_4_ = auVar93._24_4_ * fVar231;
  auVar85._28_4_ = auVar89._28_4_;
  auVar93._4_4_ = auVar96._4_4_ * fVar233;
  auVar93._0_4_ = auVar96._0_4_ * fVar212;
  auVar93._8_4_ = auVar96._8_4_ * fVar213;
  auVar93._12_4_ = auVar96._12_4_ * fVar228;
  auVar93._16_4_ = auVar96._16_4_ * fVar229;
  auVar93._20_4_ = auVar96._20_4_ * fVar230;
  auVar93._24_4_ = auVar96._24_4_ * fVar231;
  auVar93._28_4_ = auVar87._28_4_;
  auVar76 = vfmadd231ps_fma(auVar98,auVar97,auVar88);
  auVar77 = vfmadd231ps_fma(auVar85,auVar97,auVar92);
  auVar264 = vfmadd231ps_fma(auVar93,auVar97,auVar95);
  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar108,auVar91);
  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar77),auVar108,auVar90);
  auVar106._8_4_ = 0x7fffffff;
  auVar106._0_8_ = 0x7fffffff7fffffff;
  auVar106._12_4_ = 0x7fffffff;
  auVar106._16_4_ = 0x7fffffff;
  auVar106._20_4_ = 0x7fffffff;
  auVar106._24_4_ = 0x7fffffff;
  auVar106._28_4_ = 0x7fffffff;
  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar264),auVar108,auVar94);
  auVar91 = vandps_avx(ZEXT1632(auVar73),auVar106);
  auVar107._8_4_ = 0x219392ef;
  auVar107._0_8_ = 0x219392ef219392ef;
  auVar107._12_4_ = 0x219392ef;
  auVar107._16_4_ = 0x219392ef;
  auVar107._20_4_ = 0x219392ef;
  auVar107._24_4_ = 0x219392ef;
  auVar107._28_4_ = 0x219392ef;
  uVar71 = vcmpps_avx512vl(auVar91,auVar107,1);
  bVar69 = (bool)((byte)uVar71 & 1);
  auVar86._0_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar73._0_4_;
  bVar69 = (bool)((byte)(uVar71 >> 1) & 1);
  auVar86._4_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar73._4_4_;
  bVar69 = (bool)((byte)(uVar71 >> 2) & 1);
  auVar86._8_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar73._8_4_;
  bVar69 = (bool)((byte)(uVar71 >> 3) & 1);
  auVar86._12_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar73._12_4_;
  auVar86._16_4_ = (uint)((byte)(uVar71 >> 4) & 1) * 0x219392ef;
  auVar86._20_4_ = (uint)((byte)(uVar71 >> 5) & 1) * 0x219392ef;
  auVar86._24_4_ = (uint)((byte)(uVar71 >> 6) & 1) * 0x219392ef;
  auVar86._28_4_ = (uint)(byte)(uVar71 >> 7) * 0x219392ef;
  auVar91 = vandps_avx(ZEXT1632(auVar15),auVar106);
  uVar71 = vcmpps_avx512vl(auVar91,auVar107,1);
  bVar69 = (bool)((byte)uVar71 & 1);
  auVar100._0_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar15._0_4_;
  bVar69 = (bool)((byte)(uVar71 >> 1) & 1);
  auVar100._4_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar15._4_4_;
  bVar69 = (bool)((byte)(uVar71 >> 2) & 1);
  auVar100._8_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar15._8_4_;
  bVar69 = (bool)((byte)(uVar71 >> 3) & 1);
  auVar100._12_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar15._12_4_;
  auVar100._16_4_ = (uint)((byte)(uVar71 >> 4) & 1) * 0x219392ef;
  auVar100._20_4_ = (uint)((byte)(uVar71 >> 5) & 1) * 0x219392ef;
  auVar100._24_4_ = (uint)((byte)(uVar71 >> 6) & 1) * 0x219392ef;
  auVar100._28_4_ = (uint)(byte)(uVar71 >> 7) * 0x219392ef;
  auVar91 = vandps_avx(ZEXT1632(auVar75),auVar106);
  uVar71 = vcmpps_avx512vl(auVar91,auVar107,1);
  bVar69 = (bool)((byte)uVar71 & 1);
  auVar91._0_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar75._0_4_;
  bVar69 = (bool)((byte)(uVar71 >> 1) & 1);
  auVar91._4_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar75._4_4_;
  bVar69 = (bool)((byte)(uVar71 >> 2) & 1);
  auVar91._8_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar75._8_4_;
  bVar69 = (bool)((byte)(uVar71 >> 3) & 1);
  auVar91._12_4_ = (uint)bVar69 * 0x219392ef | (uint)!bVar69 * auVar75._12_4_;
  auVar91._16_4_ = (uint)((byte)(uVar71 >> 4) & 1) * 0x219392ef;
  auVar91._20_4_ = (uint)((byte)(uVar71 >> 5) & 1) * 0x219392ef;
  auVar91._24_4_ = (uint)((byte)(uVar71 >> 6) & 1) * 0x219392ef;
  auVar91._28_4_ = (uint)(byte)(uVar71 >> 7) * 0x219392ef;
  auVar88 = vrcp14ps_avx512vl(auVar86);
  auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar273 = ZEXT3264(auVar89);
  auVar90 = vfnmadd213ps_avx512vl(auVar86,auVar88,auVar89);
  auVar73 = vfmadd132ps_fma(auVar90,auVar88,auVar88);
  auVar88 = vrcp14ps_avx512vl(auVar100);
  auVar90 = vfnmadd213ps_avx512vl(auVar100,auVar88,auVar89);
  auVar15 = vfmadd132ps_fma(auVar90,auVar88,auVar88);
  auVar88 = vrcp14ps_avx512vl(auVar91);
  auVar91 = vfnmadd213ps_avx512vl(auVar91,auVar88,auVar89);
  auVar75 = vfmadd132ps_fma(auVar91,auVar88,auVar88);
  fVar212 = (*(float *)(ray + k * 4 + 0x1c0) - *(float *)(prim + lVar61 + 0x16)) *
            *(float *)(prim + lVar61 + 0x1a);
  auVar105._4_4_ = fVar212;
  auVar105._0_4_ = fVar212;
  auVar105._8_4_ = fVar212;
  auVar105._12_4_ = fVar212;
  auVar105._16_4_ = fVar212;
  auVar105._20_4_ = fVar212;
  auVar105._24_4_ = fVar212;
  auVar105._28_4_ = fVar212;
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar60 * 7 + 6));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar60 * 0xb + 6));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,auVar91);
  auVar89 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar60 * 9 + 6));
  auVar76 = vfmadd213ps_fma(auVar88,auVar105,auVar91);
  auVar91 = vcvtdq2ps_avx(auVar89);
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar60 * 0xd + 6));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,auVar91);
  auVar77 = vfmadd213ps_fma(auVar88,auVar105,auVar91);
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar60 * 0x12 + 6));
  auVar91 = vcvtdq2ps_avx(auVar91);
  uVar71 = (ulong)(uint)((int)(uVar60 * 5) << 2);
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar60 * 2 + uVar71 + 6));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,auVar91);
  auVar264 = vfmadd213ps_fma(auVar88,auVar105,auVar91);
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar71 + 6));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar60 * 0x18 + 6));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,auVar91);
  auVar74 = vfmadd213ps_fma(auVar88,auVar105,auVar91);
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar60 * 0x1d + 6));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar60 + (ulong)(byte)PVar2 * 0x20 + 6));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,auVar91);
  auVar78 = vfmadd213ps_fma(auVar88,auVar105,auVar91);
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + ((ulong)(byte)PVar2 * 0x20 - uVar60) + 6));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar60 * 0x23 + 6));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,auVar91);
  auVar79 = vfmadd213ps_fma(auVar88,auVar105,auVar91);
  auVar91 = vsubps_avx(ZEXT1632(auVar76),ZEXT1632(auVar80));
  auVar94._4_4_ = auVar73._4_4_ * auVar91._4_4_;
  auVar94._0_4_ = auVar73._0_4_ * auVar91._0_4_;
  auVar94._8_4_ = auVar73._8_4_ * auVar91._8_4_;
  auVar94._12_4_ = auVar73._12_4_ * auVar91._12_4_;
  auVar94._16_4_ = auVar91._16_4_ * 0.0;
  auVar94._20_4_ = auVar91._20_4_ * 0.0;
  auVar94._24_4_ = auVar91._24_4_ * 0.0;
  auVar94._28_4_ = auVar91._28_4_;
  auVar91 = vsubps_avx(ZEXT1632(auVar77),ZEXT1632(auVar80));
  auVar103._0_4_ = auVar73._0_4_ * auVar91._0_4_;
  auVar103._4_4_ = auVar73._4_4_ * auVar91._4_4_;
  auVar103._8_4_ = auVar73._8_4_ * auVar91._8_4_;
  auVar103._12_4_ = auVar73._12_4_ * auVar91._12_4_;
  auVar103._16_4_ = auVar91._16_4_ * 0.0;
  auVar103._20_4_ = auVar91._20_4_ * 0.0;
  auVar103._24_4_ = auVar91._24_4_ * 0.0;
  auVar103._28_4_ = 0;
  auVar91 = vsubps_avx(ZEXT1632(auVar264),ZEXT1632(auVar81));
  auVar95._4_4_ = auVar15._4_4_ * auVar91._4_4_;
  auVar95._0_4_ = auVar15._0_4_ * auVar91._0_4_;
  auVar95._8_4_ = auVar15._8_4_ * auVar91._8_4_;
  auVar95._12_4_ = auVar15._12_4_ * auVar91._12_4_;
  auVar95._16_4_ = auVar91._16_4_ * 0.0;
  auVar95._20_4_ = auVar91._20_4_ * 0.0;
  auVar95._24_4_ = auVar91._24_4_ * 0.0;
  auVar95._28_4_ = auVar91._28_4_;
  auVar91 = vsubps_avx(ZEXT1632(auVar74),ZEXT1632(auVar81));
  auVar102._0_4_ = auVar15._0_4_ * auVar91._0_4_;
  auVar102._4_4_ = auVar15._4_4_ * auVar91._4_4_;
  auVar102._8_4_ = auVar15._8_4_ * auVar91._8_4_;
  auVar102._12_4_ = auVar15._12_4_ * auVar91._12_4_;
  auVar102._16_4_ = auVar91._16_4_ * 0.0;
  auVar102._20_4_ = auVar91._20_4_ * 0.0;
  auVar102._24_4_ = auVar91._24_4_ * 0.0;
  auVar102._28_4_ = 0;
  auVar91 = vsubps_avx(ZEXT1632(auVar78),ZEXT1632(auVar82));
  auVar96._4_4_ = auVar75._4_4_ * auVar91._4_4_;
  auVar96._0_4_ = auVar75._0_4_ * auVar91._0_4_;
  auVar96._8_4_ = auVar75._8_4_ * auVar91._8_4_;
  auVar96._12_4_ = auVar75._12_4_ * auVar91._12_4_;
  auVar96._16_4_ = auVar91._16_4_ * 0.0;
  auVar96._20_4_ = auVar91._20_4_ * 0.0;
  auVar96._24_4_ = auVar91._24_4_ * 0.0;
  auVar96._28_4_ = auVar91._28_4_;
  auVar91 = vsubps_avx(ZEXT1632(auVar79),ZEXT1632(auVar82));
  auVar101._0_4_ = auVar75._0_4_ * auVar91._0_4_;
  auVar101._4_4_ = auVar75._4_4_ * auVar91._4_4_;
  auVar101._8_4_ = auVar75._8_4_ * auVar91._8_4_;
  auVar101._12_4_ = auVar75._12_4_ * auVar91._12_4_;
  auVar101._16_4_ = auVar91._16_4_ * 0.0;
  auVar101._20_4_ = auVar91._20_4_ * 0.0;
  auVar101._24_4_ = auVar91._24_4_ * 0.0;
  auVar101._28_4_ = 0;
  auVar91 = vpminsd_avx2(auVar94,auVar103);
  auVar88 = vpminsd_avx2(auVar95,auVar102);
  auVar91 = vmaxps_avx(auVar91,auVar88);
  auVar88 = vpminsd_avx2(auVar96,auVar101);
  uVar170 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar89._4_4_ = uVar170;
  auVar89._0_4_ = uVar170;
  auVar89._8_4_ = uVar170;
  auVar89._12_4_ = uVar170;
  auVar89._16_4_ = uVar170;
  auVar89._20_4_ = uVar170;
  auVar89._24_4_ = uVar170;
  auVar89._28_4_ = uVar170;
  auVar88 = vmaxps_avx512vl(auVar88,auVar89);
  auVar91 = vmaxps_avx(auVar91,auVar88);
  auVar88._8_4_ = 0x3f7ffffa;
  auVar88._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar88._12_4_ = 0x3f7ffffa;
  auVar88._16_4_ = 0x3f7ffffa;
  auVar88._20_4_ = 0x3f7ffffa;
  auVar88._24_4_ = 0x3f7ffffa;
  auVar88._28_4_ = 0x3f7ffffa;
  local_680 = vmulps_avx512vl(auVar91,auVar88);
  auVar91 = vpmaxsd_avx2(auVar94,auVar103);
  auVar88 = vpmaxsd_avx2(auVar95,auVar102);
  auVar91 = vminps_avx(auVar91,auVar88);
  auVar88 = vpmaxsd_avx2(auVar96,auVar101);
  uVar170 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar90._4_4_ = uVar170;
  auVar90._0_4_ = uVar170;
  auVar90._8_4_ = uVar170;
  auVar90._12_4_ = uVar170;
  auVar90._16_4_ = uVar170;
  auVar90._20_4_ = uVar170;
  auVar90._24_4_ = uVar170;
  auVar90._28_4_ = uVar170;
  auVar88 = vminps_avx512vl(auVar88,auVar90);
  auVar91 = vminps_avx(auVar91,auVar88);
  auVar92._8_4_ = 0x3f800003;
  auVar92._0_8_ = 0x3f8000033f800003;
  auVar92._12_4_ = 0x3f800003;
  auVar92._16_4_ = 0x3f800003;
  auVar92._20_4_ = 0x3f800003;
  auVar92._24_4_ = 0x3f800003;
  auVar92._28_4_ = 0x3f800003;
  auVar91 = vmulps_avx512vl(auVar91,auVar92);
  auVar88 = vpbroadcastd_avx512vl();
  uVar17 = vpcmpgtd_avx512vl(auVar88,_DAT_01fe9900);
  uVar16 = vcmpps_avx512vl(local_680,auVar91,2);
  if ((byte)((byte)uVar16 & (byte)uVar17) == 0) {
    return false;
  }
  local_8e8 = (ulong)(byte)((byte)uVar16 & (byte)uVar17);
  auVar169 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_500 = vmovdqa64_avx512f(auVar169);
  local_8f0 = prim;
LAB_01e78451:
  lVar61 = 0;
  for (uVar71 = local_8e8; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x8000000000000000) {
    lVar61 = lVar61 + 1;
  }
  uVar63 = *(uint *)(local_8f0 + 2);
  pGVar3 = (context->scene->geometries).items[uVar63].ptr;
  uVar71 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           (ulong)*(uint *)(local_8f0 + lVar61 * 4 + 6) *
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar212 = (pGVar3->time_range).lower;
  fVar212 = pGVar3->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x1c0) - fVar212) / ((pGVar3->time_range).upper - fVar212));
  auVar73 = vroundss_avx(ZEXT416((uint)fVar212),ZEXT416((uint)fVar212),9);
  auVar73 = vminss_avx(auVar73,ZEXT416((uint)(pGVar3->fnumTimeSegments + -1.0)));
  auVar73 = vmaxss_avx(ZEXT816(0) << 0x20,auVar73);
  fVar212 = fVar212 - auVar73._0_4_;
  _Var4 = pGVar3[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar68 = (long)(int)auVar73._0_4_ * 0x38;
  lVar61 = *(long *)(_Var4 + 0x10 + lVar68);
  lVar5 = *(long *)(_Var4 + 0x38 + lVar68);
  lVar6 = *(long *)(_Var4 + 0x48 + lVar68);
  pfVar1 = (float *)(lVar5 + uVar71 * lVar6);
  auVar81._0_4_ = fVar212 * *pfVar1;
  auVar81._4_4_ = fVar212 * pfVar1[1];
  auVar81._8_4_ = fVar212 * pfVar1[2];
  auVar81._12_4_ = fVar212 * pfVar1[3];
  pfVar1 = (float *)(lVar5 + (uVar71 + 1) * lVar6);
  auVar82._0_4_ = fVar212 * *pfVar1;
  auVar82._4_4_ = fVar212 * pfVar1[1];
  auVar82._8_4_ = fVar212 * pfVar1[2];
  auVar82._12_4_ = fVar212 * pfVar1[3];
  pfVar1 = (float *)(lVar5 + (uVar71 + 2) * lVar6);
  auVar83._0_4_ = fVar212 * *pfVar1;
  auVar83._4_4_ = fVar212 * pfVar1[1];
  auVar83._8_4_ = fVar212 * pfVar1[2];
  auVar83._12_4_ = fVar212 * pfVar1[3];
  pfVar1 = (float *)(lVar5 + lVar6 * (uVar71 + 3));
  auVar214._0_4_ = fVar212 * *pfVar1;
  auVar214._4_4_ = fVar212 * pfVar1[1];
  auVar214._8_4_ = fVar212 * pfVar1[2];
  auVar214._12_4_ = fVar212 * pfVar1[3];
  lVar5 = *(long *)(_Var4 + lVar68);
  fVar212 = 1.0 - fVar212;
  auVar84._4_4_ = fVar212;
  auVar84._0_4_ = fVar212;
  auVar84._8_4_ = fVar212;
  auVar84._12_4_ = fVar212;
  auVar75 = vfmadd231ps_fma(auVar81,auVar84,*(undefined1 (*) [16])(lVar5 + lVar61 * uVar71));
  auVar76 = vfmadd231ps_fma(auVar82,auVar84,*(undefined1 (*) [16])(lVar5 + lVar61 * (uVar71 + 1)));
  auVar77 = vfmadd231ps_fma(auVar83,auVar84,*(undefined1 (*) [16])(lVar5 + lVar61 * (uVar71 + 2)));
  auVar73 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar15 = vinsertps_avx(auVar73,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  auVar169 = vpbroadcastd_avx512f();
  local_480 = vmovdqa64_avx512f(auVar169);
  uVar170 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar269._4_4_ = uVar170;
  auVar269._0_4_ = uVar170;
  auVar269._8_4_ = uVar170;
  auVar269._12_4_ = uVar170;
  fStack_810 = (float)uVar170;
  _local_820 = auVar269;
  fStack_80c = (float)uVar170;
  fStack_808 = (float)uVar170;
  register0x0000155c = uVar170;
  uVar170 = *(undefined4 *)(ray + k * 4 + 0x140);
  auVar270._4_4_ = uVar170;
  auVar270._0_4_ = uVar170;
  auVar270._8_4_ = uVar170;
  auVar270._12_4_ = uVar170;
  local_840._16_4_ = uVar170;
  local_840._0_16_ = auVar270;
  local_840._20_4_ = uVar170;
  local_840._24_4_ = uVar170;
  local_840._28_4_ = uVar170;
  auVar73 = vunpcklps_avx(auVar269,auVar270);
  auVar169._0_32_ = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x180)));
  auVar78 = auVar169._0_16_;
  local_9d0 = vinsertps_avx512f(auVar73,auVar78,0x28);
  auVar263 = ZEXT1664(local_9d0);
  fVar212 = *(float *)(ray + k * 4 + 0xc0);
  auVar265 = ZEXT464((uint)fVar212);
  auVar242._0_4_ = auVar75._0_4_ + auVar76._0_4_;
  auVar242._4_4_ = auVar75._4_4_ + auVar76._4_4_;
  auVar242._8_4_ = auVar75._8_4_ + auVar76._8_4_;
  auVar242._12_4_ = auVar75._12_4_ + auVar76._12_4_;
  auVar80._8_4_ = 0x3f000000;
  auVar80._0_8_ = 0x3f0000003f000000;
  auVar80._12_4_ = 0x3f000000;
  auVar73 = vmulps_avx512vl(auVar242,auVar80);
  auVar73 = vsubps_avx(auVar73,auVar15);
  auVar73 = vdpps_avx(auVar73,local_9d0,0x7f);
  local_9e0 = vdpps_avx(local_9d0,local_9d0,0x7f);
  auVar248._4_12_ = ZEXT812(0) << 0x20;
  auVar248._0_4_ = local_9e0._0_4_;
  auVar74 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar248);
  auVar264 = vfnmadd213ss_fma(auVar74,local_9e0,ZEXT416(0x40000000));
  fVar153 = auVar73._0_4_ * auVar264._0_4_ * auVar74._0_4_;
  auVar249._4_4_ = fVar153;
  auVar249._0_4_ = fVar153;
  auVar249._8_4_ = fVar153;
  auVar249._12_4_ = fVar153;
  auVar73 = vfmadd231ps_fma(auVar15,local_9d0,auVar249);
  auVar73 = vblendps_avx(auVar73,ZEXT816(0) << 0x40,8);
  auVar15 = vsubps_avx(auVar75,auVar73);
  auVar253 = ZEXT1664(auVar15);
  auVar75 = vsubps_avx(auVar77,auVar73);
  auVar257 = ZEXT1664(auVar75);
  auVar77 = vfmadd231ps_fma(auVar214,auVar84,*(undefined1 (*) [16])(lVar5 + lVar61 * (uVar71 + 3)));
  auVar76 = vsubps_avx(auVar76,auVar73);
  auVar73 = vsubps_avx(auVar77,auVar73);
  auVar91 = vbroadcastss_avx512vl(auVar15);
  auVar111._8_4_ = 1;
  auVar111._0_8_ = 0x100000001;
  auVar111._12_4_ = 1;
  auVar111._16_4_ = 1;
  auVar111._20_4_ = 1;
  auVar111._24_4_ = 1;
  auVar111._28_4_ = 1;
  local_960 = ZEXT1632(auVar15);
  auVar88 = vpermps_avx512vl(auVar111,local_960);
  auVar112._8_4_ = 2;
  auVar112._0_8_ = 0x200000002;
  auVar112._12_4_ = 2;
  auVar112._16_4_ = 2;
  auVar112._20_4_ = 2;
  auVar112._24_4_ = 2;
  auVar112._28_4_ = 2;
  auVar89 = vpermps_avx512vl(auVar112,local_960);
  auVar113._8_4_ = 3;
  auVar113._0_8_ = 0x300000003;
  auVar113._12_4_ = 3;
  auVar113._16_4_ = 3;
  auVar113._20_4_ = 3;
  auVar113._24_4_ = 3;
  auVar113._28_4_ = 3;
  auVar90 = vpermps_avx512vl(auVar113,local_960);
  auVar92 = vbroadcastss_avx512vl(auVar76);
  local_9a0 = ZEXT1632(auVar76);
  auVar93 = vpermps_avx512vl(auVar111,local_9a0);
  auVar94 = vpermps_avx512vl(auVar112,local_9a0);
  auVar95 = vpermps_avx512vl(auVar113,local_9a0);
  auVar96 = vbroadcastss_avx512vl(auVar75);
  local_980 = ZEXT1632(auVar75);
  auVar97 = vpermps_avx512vl(auVar111,local_980);
  local_600 = vpermps_avx512vl(auVar112,local_980);
  local_560 = vpermps_avx2(auVar113,local_980);
  uVar170 = auVar73._0_4_;
  local_620._4_4_ = uVar170;
  local_620._0_4_ = uVar170;
  local_620._8_4_ = uVar170;
  local_620._12_4_ = uVar170;
  local_620._16_4_ = uVar170;
  local_620._20_4_ = uVar170;
  local_620._24_4_ = uVar170;
  local_620._28_4_ = uVar170;
  _local_9c0 = ZEXT1632(auVar73);
  local_640 = vpermps_avx512vl(auVar111,_local_9c0);
  local_580 = vpermps_avx2(auVar112,_local_9c0);
  _local_5a0 = vpermps_avx2(auVar113,_local_9c0);
  auVar140._16_48_ = auVar169._16_48_;
  auVar140._0_16_ = vmulss_avx512f(auVar78,auVar78);
  auVar73 = vfmadd231ps_fma(ZEXT1632(auVar140._0_16_),local_840,local_840);
  auVar73 = vfmadd231ps_fma(ZEXT1632(auVar73),_local_820,_local_820);
  local_5c0._0_4_ = auVar73._0_4_;
  local_5c0._4_4_ = local_5c0._0_4_;
  local_5c0._8_4_ = local_5c0._0_4_;
  local_5c0._12_4_ = local_5c0._0_4_;
  local_5c0._16_4_ = local_5c0._0_4_;
  local_5c0._20_4_ = local_5c0._0_4_;
  local_5c0._24_4_ = local_5c0._0_4_;
  local_5c0._28_4_ = local_5c0._0_4_;
  auVar110._8_4_ = 0x7fffffff;
  auVar110._0_8_ = 0x7fffffff7fffffff;
  auVar110._12_4_ = 0x7fffffff;
  auVar110._16_4_ = 0x7fffffff;
  auVar110._20_4_ = 0x7fffffff;
  auVar110._24_4_ = 0x7fffffff;
  auVar110._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_5c0,auVar110);
  local_5e0 = auVar140._0_32_;
  local_930 = ZEXT416((uint)fVar153);
  local_660 = fVar212 - fVar153;
  fStack_65c = local_660;
  fStack_658 = local_660;
  fStack_654 = local_660;
  fStack_650 = local_660;
  fStack_64c = local_660;
  fStack_648 = local_660;
  fStack_644 = local_660;
  uVar64 = 0;
  bVar69 = false;
  iVar66 = 1;
  auVar140 = vpbroadcastd_avx512f();
  local_4c0 = vmovdqa64_avx512f(auVar140);
  auVar73 = vsqrtss_avx(local_9e0,local_9e0);
  auVar15 = vsqrtss_avx(local_9e0,local_9e0);
  auVar140 = ZEXT1664(ZEXT816(0x3f80000000000000));
  local_860 = auVar169._0_32_;
  do {
    local_730 = auVar140._0_16_;
    auVar75 = vmovshdup_avx(local_730);
    auVar75 = vsubps_avx(auVar75,local_730);
    auVar162._0_4_ = auVar75._0_4_;
    fVar233 = auVar162._0_4_ * 0.04761905;
    uVar170 = auVar140._0_4_;
    auVar236._4_4_ = uVar170;
    auVar236._0_4_ = uVar170;
    auVar236._8_4_ = uVar170;
    auVar236._12_4_ = uVar170;
    auVar236._16_4_ = uVar170;
    auVar236._20_4_ = uVar170;
    auVar236._24_4_ = uVar170;
    auVar236._28_4_ = uVar170;
    auVar162._4_4_ = auVar162._0_4_;
    auVar162._8_4_ = auVar162._0_4_;
    auVar162._12_4_ = auVar162._0_4_;
    auVar162._16_4_ = auVar162._0_4_;
    auVar162._20_4_ = auVar162._0_4_;
    auVar162._24_4_ = auVar162._0_4_;
    auVar162._28_4_ = auVar162._0_4_;
    auVar75 = vfmadd231ps_fma(auVar236,auVar162,_DAT_01faff20);
    auVar272 = auVar273._0_32_;
    auVar87 = vsubps_avx512vl(auVar272,ZEXT1632(auVar75));
    fVar213 = auVar75._0_4_;
    fVar228 = auVar75._4_4_;
    fVar229 = auVar75._8_4_;
    fVar230 = auVar75._12_4_;
    fVar232 = auVar87._0_4_;
    fVar211 = auVar87._4_4_;
    fVar244 = auVar87._8_4_;
    fVar245 = auVar87._12_4_;
    fVar246 = auVar87._16_4_;
    fVar187 = auVar87._20_4_;
    fVar247 = auVar87._24_4_;
    auVar120._4_4_ = fVar211 * fVar211 * -fVar228;
    auVar120._0_4_ = fVar232 * fVar232 * -fVar213;
    auVar120._8_4_ = fVar244 * fVar244 * -fVar229;
    auVar120._12_4_ = fVar245 * fVar245 * -fVar230;
    auVar120._16_4_ = fVar246 * fVar246 * -0.0;
    auVar120._20_4_ = fVar187 * fVar187 * -0.0;
    auVar120._24_4_ = fVar247 * fVar247 * -0.0;
    auVar120._28_4_ = 0x80000000;
    auVar253._0_28_ =
         ZEXT1628(CONCAT412(fVar230 * fVar230,
                            CONCAT48(fVar229 * fVar229,CONCAT44(fVar228 * fVar228,fVar213 * fVar213)
                                    )));
    fVar254 = fVar213 * 3.0;
    fVar259 = fVar228 * 3.0;
    fVar260 = fVar229 * 3.0;
    fVar261 = fVar230 * 3.0;
    auVar258._28_36_ = auVar257._28_36_;
    auVar258._0_28_ = ZEXT1628(CONCAT412(fVar261,CONCAT48(fVar260,CONCAT44(fVar259,fVar254))));
    fVar262 = auVar257._28_4_ + -5.0;
    auVar182._0_4_ = (fVar254 + -5.0) * fVar213 * fVar213 + 2.0;
    auVar182._4_4_ = (fVar259 + -5.0) * fVar228 * fVar228 + 2.0;
    auVar182._8_4_ = (fVar260 + -5.0) * fVar229 * fVar229 + 2.0;
    auVar182._12_4_ = (fVar261 + -5.0) * fVar230 * fVar230 + 2.0;
    auVar182._16_4_ = 0x40000000;
    auVar182._20_4_ = 0x40000000;
    auVar182._24_4_ = 0x40000000;
    auVar182._28_4_ = auVar140._28_4_ + 2.0;
    auVar257._0_4_ = fVar232 * fVar232;
    auVar257._4_4_ = fVar211 * fVar211;
    auVar257._8_4_ = fVar244 * fVar244;
    auVar257._12_4_ = fVar245 * fVar245;
    auVar257._16_4_ = fVar246 * fVar246;
    auVar257._20_4_ = fVar187 * fVar187;
    auVar257._28_36_ = auVar263._28_36_;
    auVar257._24_4_ = fVar247 * fVar247;
    auVar206._0_4_ = auVar257._0_4_ * (fVar232 * 3.0 + -5.0) + 2.0;
    auVar206._4_4_ = auVar257._4_4_ * (fVar211 * 3.0 + -5.0) + 2.0;
    auVar206._8_4_ = auVar257._8_4_ * (fVar244 * 3.0 + -5.0) + 2.0;
    auVar206._12_4_ = auVar257._12_4_ * (fVar245 * 3.0 + -5.0) + 2.0;
    auVar206._16_4_ = auVar257._16_4_ * (fVar246 * 3.0 + -5.0) + 2.0;
    auVar206._20_4_ = auVar257._20_4_ * (fVar187 * 3.0 + -5.0) + 2.0;
    auVar206._24_4_ = auVar257._24_4_ * (fVar247 * 3.0 + -5.0) + 2.0;
    auVar206._28_4_ = auVar265._28_4_ + -5.0 + 2.0;
    fVar231 = auVar87._28_4_;
    auVar121._4_4_ = fVar228 * fVar228 * -fVar211;
    auVar121._0_4_ = fVar213 * fVar213 * -fVar232;
    auVar121._8_4_ = fVar229 * fVar229 * -fVar244;
    auVar121._12_4_ = fVar230 * fVar230 * -fVar245;
    auVar121._16_4_ = -fVar246 * 0.0 * 0.0;
    auVar121._20_4_ = -fVar187 * 0.0 * 0.0;
    auVar121._24_4_ = -fVar247 * 0.0 * 0.0;
    auVar121._28_4_ = -fVar231;
    auVar85 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar87 = vmulps_avx512vl(auVar120,auVar85);
    auVar86 = vmulps_avx512vl(auVar182,auVar85);
    auVar98 = vmulps_avx512vl(auVar206,auVar85);
    auVar99 = vmulps_avx512vl(auVar121,auVar85);
    auVar100 = vmulps_avx512vl(local_620,auVar99);
    auVar101 = vmulps_avx512vl(local_640,auVar99);
    auVar102 = vmulps_avx512vl(local_580,auVar99);
    auVar122._4_4_ = (float)local_5a0._4_4_ * auVar99._4_4_;
    auVar122._0_4_ = (float)local_5a0._0_4_ * auVar99._0_4_;
    auVar122._8_4_ = fStack_598 * auVar99._8_4_;
    auVar122._12_4_ = fStack_594 * auVar99._12_4_;
    auVar122._16_4_ = fStack_590 * auVar99._16_4_;
    auVar122._20_4_ = fStack_58c * auVar99._20_4_;
    auVar122._24_4_ = fStack_588 * auVar99._24_4_;
    auVar122._28_4_ = auVar99._28_4_;
    auVar99 = vfmadd231ps_avx512vl(auVar100,auVar98,auVar96);
    auVar100 = vfmadd231ps_avx512vl(auVar101,auVar98,auVar97);
    auVar101 = vfmadd231ps_avx512vl(auVar102,auVar98,local_600);
    auVar98 = vfmadd231ps_avx512vl(auVar122,local_560,auVar98);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar86,auVar92);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar86,auVar93);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar86,auVar94);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar95,auVar86);
    local_880 = vfmadd231ps_avx512vl(auVar99,auVar87,auVar91);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar87,auVar88);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar87,auVar89);
    auVar102 = vfmadd231ps_avx512vl(auVar98,auVar90,auVar87);
    auVar123._4_4_ = (fVar211 + fVar211) * fVar228;
    auVar123._0_4_ = (fVar232 + fVar232) * fVar213;
    auVar123._8_4_ = (fVar244 + fVar244) * fVar229;
    auVar123._12_4_ = (fVar245 + fVar245) * fVar230;
    auVar123._16_4_ = (fVar246 + fVar246) * 0.0;
    auVar123._20_4_ = (fVar187 + fVar187) * 0.0;
    auVar123._24_4_ = (fVar247 + fVar247) * 0.0;
    auVar123._28_4_ = auVar86._28_4_;
    auVar87 = vsubps_avx(auVar123,auVar257._0_32_);
    auVar237._0_28_ =
         ZEXT1628(CONCAT412((fVar230 + fVar230) * (fVar261 + -5.0) + fVar261 * fVar230,
                            CONCAT48((fVar229 + fVar229) * (fVar260 + -5.0) + fVar260 * fVar229,
                                     CONCAT44((fVar228 + fVar228) * (fVar259 + -5.0) +
                                              fVar259 * fVar228,
                                              (fVar213 + fVar213) * (fVar254 + -5.0) +
                                              fVar254 * fVar213))));
    auVar237._28_4_ = fVar262 + 0.0;
    auVar114._8_4_ = 0x40000000;
    auVar114._0_8_ = 0x4000000040000000;
    auVar114._12_4_ = 0x40000000;
    auVar114._16_4_ = 0x40000000;
    auVar114._20_4_ = 0x40000000;
    auVar114._24_4_ = 0x40000000;
    auVar114._28_4_ = 0x40000000;
    auVar98 = vaddps_avx512vl(auVar258._0_32_,auVar114);
    auVar126._4_4_ = (fVar211 + fVar211) * auVar98._4_4_;
    auVar126._0_4_ = (fVar232 + fVar232) * auVar98._0_4_;
    auVar126._8_4_ = (fVar244 + fVar244) * auVar98._8_4_;
    auVar126._12_4_ = (fVar245 + fVar245) * auVar98._12_4_;
    auVar126._16_4_ = (fVar246 + fVar246) * auVar98._16_4_;
    auVar126._20_4_ = (fVar187 + fVar187) * auVar98._20_4_;
    auVar126._24_4_ = (fVar247 + fVar247) * auVar98._24_4_;
    auVar126._28_4_ = auVar98._28_4_;
    auVar127._4_4_ = fVar211 * 3.0 * fVar211;
    auVar127._0_4_ = fVar232 * 3.0 * fVar232;
    auVar127._8_4_ = fVar244 * 3.0 * fVar244;
    auVar127._12_4_ = fVar245 * 3.0 * fVar245;
    auVar127._16_4_ = fVar246 * 3.0 * fVar246;
    auVar127._20_4_ = fVar187 * 3.0 * fVar187;
    auVar127._24_4_ = fVar247 * 3.0 * fVar247;
    auVar127._28_4_ = fVar231;
    auVar98 = vsubps_avx(auVar126,auVar127);
    auVar99 = vsubps_avx(auVar253._0_32_,auVar123);
    auVar87 = vmulps_avx512vl(auVar87,auVar85);
    auVar103 = vmulps_avx512vl(auVar237,auVar85);
    auVar98 = vmulps_avx512vl(auVar98,auVar85);
    auVar99 = vmulps_avx512vl(auVar99,auVar85);
    auVar128._4_4_ = local_620._4_4_ * auVar99._4_4_;
    auVar128._0_4_ = local_620._0_4_ * auVar99._0_4_;
    auVar128._8_4_ = local_620._8_4_ * auVar99._8_4_;
    auVar128._12_4_ = local_620._12_4_ * auVar99._12_4_;
    auVar128._16_4_ = local_620._16_4_ * auVar99._16_4_;
    auVar128._20_4_ = local_620._20_4_ * auVar99._20_4_;
    auVar128._24_4_ = local_620._24_4_ * auVar99._24_4_;
    auVar128._28_4_ = fVar262;
    auVar85 = vmulps_avx512vl(local_640,auVar99);
    auVar104 = vmulps_avx512vl(local_580,auVar99);
    auVar227._4_4_ = (float)local_5a0._4_4_ * auVar99._4_4_;
    auVar227._0_4_ = (float)local_5a0._0_4_ * auVar99._0_4_;
    auVar227._8_4_ = fStack_598 * auVar99._8_4_;
    auVar227._12_4_ = fStack_594 * auVar99._12_4_;
    auVar227._16_4_ = fStack_590 * auVar99._16_4_;
    auVar227._20_4_ = fStack_58c * auVar99._20_4_;
    auVar227._24_4_ = fStack_588 * auVar99._24_4_;
    auVar227._28_4_ = auVar99._28_4_;
    auVar99 = vfmadd231ps_avx512vl(auVar128,auVar98,auVar96);
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar98,auVar97);
    auVar75 = vfmadd231ps_fma(auVar104,auVar98,local_600);
    auVar98 = vfmadd231ps_avx512vl(auVar227,local_560,auVar98);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar103,auVar92);
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar103,auVar93);
    auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar75),auVar103,auVar94);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar95,auVar103);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar87,auVar91);
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar87,auVar88);
    auVar103 = vfmadd231ps_avx512vl(auVar104,auVar87,auVar89);
    auVar87 = vfmadd231ps_avx512vl(auVar98,auVar90,auVar87);
    auVar34._4_4_ = auVar99._4_4_ * fVar233;
    auVar34._0_4_ = auVar99._0_4_ * fVar233;
    auVar34._8_4_ = auVar99._8_4_ * fVar233;
    auVar34._12_4_ = auVar99._12_4_ * fVar233;
    auVar34._16_4_ = auVar99._16_4_ * fVar233;
    auVar34._20_4_ = auVar99._20_4_ * fVar233;
    auVar34._24_4_ = auVar99._24_4_ * fVar233;
    auVar34._28_4_ = fVar231 + fVar231;
    auVar35._4_4_ = auVar85._4_4_ * fVar233;
    auVar35._0_4_ = auVar85._0_4_ * fVar233;
    auVar35._8_4_ = auVar85._8_4_ * fVar233;
    auVar35._12_4_ = auVar85._12_4_ * fVar233;
    auVar35._16_4_ = auVar85._16_4_ * fVar233;
    auVar35._20_4_ = auVar85._20_4_ * fVar233;
    auVar35._24_4_ = auVar85._24_4_ * fVar233;
    auVar35._28_4_ = auVar86._28_4_;
    auVar36._4_4_ = auVar103._4_4_ * fVar233;
    auVar36._0_4_ = auVar103._0_4_ * fVar233;
    auVar36._8_4_ = auVar103._8_4_ * fVar233;
    auVar36._12_4_ = auVar103._12_4_ * fVar233;
    auVar36._16_4_ = auVar103._16_4_ * fVar233;
    auVar36._20_4_ = auVar103._20_4_ * fVar233;
    auVar36._24_4_ = auVar103._24_4_ * fVar233;
    auVar36._28_4_ = 0;
    fVar213 = fVar233 * auVar87._0_4_;
    fVar228 = fVar233 * auVar87._4_4_;
    auVar37._4_4_ = fVar228;
    auVar37._0_4_ = fVar213;
    fVar229 = fVar233 * auVar87._8_4_;
    auVar37._8_4_ = fVar229;
    fVar230 = fVar233 * auVar87._12_4_;
    auVar37._12_4_ = fVar230;
    fVar231 = fVar233 * auVar87._16_4_;
    auVar37._16_4_ = fVar231;
    fVar232 = fVar233 * auVar87._20_4_;
    auVar37._20_4_ = fVar232;
    fVar211 = fVar233 * auVar87._24_4_;
    auVar37._24_4_ = fVar211;
    auVar37._28_4_ = fVar233;
    auVar75 = vxorps_avx512vl(auVar95._0_16_,auVar95._0_16_);
    auVar86 = vpermt2ps_avx512vl(local_880,_DAT_01feed00,ZEXT1632(auVar75));
    auVar103 = vpermt2ps_avx512vl(auVar100,_DAT_01feed00,ZEXT1632(auVar75));
    auVar263 = ZEXT3264(auVar103);
    auVar99 = ZEXT1632(auVar75);
    auVar104 = vpermt2ps_avx512vl(auVar101,_DAT_01feed00,auVar99);
    auVar265 = ZEXT3264(auVar104);
    auVar238._0_4_ = auVar102._0_4_ + fVar213;
    auVar238._4_4_ = auVar102._4_4_ + fVar228;
    auVar238._8_4_ = auVar102._8_4_ + fVar229;
    auVar238._12_4_ = auVar102._12_4_ + fVar230;
    auVar238._16_4_ = auVar102._16_4_ + fVar231;
    auVar238._20_4_ = auVar102._20_4_ + fVar232;
    auVar238._24_4_ = auVar102._24_4_ + fVar211;
    auVar238._28_4_ = auVar102._28_4_ + fVar233;
    auVar87 = vmaxps_avx(auVar102,auVar238);
    auVar98 = vminps_avx(auVar102,auVar238);
    auVar102 = vpermt2ps_avx512vl(auVar102,_DAT_01feed00,auVar99);
    auVar105 = vpermt2ps_avx512vl(auVar34,_DAT_01feed00,auVar99);
    auVar257 = ZEXT3264(auVar105);
    auVar106 = vpermt2ps_avx512vl(auVar35,_DAT_01feed00,auVar99);
    auVar120 = ZEXT1632(auVar75);
    auVar107 = vpermt2ps_avx512vl(auVar36,_DAT_01feed00,auVar120);
    auVar99 = vpermt2ps_avx512vl(auVar37,_DAT_01feed00,auVar120);
    auVar108 = vsubps_avx512vl(auVar102,auVar99);
    auVar109 = vsubps_avx512vl(auVar86,local_880);
    auVar253 = ZEXT3264(auVar109);
    auVar99 = vsubps_avx(auVar103,auVar100);
    auVar85 = vsubps_avx(auVar104,auVar101);
    auVar110 = vmulps_avx512vl(auVar99,auVar36);
    auVar110 = vfmsub231ps_avx512vl(auVar110,auVar35,auVar85);
    auVar111 = vmulps_avx512vl(auVar85,auVar34);
    auVar111 = vfmsub231ps_avx512vl(auVar111,auVar36,auVar109);
    auVar112 = vmulps_avx512vl(auVar109,auVar35);
    auVar112 = vfmsub231ps_avx512vl(auVar112,auVar34,auVar99);
    auVar112 = vmulps_avx512vl(auVar112,auVar112);
    auVar111 = vfmadd231ps_avx512vl(auVar112,auVar111,auVar111);
    auVar110 = vfmadd231ps_avx512vl(auVar111,auVar110,auVar110);
    auVar111 = vmulps_avx512vl(auVar85,auVar85);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar99,auVar99);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar109,auVar109);
    auVar112 = vrcp14ps_avx512vl(auVar111);
    auVar113 = vfnmadd213ps_avx512vl(auVar112,auVar111,auVar272);
    auVar112 = vfmadd132ps_avx512vl(auVar113,auVar112,auVar112);
    auVar110 = vmulps_avx512vl(auVar110,auVar112);
    auVar113 = vmulps_avx512vl(auVar99,auVar107);
    auVar113 = vfmsub231ps_avx512vl(auVar113,auVar106,auVar85);
    auVar114 = vmulps_avx512vl(auVar85,auVar105);
    auVar114 = vfmsub231ps_avx512vl(auVar114,auVar107,auVar109);
    auVar115 = vmulps_avx512vl(auVar109,auVar106);
    auVar115 = vfmsub231ps_avx512vl(auVar115,auVar105,auVar99);
    auVar115 = vmulps_avx512vl(auVar115,auVar115);
    auVar114 = vfmadd231ps_avx512vl(auVar115,auVar114,auVar114);
    auVar113 = vfmadd231ps_avx512vl(auVar114,auVar113,auVar113);
    auVar112 = vmulps_avx512vl(auVar113,auVar112);
    auVar110 = vmaxps_avx512vl(auVar110,auVar112);
    auVar110 = vsqrtps_avx512vl(auVar110);
    auVar112 = vmaxps_avx512vl(auVar108,auVar102);
    auVar87 = vmaxps_avx512vl(auVar87,auVar112);
    auVar112 = vaddps_avx512vl(auVar110,auVar87);
    auVar87 = vminps_avx512vl(auVar108,auVar102);
    auVar87 = vminps_avx(auVar98,auVar87);
    auVar87 = vsubps_avx512vl(auVar87,auVar110);
    auVar115._8_4_ = 0x3f800002;
    auVar115._0_8_ = 0x3f8000023f800002;
    auVar115._12_4_ = 0x3f800002;
    auVar115._16_4_ = 0x3f800002;
    auVar115._20_4_ = 0x3f800002;
    auVar115._24_4_ = 0x3f800002;
    auVar115._28_4_ = 0x3f800002;
    auVar98 = vmulps_avx512vl(auVar112,auVar115);
    auVar116._8_4_ = 0x3f7ffffc;
    auVar116._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar116._12_4_ = 0x3f7ffffc;
    auVar116._16_4_ = 0x3f7ffffc;
    auVar116._20_4_ = 0x3f7ffffc;
    auVar116._24_4_ = 0x3f7ffffc;
    auVar116._28_4_ = 0x3f7ffffc;
    auVar87 = vmulps_avx512vl(auVar87,auVar116);
    auVar98 = vmulps_avx512vl(auVar98,auVar98);
    auVar102 = vrsqrt14ps_avx512vl(auVar111);
    auVar117._8_4_ = 0xbf000000;
    auVar117._0_8_ = 0xbf000000bf000000;
    auVar117._12_4_ = 0xbf000000;
    auVar117._16_4_ = 0xbf000000;
    auVar117._20_4_ = 0xbf000000;
    auVar117._24_4_ = 0xbf000000;
    auVar117._28_4_ = 0xbf000000;
    auVar108 = vmulps_avx512vl(auVar111,auVar117);
    fVar233 = auVar102._0_4_;
    fVar213 = auVar102._4_4_;
    fVar228 = auVar102._8_4_;
    fVar229 = auVar102._12_4_;
    fVar230 = auVar102._16_4_;
    fVar231 = auVar102._20_4_;
    fVar232 = auVar102._24_4_;
    auVar38._4_4_ = fVar213 * fVar213 * fVar213 * auVar108._4_4_;
    auVar38._0_4_ = fVar233 * fVar233 * fVar233 * auVar108._0_4_;
    auVar38._8_4_ = fVar228 * fVar228 * fVar228 * auVar108._8_4_;
    auVar38._12_4_ = fVar229 * fVar229 * fVar229 * auVar108._12_4_;
    auVar38._16_4_ = fVar230 * fVar230 * fVar230 * auVar108._16_4_;
    auVar38._20_4_ = fVar231 * fVar231 * fVar231 * auVar108._20_4_;
    auVar38._24_4_ = fVar232 * fVar232 * fVar232 * auVar108._24_4_;
    auVar38._28_4_ = auVar112._28_4_;
    auVar118._8_4_ = 0x3fc00000;
    auVar118._0_8_ = 0x3fc000003fc00000;
    auVar118._12_4_ = 0x3fc00000;
    auVar118._16_4_ = 0x3fc00000;
    auVar118._20_4_ = 0x3fc00000;
    auVar118._24_4_ = 0x3fc00000;
    auVar118._28_4_ = 0x3fc00000;
    auVar102 = vfmadd231ps_avx512vl(auVar38,auVar102,auVar118);
    auVar108 = vmulps_avx512vl(auVar109,auVar102);
    auVar110 = vmulps_avx512vl(auVar99,auVar102);
    auVar111 = vmulps_avx512vl(auVar85,auVar102);
    auVar112 = vsubps_avx512vl(auVar120,local_880);
    local_800._0_32_ = auVar100;
    auVar113 = vsubps_avx512vl(auVar120,auVar100);
    auVar114 = vsubps_avx512vl(auVar120,auVar101);
    auVar115 = vmulps_avx512vl(local_860,auVar114);
    auVar115 = vfmadd231ps_avx512vl(auVar115,local_840,auVar113);
    auVar115 = vfmadd231ps_avx512vl(auVar115,_local_820,auVar112);
    auVar116 = vmulps_avx512vl(auVar114,auVar114);
    auVar116 = vfmadd231ps_avx512vl(auVar116,auVar113,auVar113);
    auVar116 = vfmadd231ps_avx512vl(auVar116,auVar112,auVar112);
    auVar117 = vmulps_avx512vl(local_860,auVar111);
    auVar117 = vfmadd231ps_avx512vl(auVar117,auVar110,local_840);
    auVar117 = vfmadd231ps_avx512vl(auVar117,auVar108,_local_820);
    auVar111 = vmulps_avx512vl(auVar114,auVar111);
    auVar110 = vfmadd231ps_avx512vl(auVar111,auVar113,auVar110);
    auVar108 = vfmadd231ps_avx512vl(auVar110,auVar112,auVar108);
    auVar110 = vmulps_avx512vl(auVar117,auVar117);
    auVar111 = vsubps_avx512vl(local_5c0,auVar110);
    auVar118 = vmulps_avx512vl(auVar117,auVar108);
    auVar115 = vsubps_avx512vl(auVar115,auVar118);
    auVar115 = vaddps_avx512vl(auVar115,auVar115);
    auVar118 = vmulps_avx512vl(auVar108,auVar108);
    auVar116 = vsubps_avx512vl(auVar116,auVar118);
    auVar98 = vsubps_avx512vl(auVar116,auVar98);
    local_8a0 = vmulps_avx512vl(auVar115,auVar115);
    auVar119._8_4_ = 0x40800000;
    auVar119._0_8_ = 0x4080000040800000;
    auVar119._12_4_ = 0x40800000;
    auVar119._16_4_ = 0x40800000;
    auVar119._20_4_ = 0x40800000;
    auVar119._24_4_ = 0x40800000;
    auVar119._28_4_ = 0x40800000;
    auVar118 = vmulps_avx512vl(auVar111,auVar119);
    auVar119 = vmulps_avx512vl(auVar118,auVar98);
    auVar119 = vsubps_avx512vl(local_8a0,auVar119);
    uVar71 = vcmpps_avx512vl(auVar119,auVar120,5);
    bVar55 = (byte)uVar71;
    if (bVar55 != 0) {
      auVar119 = vsqrtps_avx512vl(auVar119);
      auVar120 = vaddps_avx512vl(auVar111,auVar111);
      local_8c0 = vrcp14ps_avx512vl(auVar120);
      auVar121 = vfnmadd213ps_avx512vl(local_8c0,auVar120,auVar272);
      auVar121 = vfmadd132ps_avx512vl(auVar121,local_8c0,local_8c0);
      auVar272._8_4_ = 0x80000000;
      auVar272._0_8_ = 0x8000000080000000;
      auVar272._12_4_ = 0x80000000;
      auVar272._16_4_ = 0x80000000;
      auVar272._20_4_ = 0x80000000;
      auVar272._24_4_ = 0x80000000;
      auVar272._28_4_ = 0x80000000;
      local_8e0 = vxorps_avx512vl(auVar115,auVar272);
      auVar122 = vsubps_avx512vl(local_8e0,auVar119);
      auVar122 = vmulps_avx512vl(auVar122,auVar121);
      auVar119 = vsubps_avx512vl(auVar119,auVar115);
      auVar119 = vmulps_avx512vl(auVar119,auVar121);
      auVar121 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar123 = vblendmps_avx512vl(auVar121,auVar122);
      auVar124._0_4_ =
           (uint)(bVar55 & 1) * auVar123._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar121._0_4_;
      bVar70 = (bool)((byte)(uVar71 >> 1) & 1);
      auVar124._4_4_ = (uint)bVar70 * auVar123._4_4_ | (uint)!bVar70 * auVar121._4_4_;
      bVar70 = (bool)((byte)(uVar71 >> 2) & 1);
      auVar124._8_4_ = (uint)bVar70 * auVar123._8_4_ | (uint)!bVar70 * auVar121._8_4_;
      bVar70 = (bool)((byte)(uVar71 >> 3) & 1);
      auVar124._12_4_ = (uint)bVar70 * auVar123._12_4_ | (uint)!bVar70 * auVar121._12_4_;
      bVar70 = (bool)((byte)(uVar71 >> 4) & 1);
      auVar124._16_4_ = (uint)bVar70 * auVar123._16_4_ | (uint)!bVar70 * auVar121._16_4_;
      bVar70 = (bool)((byte)(uVar71 >> 5) & 1);
      auVar124._20_4_ = (uint)bVar70 * auVar123._20_4_ | (uint)!bVar70 * auVar121._20_4_;
      bVar70 = (bool)((byte)(uVar71 >> 6) & 1);
      auVar124._24_4_ = (uint)bVar70 * auVar123._24_4_ | (uint)!bVar70 * auVar121._24_4_;
      bVar70 = SUB81(uVar71 >> 7,0);
      auVar124._28_4_ = (uint)bVar70 * auVar123._28_4_ | (uint)!bVar70 * auVar121._28_4_;
      auVar121 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar123 = vblendmps_avx512vl(auVar121,auVar119);
      auVar125._0_4_ =
           (uint)(bVar55 & 1) * auVar123._0_4_ | (uint)!(bool)(bVar55 & 1) * auVar121._0_4_;
      bVar70 = (bool)((byte)(uVar71 >> 1) & 1);
      auVar125._4_4_ = (uint)bVar70 * auVar123._4_4_ | (uint)!bVar70 * auVar121._4_4_;
      bVar70 = (bool)((byte)(uVar71 >> 2) & 1);
      auVar125._8_4_ = (uint)bVar70 * auVar123._8_4_ | (uint)!bVar70 * auVar121._8_4_;
      bVar70 = (bool)((byte)(uVar71 >> 3) & 1);
      auVar125._12_4_ = (uint)bVar70 * auVar123._12_4_ | (uint)!bVar70 * auVar121._12_4_;
      bVar70 = (bool)((byte)(uVar71 >> 4) & 1);
      auVar125._16_4_ = (uint)bVar70 * auVar123._16_4_ | (uint)!bVar70 * auVar121._16_4_;
      bVar70 = (bool)((byte)(uVar71 >> 5) & 1);
      auVar125._20_4_ = (uint)bVar70 * auVar123._20_4_ | (uint)!bVar70 * auVar121._20_4_;
      bVar70 = (bool)((byte)(uVar71 >> 6) & 1);
      auVar125._24_4_ = (uint)bVar70 * auVar123._24_4_ | (uint)!bVar70 * auVar121._24_4_;
      bVar70 = SUB81(uVar71 >> 7,0);
      auVar125._28_4_ = (uint)bVar70 * auVar123._28_4_ | (uint)!bVar70 * auVar121._28_4_;
      auVar121 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar110,auVar121);
      auVar110 = vmaxps_avx512vl(local_5e0,auVar121);
      auVar28._8_4_ = 0x36000000;
      auVar28._0_8_ = 0x3600000036000000;
      auVar28._12_4_ = 0x36000000;
      auVar28._16_4_ = 0x36000000;
      auVar28._20_4_ = 0x36000000;
      auVar28._24_4_ = 0x36000000;
      auVar28._28_4_ = 0x36000000;
      local_a00 = vmulps_avx512vl(auVar110,auVar28);
      vandps_avx512vl(auVar111,auVar121);
      uVar60 = vcmpps_avx512vl(local_a00,local_a00,1);
      uVar71 = uVar71 & uVar60;
      bVar57 = (byte)uVar71;
      if (bVar57 != 0) {
        uVar60 = vcmpps_avx512vl(auVar98,_DAT_01faff00,2);
        auVar98 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar111 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar121 = vblendmps_avx512vl(auVar98,auVar111);
        bVar62 = (byte)uVar60;
        uVar65 = (uint)(bVar62 & 1) * auVar121._0_4_ | (uint)!(bool)(bVar62 & 1) * local_a00._0_4_;
        bVar70 = (bool)((byte)(uVar60 >> 1) & 1);
        uVar72 = (uint)bVar70 * auVar121._4_4_ | (uint)!bVar70 * local_a00._4_4_;
        bVar70 = (bool)((byte)(uVar60 >> 2) & 1);
        uVar59 = (uint)bVar70 * auVar121._8_4_ | (uint)!bVar70 * local_a00._8_4_;
        bVar70 = (bool)((byte)(uVar60 >> 3) & 1);
        uVar147 = (uint)bVar70 * auVar121._12_4_ | (uint)!bVar70 * local_a00._12_4_;
        bVar70 = (bool)((byte)(uVar60 >> 4) & 1);
        uVar148 = (uint)bVar70 * auVar121._16_4_ | (uint)!bVar70 * local_a00._16_4_;
        bVar70 = (bool)((byte)(uVar60 >> 5) & 1);
        uVar149 = (uint)bVar70 * auVar121._20_4_ | (uint)!bVar70 * local_a00._20_4_;
        bVar70 = (bool)((byte)(uVar60 >> 6) & 1);
        uVar150 = (uint)bVar70 * auVar121._24_4_ | (uint)!bVar70 * local_a00._24_4_;
        bVar70 = SUB81(uVar60 >> 7,0);
        uVar151 = (uint)bVar70 * auVar121._28_4_ | (uint)!bVar70 * local_a00._28_4_;
        auVar124._0_4_ = (bVar57 & 1) * uVar65 | !(bool)(bVar57 & 1) * auVar124._0_4_;
        bVar70 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar124._4_4_ = bVar70 * uVar72 | !bVar70 * auVar124._4_4_;
        bVar70 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar124._8_4_ = bVar70 * uVar59 | !bVar70 * auVar124._8_4_;
        bVar70 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar124._12_4_ = bVar70 * uVar147 | !bVar70 * auVar124._12_4_;
        bVar70 = (bool)((byte)(uVar71 >> 4) & 1);
        auVar124._16_4_ = bVar70 * uVar148 | !bVar70 * auVar124._16_4_;
        bVar70 = (bool)((byte)(uVar71 >> 5) & 1);
        auVar124._20_4_ = bVar70 * uVar149 | !bVar70 * auVar124._20_4_;
        bVar70 = (bool)((byte)(uVar71 >> 6) & 1);
        auVar124._24_4_ = bVar70 * uVar150 | !bVar70 * auVar124._24_4_;
        bVar70 = SUB81(uVar71 >> 7,0);
        auVar124._28_4_ = bVar70 * uVar151 | !bVar70 * auVar124._28_4_;
        auVar98 = vblendmps_avx512vl(auVar111,auVar98);
        bVar70 = (bool)((byte)(uVar60 >> 1) & 1);
        bVar8 = (bool)((byte)(uVar60 >> 2) & 1);
        bVar9 = (bool)((byte)(uVar60 >> 3) & 1);
        bVar10 = (bool)((byte)(uVar60 >> 4) & 1);
        bVar11 = (bool)((byte)(uVar60 >> 5) & 1);
        bVar12 = (bool)((byte)(uVar60 >> 6) & 1);
        bVar13 = SUB81(uVar60 >> 7,0);
        auVar125._0_4_ =
             (uint)(bVar57 & 1) *
             ((uint)(bVar62 & 1) * auVar98._0_4_ | !(bool)(bVar62 & 1) * uVar65) |
             !(bool)(bVar57 & 1) * auVar125._0_4_;
        bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar125._4_4_ =
             (uint)bVar14 * ((uint)bVar70 * auVar98._4_4_ | !bVar70 * uVar72) |
             !bVar14 * auVar125._4_4_;
        bVar70 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar125._8_4_ =
             (uint)bVar70 * ((uint)bVar8 * auVar98._8_4_ | !bVar8 * uVar59) |
             !bVar70 * auVar125._8_4_;
        bVar70 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar125._12_4_ =
             (uint)bVar70 * ((uint)bVar9 * auVar98._12_4_ | !bVar9 * uVar147) |
             !bVar70 * auVar125._12_4_;
        bVar70 = (bool)((byte)(uVar71 >> 4) & 1);
        auVar125._16_4_ =
             (uint)bVar70 * ((uint)bVar10 * auVar98._16_4_ | !bVar10 * uVar148) |
             !bVar70 * auVar125._16_4_;
        bVar70 = (bool)((byte)(uVar71 >> 5) & 1);
        auVar125._20_4_ =
             (uint)bVar70 * ((uint)bVar11 * auVar98._20_4_ | !bVar11 * uVar149) |
             !bVar70 * auVar125._20_4_;
        bVar70 = (bool)((byte)(uVar71 >> 6) & 1);
        auVar125._24_4_ =
             (uint)bVar70 * ((uint)bVar12 * auVar98._24_4_ | !bVar12 * uVar150) |
             !bVar70 * auVar125._24_4_;
        bVar70 = SUB81(uVar71 >> 7,0);
        auVar125._28_4_ =
             (uint)bVar70 * ((uint)bVar13 * auVar98._28_4_ | !bVar13 * uVar151) |
             !bVar70 * auVar125._28_4_;
        bVar55 = (~bVar57 | bVar62) & bVar55;
      }
      if ((bVar55 & 0x7f) == 0) {
        auVar87 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar273 = ZEXT3264(auVar87);
      }
      else {
        auVar98 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar107 = vxorps_avx512vl(auVar107,auVar98);
        auVar105 = vxorps_avx512vl(auVar105,auVar98);
        uVar65 = *(uint *)(ray + k * 4 + 0x200);
        auVar106 = vxorps_avx512vl(auVar106,auVar98);
        auVar75 = vsubss_avx512f(ZEXT416(uVar65),ZEXT416((uint)local_930._0_4_));
        auVar111 = vbroadcastss_avx512vl(auVar75);
        auVar111 = vminps_avx512vl(auVar111,auVar125);
        auVar54._4_4_ = fStack_65c;
        auVar54._0_4_ = local_660;
        auVar54._8_4_ = fStack_658;
        auVar54._12_4_ = fStack_654;
        auVar54._16_4_ = fStack_650;
        auVar54._20_4_ = fStack_64c;
        auVar54._24_4_ = fStack_648;
        auVar54._28_4_ = fStack_644;
        auVar121 = vmaxps_avx512vl(auVar54,auVar124);
        auVar114 = vmulps_avx512vl(auVar114,auVar36);
        auVar113 = vfmadd213ps_avx512vl(auVar113,auVar35,auVar114);
        auVar75 = vfmadd213ps_fma(auVar112,auVar34,auVar113);
        auVar112 = vmulps_avx512vl(local_860,auVar36);
        auVar112 = vfmadd231ps_avx512vl(auVar112,local_840,auVar35);
        auVar76 = vfmadd231ps_fma(auVar112,_local_820,auVar34);
        auVar112 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        vandps_avx512vl(ZEXT1632(auVar76),auVar112);
        auVar113 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
        uVar16 = vcmpps_avx512vl(auVar112,auVar113,1);
        auVar114 = vxorps_avx512vl(ZEXT1632(auVar75),auVar98);
        auVar123 = vrcp14ps_avx512vl(ZEXT1632(auVar76));
        auVar227 = ZEXT1632(auVar76);
        auVar126 = vxorps_avx512vl(auVar227,auVar98);
        auVar127 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar128 = vfnmadd213ps_avx512vl(auVar123,auVar227,auVar127);
        auVar75 = vfmadd132ps_fma(auVar128,auVar123,auVar123);
        fVar233 = auVar75._0_4_ * auVar114._0_4_;
        fVar213 = auVar75._4_4_ * auVar114._4_4_;
        auVar39._4_4_ = fVar213;
        auVar39._0_4_ = fVar233;
        fVar228 = auVar75._8_4_ * auVar114._8_4_;
        auVar39._8_4_ = fVar228;
        fVar229 = auVar75._12_4_ * auVar114._12_4_;
        auVar39._12_4_ = fVar229;
        fVar230 = auVar114._16_4_ * 0.0;
        auVar39._16_4_ = fVar230;
        fVar231 = auVar114._20_4_ * 0.0;
        auVar39._20_4_ = fVar231;
        fVar232 = auVar114._24_4_ * 0.0;
        auVar39._24_4_ = fVar232;
        auVar39._28_4_ = auVar114._28_4_;
        uVar17 = vcmpps_avx512vl(auVar227,auVar126,1);
        bVar57 = (byte)uVar16 | (byte)uVar17;
        auVar271._8_4_ = 0xff800000;
        auVar271._0_8_ = 0xff800000ff800000;
        auVar271._12_4_ = 0xff800000;
        auVar271._16_4_ = 0xff800000;
        auVar271._20_4_ = 0xff800000;
        auVar271._24_4_ = 0xff800000;
        auVar271._28_4_ = 0xff800000;
        auVar128 = vblendmps_avx512vl(auVar39,auVar271);
        auVar129._0_4_ =
             (uint)(bVar57 & 1) * auVar128._0_4_ | (uint)!(bool)(bVar57 & 1) * auVar123._0_4_;
        bVar70 = (bool)(bVar57 >> 1 & 1);
        auVar129._4_4_ = (uint)bVar70 * auVar128._4_4_ | (uint)!bVar70 * auVar123._4_4_;
        bVar70 = (bool)(bVar57 >> 2 & 1);
        auVar129._8_4_ = (uint)bVar70 * auVar128._8_4_ | (uint)!bVar70 * auVar123._8_4_;
        bVar70 = (bool)(bVar57 >> 3 & 1);
        auVar129._12_4_ = (uint)bVar70 * auVar128._12_4_ | (uint)!bVar70 * auVar123._12_4_;
        bVar70 = (bool)(bVar57 >> 4 & 1);
        auVar129._16_4_ = (uint)bVar70 * auVar128._16_4_ | (uint)!bVar70 * auVar123._16_4_;
        bVar70 = (bool)(bVar57 >> 5 & 1);
        auVar129._20_4_ = (uint)bVar70 * auVar128._20_4_ | (uint)!bVar70 * auVar123._20_4_;
        bVar70 = (bool)(bVar57 >> 6 & 1);
        auVar129._24_4_ = (uint)bVar70 * auVar128._24_4_ | (uint)!bVar70 * auVar123._24_4_;
        auVar129._28_4_ =
             (uint)(bVar57 >> 7) * auVar128._28_4_ | (uint)!(bool)(bVar57 >> 7) * auVar123._28_4_;
        auVar121 = vmaxps_avx512vl(auVar121,auVar129);
        uVar17 = vcmpps_avx512vl(auVar227,auVar126,6);
        bVar57 = (byte)uVar16 | (byte)uVar17;
        auVar123 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar130._0_4_ =
             (uint)(bVar57 & 1) * auVar123._0_4_ | (uint)!(bool)(bVar57 & 1) * (int)fVar233;
        bVar70 = (bool)(bVar57 >> 1 & 1);
        auVar130._4_4_ = (uint)bVar70 * auVar123._4_4_ | (uint)!bVar70 * (int)fVar213;
        bVar70 = (bool)(bVar57 >> 2 & 1);
        auVar130._8_4_ = (uint)bVar70 * auVar123._8_4_ | (uint)!bVar70 * (int)fVar228;
        bVar70 = (bool)(bVar57 >> 3 & 1);
        auVar130._12_4_ = (uint)bVar70 * auVar123._12_4_ | (uint)!bVar70 * (int)fVar229;
        bVar70 = (bool)(bVar57 >> 4 & 1);
        auVar130._16_4_ = (uint)bVar70 * auVar123._16_4_ | (uint)!bVar70 * (int)fVar230;
        bVar70 = (bool)(bVar57 >> 5 & 1);
        auVar130._20_4_ = (uint)bVar70 * auVar123._20_4_ | (uint)!bVar70 * (int)fVar231;
        bVar70 = (bool)(bVar57 >> 6 & 1);
        auVar130._24_4_ = (uint)bVar70 * auVar123._24_4_ | (uint)!bVar70 * (int)fVar232;
        auVar130._28_4_ =
             (uint)(bVar57 >> 7) * auVar123._28_4_ | (uint)!(bool)(bVar57 >> 7) * auVar114._28_4_;
        auVar114 = vminps_avx512vl(auVar111,auVar130);
        auVar76 = vxorps_avx512vl(auVar111._0_16_,auVar111._0_16_);
        auVar86 = vsubps_avx512vl(ZEXT1632(auVar76),auVar86);
        auVar103 = vsubps_avx512vl(ZEXT1632(auVar76),auVar103);
        auVar104 = vsubps_avx512vl(ZEXT1632(auVar76),auVar104);
        auVar104 = vmulps_avx512vl(auVar104,auVar107);
        auVar103 = vfmadd231ps_avx512vl(auVar104,auVar106,auVar103);
        auVar86 = vfmadd231ps_avx512vl(auVar103,auVar105,auVar86);
        auVar103 = vmulps_avx512vl(local_860,auVar107);
        auVar103 = vfmadd231ps_avx512vl(auVar103,local_840,auVar106);
        auVar103 = vfmadd231ps_avx512vl(auVar103,_local_820,auVar105);
        vandps_avx512vl(auVar103,auVar112);
        uVar16 = vcmpps_avx512vl(auVar103,auVar113,1);
        auVar86 = vxorps_avx512vl(auVar86,auVar98);
        auVar104 = vrcp14ps_avx512vl(auVar103);
        auVar98 = vxorps_avx512vl(auVar103,auVar98);
        auVar265 = ZEXT3264(auVar98);
        auVar105 = vfnmadd213ps_avx512vl(auVar104,auVar103,auVar127);
        auVar75 = vfmadd132ps_fma(auVar105,auVar104,auVar104);
        fVar233 = auVar75._0_4_ * auVar86._0_4_;
        fVar213 = auVar75._4_4_ * auVar86._4_4_;
        auVar40._4_4_ = fVar213;
        auVar40._0_4_ = fVar233;
        fVar228 = auVar75._8_4_ * auVar86._8_4_;
        auVar40._8_4_ = fVar228;
        fVar229 = auVar75._12_4_ * auVar86._12_4_;
        auVar40._12_4_ = fVar229;
        fVar230 = auVar86._16_4_ * 0.0;
        auVar40._16_4_ = fVar230;
        fVar231 = auVar86._20_4_ * 0.0;
        auVar40._20_4_ = fVar231;
        fVar232 = auVar86._24_4_ * 0.0;
        auVar40._24_4_ = fVar232;
        auVar40._28_4_ = auVar86._28_4_;
        uVar17 = vcmpps_avx512vl(auVar103,auVar98,1);
        bVar57 = (byte)uVar16 | (byte)uVar17;
        auVar105 = vblendmps_avx512vl(auVar40,auVar271);
        auVar131._0_4_ =
             (uint)(bVar57 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar57 & 1) * auVar104._0_4_;
        bVar70 = (bool)(bVar57 >> 1 & 1);
        auVar131._4_4_ = (uint)bVar70 * auVar105._4_4_ | (uint)!bVar70 * auVar104._4_4_;
        bVar70 = (bool)(bVar57 >> 2 & 1);
        auVar131._8_4_ = (uint)bVar70 * auVar105._8_4_ | (uint)!bVar70 * auVar104._8_4_;
        bVar70 = (bool)(bVar57 >> 3 & 1);
        auVar131._12_4_ = (uint)bVar70 * auVar105._12_4_ | (uint)!bVar70 * auVar104._12_4_;
        bVar70 = (bool)(bVar57 >> 4 & 1);
        auVar131._16_4_ = (uint)bVar70 * auVar105._16_4_ | (uint)!bVar70 * auVar104._16_4_;
        bVar70 = (bool)(bVar57 >> 5 & 1);
        auVar131._20_4_ = (uint)bVar70 * auVar105._20_4_ | (uint)!bVar70 * auVar104._20_4_;
        bVar70 = (bool)(bVar57 >> 6 & 1);
        auVar131._24_4_ = (uint)bVar70 * auVar105._24_4_ | (uint)!bVar70 * auVar104._24_4_;
        auVar131._28_4_ =
             (uint)(bVar57 >> 7) * auVar105._28_4_ | (uint)!(bool)(bVar57 >> 7) * auVar104._28_4_;
        auVar263 = ZEXT3264(auVar131);
        _local_a20 = vmaxps_avx(auVar121,auVar131);
        auVar257 = ZEXT3264(_local_a20);
        uVar17 = vcmpps_avx512vl(auVar103,auVar98,6);
        bVar57 = (byte)uVar16 | (byte)uVar17;
        auVar132._0_4_ =
             (uint)(bVar57 & 1) * auVar123._0_4_ | (uint)!(bool)(bVar57 & 1) * (int)fVar233;
        bVar70 = (bool)(bVar57 >> 1 & 1);
        auVar132._4_4_ = (uint)bVar70 * auVar123._4_4_ | (uint)!bVar70 * (int)fVar213;
        bVar70 = (bool)(bVar57 >> 2 & 1);
        auVar132._8_4_ = (uint)bVar70 * auVar123._8_4_ | (uint)!bVar70 * (int)fVar228;
        bVar70 = (bool)(bVar57 >> 3 & 1);
        auVar132._12_4_ = (uint)bVar70 * auVar123._12_4_ | (uint)!bVar70 * (int)fVar229;
        bVar70 = (bool)(bVar57 >> 4 & 1);
        auVar132._16_4_ = (uint)bVar70 * auVar123._16_4_ | (uint)!bVar70 * (int)fVar230;
        bVar70 = (bool)(bVar57 >> 5 & 1);
        auVar132._20_4_ = (uint)bVar70 * auVar123._20_4_ | (uint)!bVar70 * (int)fVar231;
        bVar70 = (bool)(bVar57 >> 6 & 1);
        auVar132._24_4_ = (uint)bVar70 * auVar123._24_4_ | (uint)!bVar70 * (int)fVar232;
        auVar132._28_4_ =
             (uint)(bVar57 >> 7) * auVar123._28_4_ | (uint)!(bool)(bVar57 >> 7) * auVar86._28_4_;
        local_6e0 = vminps_avx(auVar114,auVar132);
        uVar16 = vcmpps_avx512vl(_local_a20,local_6e0,2);
        bVar55 = bVar55 & 0x7f & (byte)uVar16;
        if (bVar55 == 0) {
          auVar273 = ZEXT3264(auVar127);
        }
        else {
          auVar98 = vmaxps_avx512vl(ZEXT1632(auVar76),auVar87);
          auVar87 = vfmadd213ps_avx512vl(auVar122,auVar117,auVar108);
          auVar87 = vmulps_avx512vl(auVar102,auVar87);
          auVar86 = vfmadd213ps_avx512vl(auVar119,auVar117,auVar108);
          auVar41._4_4_ = auVar102._4_4_ * auVar86._4_4_;
          auVar41._0_4_ = auVar102._0_4_ * auVar86._0_4_;
          auVar41._8_4_ = auVar102._8_4_ * auVar86._8_4_;
          auVar41._12_4_ = auVar102._12_4_ * auVar86._12_4_;
          auVar41._16_4_ = auVar102._16_4_ * auVar86._16_4_;
          auVar41._20_4_ = auVar102._20_4_ * auVar86._20_4_;
          auVar41._24_4_ = auVar102._24_4_ * auVar86._24_4_;
          auVar41._28_4_ = auVar131._28_4_;
          auVar87 = vminps_avx512vl(auVar87,auVar127);
          auVar86 = ZEXT832(0) << 0x20;
          auVar87 = vmaxps_avx(auVar87,ZEXT832(0) << 0x20);
          auVar103 = vminps_avx512vl(auVar41,auVar127);
          auVar42._4_4_ = (auVar87._4_4_ + 1.0) * 0.125;
          auVar42._0_4_ = (auVar87._0_4_ + 0.0) * 0.125;
          auVar42._8_4_ = (auVar87._8_4_ + 2.0) * 0.125;
          auVar42._12_4_ = (auVar87._12_4_ + 3.0) * 0.125;
          auVar42._16_4_ = (auVar87._16_4_ + 4.0) * 0.125;
          auVar42._20_4_ = (auVar87._20_4_ + 5.0) * 0.125;
          auVar42._24_4_ = (auVar87._24_4_ + 6.0) * 0.125;
          auVar42._28_4_ = auVar87._28_4_ + 7.0;
          auVar75 = vfmadd213ps_fma(auVar42,auVar162,auVar236);
          local_520 = ZEXT1632(auVar75);
          auVar87 = vmaxps_avx(auVar103,ZEXT832(0) << 0x20);
          auVar43._4_4_ = (auVar87._4_4_ + 1.0) * 0.125;
          auVar43._0_4_ = (auVar87._0_4_ + 0.0) * 0.125;
          auVar43._8_4_ = (auVar87._8_4_ + 2.0) * 0.125;
          auVar43._12_4_ = (auVar87._12_4_ + 3.0) * 0.125;
          auVar43._16_4_ = (auVar87._16_4_ + 4.0) * 0.125;
          auVar43._20_4_ = (auVar87._20_4_ + 5.0) * 0.125;
          auVar43._24_4_ = (auVar87._24_4_ + 6.0) * 0.125;
          auVar43._28_4_ = auVar87._28_4_ + 7.0;
          auVar75 = vfmadd213ps_fma(auVar43,auVar162,auVar236);
          local_540 = ZEXT1632(auVar75);
          auVar44._4_4_ = auVar98._4_4_ * auVar98._4_4_;
          auVar44._0_4_ = auVar98._0_4_ * auVar98._0_4_;
          auVar44._8_4_ = auVar98._8_4_ * auVar98._8_4_;
          auVar44._12_4_ = auVar98._12_4_ * auVar98._12_4_;
          auVar44._16_4_ = auVar98._16_4_ * auVar98._16_4_;
          auVar44._20_4_ = auVar98._20_4_ * auVar98._20_4_;
          auVar44._24_4_ = auVar98._24_4_ * auVar98._24_4_;
          auVar44._28_4_ = auVar98._28_4_;
          auVar87 = vsubps_avx(auVar116,auVar44);
          local_aa0 = auVar118._0_4_;
          fStack_a9c = auVar118._4_4_;
          fStack_a98 = auVar118._8_4_;
          fStack_a94 = auVar118._12_4_;
          fStack_a90 = auVar118._16_4_;
          fStack_a8c = auVar118._20_4_;
          fStack_a88 = auVar118._24_4_;
          auVar45._4_4_ = auVar87._4_4_ * fStack_a9c;
          auVar45._0_4_ = auVar87._0_4_ * local_aa0;
          auVar45._8_4_ = auVar87._8_4_ * fStack_a98;
          auVar45._12_4_ = auVar87._12_4_ * fStack_a94;
          auVar45._16_4_ = auVar87._16_4_ * fStack_a90;
          auVar45._20_4_ = auVar87._20_4_ * fStack_a8c;
          auVar45._24_4_ = auVar87._24_4_ * fStack_a88;
          auVar45._28_4_ = auVar98._28_4_;
          auVar98 = vsubps_avx(local_8a0,auVar45);
          uVar16 = vcmpps_avx512vl(auVar98,ZEXT832(0) << 0x20,5);
          bVar57 = (byte)uVar16;
          auVar273 = ZEXT3264(auVar127);
          if (bVar57 == 0) {
            bVar57 = 0;
            auVar99 = ZEXT832(0) << 0x20;
            auVar169 = ZEXT864(0) << 0x20;
            auVar98 = ZEXT1232(ZEXT812(0)) << 0x20;
            auVar103 = SUB6432(ZEXT864(0),0) << 0x20;
            auVar263 = ZEXT864(0) << 0x20;
            auVar133._8_4_ = 0x7f800000;
            auVar133._0_8_ = 0x7f8000007f800000;
            auVar133._12_4_ = 0x7f800000;
            auVar133._16_4_ = 0x7f800000;
            auVar133._20_4_ = 0x7f800000;
            auVar133._24_4_ = 0x7f800000;
            auVar133._28_4_ = 0x7f800000;
            auVar134._8_4_ = 0xff800000;
            auVar134._0_8_ = 0xff800000ff800000;
            auVar134._12_4_ = 0xff800000;
            auVar134._16_4_ = 0xff800000;
            auVar134._20_4_ = 0xff800000;
            auVar134._24_4_ = 0xff800000;
            auVar134._28_4_ = 0xff800000;
          }
          else {
            auVar77 = vxorps_avx512vl(auVar112._0_16_,auVar112._0_16_);
            uVar71 = vcmpps_avx512vl(auVar98,ZEXT1632(auVar76),5);
            auVar98 = vsqrtps_avx(auVar98);
            auVar86 = vfnmadd213ps_avx512vl(auVar120,local_8c0,auVar127);
            auVar104 = vfmadd132ps_avx512vl(auVar86,local_8c0,local_8c0);
            auVar86 = vsubps_avx(local_8e0,auVar98);
            auVar105 = vmulps_avx512vl(auVar86,auVar104);
            auVar98 = vsubps_avx512vl(auVar98,auVar115);
            auVar104 = vmulps_avx512vl(auVar98,auVar104);
            auVar98 = vfmadd213ps_avx512vl(auVar117,auVar105,auVar108);
            auVar46._4_4_ = auVar102._4_4_ * auVar98._4_4_;
            auVar46._0_4_ = auVar102._0_4_ * auVar98._0_4_;
            auVar46._8_4_ = auVar102._8_4_ * auVar98._8_4_;
            auVar46._12_4_ = auVar102._12_4_ * auVar98._12_4_;
            auVar46._16_4_ = auVar102._16_4_ * auVar98._16_4_;
            auVar46._20_4_ = auVar102._20_4_ * auVar98._20_4_;
            auVar46._24_4_ = auVar102._24_4_ * auVar98._24_4_;
            auVar46._28_4_ = auVar103._28_4_;
            auVar47._4_4_ = (float)local_820._4_4_ * auVar105._4_4_;
            auVar47._0_4_ = (float)local_820._0_4_ * auVar105._0_4_;
            auVar47._8_4_ = fStack_818 * auVar105._8_4_;
            auVar47._12_4_ = fStack_814 * auVar105._12_4_;
            auVar47._16_4_ = fStack_810 * auVar105._16_4_;
            auVar47._20_4_ = fStack_80c * auVar105._20_4_;
            auVar47._24_4_ = fStack_808 * auVar105._24_4_;
            auVar47._28_4_ = auVar98._28_4_;
            auVar86 = vmulps_avx512vl(local_840,auVar105);
            auVar106 = vmulps_avx512vl(local_860,auVar105);
            auVar98 = vfmadd213ps_avx512vl(auVar109,auVar46,local_880);
            auVar98 = vsubps_avx512vl(auVar47,auVar98);
            auVar103 = vfmadd213ps_avx512vl(auVar99,auVar46,auVar100);
            auVar103 = vsubps_avx512vl(auVar86,auVar103);
            auVar75 = vfmadd213ps_fma(auVar46,auVar85,auVar101);
            auVar86 = vsubps_avx(auVar106,ZEXT1632(auVar75));
            auVar263 = ZEXT3264(auVar86);
            auVar86 = vfmadd213ps_avx512vl(auVar117,auVar104,auVar108);
            auVar102 = vmulps_avx512vl(auVar102,auVar86);
            auVar48._4_4_ = (float)local_820._4_4_ * auVar104._4_4_;
            auVar48._0_4_ = (float)local_820._0_4_ * auVar104._0_4_;
            auVar48._8_4_ = fStack_818 * auVar104._8_4_;
            auVar48._12_4_ = fStack_814 * auVar104._12_4_;
            auVar48._16_4_ = fStack_810 * auVar104._16_4_;
            auVar48._20_4_ = fStack_80c * auVar104._20_4_;
            auVar48._24_4_ = fStack_808 * auVar104._24_4_;
            auVar48._28_4_ = auVar106._28_4_;
            auVar106 = vmulps_avx512vl(local_840,auVar104);
            auVar107 = vmulps_avx512vl(local_860,auVar104);
            auVar75 = vfmadd213ps_fma(auVar109,auVar102,local_880);
            auVar86 = vsubps_avx(auVar48,ZEXT1632(auVar75));
            auVar75 = vfmadd213ps_fma(auVar99,auVar102,auVar100);
            auVar99 = vsubps_avx512vl(auVar106,ZEXT1632(auVar75));
            auVar75 = vfmadd213ps_fma(auVar85,auVar102,auVar101);
            auVar85 = vsubps_avx512vl(auVar107,ZEXT1632(auVar75));
            auVar169 = ZEXT3264(auVar85);
            auVar163._8_4_ = 0x7f800000;
            auVar163._0_8_ = 0x7f8000007f800000;
            auVar163._12_4_ = 0x7f800000;
            auVar163._16_4_ = 0x7f800000;
            auVar163._20_4_ = 0x7f800000;
            auVar163._24_4_ = 0x7f800000;
            auVar163._28_4_ = 0x7f800000;
            auVar85 = vblendmps_avx512vl(auVar163,auVar105);
            bVar70 = (bool)((byte)uVar71 & 1);
            auVar133._0_4_ = (uint)bVar70 * auVar85._0_4_ | (uint)!bVar70 * 0x7f800000;
            bVar70 = (bool)((byte)(uVar71 >> 1) & 1);
            auVar133._4_4_ = (uint)bVar70 * auVar85._4_4_ | (uint)!bVar70 * 0x7f800000;
            bVar70 = (bool)((byte)(uVar71 >> 2) & 1);
            auVar133._8_4_ = (uint)bVar70 * auVar85._8_4_ | (uint)!bVar70 * 0x7f800000;
            bVar70 = (bool)((byte)(uVar71 >> 3) & 1);
            auVar133._12_4_ = (uint)bVar70 * auVar85._12_4_ | (uint)!bVar70 * 0x7f800000;
            bVar70 = (bool)((byte)(uVar71 >> 4) & 1);
            auVar133._16_4_ = (uint)bVar70 * auVar85._16_4_ | (uint)!bVar70 * 0x7f800000;
            bVar70 = (bool)((byte)(uVar71 >> 5) & 1);
            auVar133._20_4_ = (uint)bVar70 * auVar85._20_4_ | (uint)!bVar70 * 0x7f800000;
            bVar70 = (bool)((byte)(uVar71 >> 6) & 1);
            auVar133._24_4_ = (uint)bVar70 * auVar85._24_4_ | (uint)!bVar70 * 0x7f800000;
            bVar70 = SUB81(uVar71 >> 7,0);
            auVar133._28_4_ = (uint)bVar70 * auVar85._28_4_ | (uint)!bVar70 * 0x7f800000;
            auVar207._8_4_ = 0xff800000;
            auVar207._0_8_ = 0xff800000ff800000;
            auVar207._12_4_ = 0xff800000;
            auVar207._16_4_ = 0xff800000;
            auVar207._20_4_ = 0xff800000;
            auVar207._24_4_ = 0xff800000;
            auVar207._28_4_ = 0xff800000;
            auVar85 = vblendmps_avx512vl(auVar207,auVar104);
            bVar70 = (bool)((byte)uVar71 & 1);
            auVar134._0_4_ = (uint)bVar70 * auVar85._0_4_ | (uint)!bVar70 * -0x800000;
            bVar70 = (bool)((byte)(uVar71 >> 1) & 1);
            auVar134._4_4_ = (uint)bVar70 * auVar85._4_4_ | (uint)!bVar70 * -0x800000;
            bVar70 = (bool)((byte)(uVar71 >> 2) & 1);
            auVar134._8_4_ = (uint)bVar70 * auVar85._8_4_ | (uint)!bVar70 * -0x800000;
            bVar70 = (bool)((byte)(uVar71 >> 3) & 1);
            auVar134._12_4_ = (uint)bVar70 * auVar85._12_4_ | (uint)!bVar70 * -0x800000;
            bVar70 = (bool)((byte)(uVar71 >> 4) & 1);
            auVar134._16_4_ = (uint)bVar70 * auVar85._16_4_ | (uint)!bVar70 * -0x800000;
            bVar70 = (bool)((byte)(uVar71 >> 5) & 1);
            auVar134._20_4_ = (uint)bVar70 * auVar85._20_4_ | (uint)!bVar70 * -0x800000;
            bVar70 = (bool)((byte)(uVar71 >> 6) & 1);
            auVar134._24_4_ = (uint)bVar70 * auVar85._24_4_ | (uint)!bVar70 * -0x800000;
            bVar70 = SUB81(uVar71 >> 7,0);
            auVar134._28_4_ = (uint)bVar70 * auVar85._28_4_ | (uint)!bVar70 * -0x800000;
            auVar29._8_4_ = 0x36000000;
            auVar29._0_8_ = 0x3600000036000000;
            auVar29._12_4_ = 0x36000000;
            auVar29._16_4_ = 0x36000000;
            auVar29._20_4_ = 0x36000000;
            auVar29._24_4_ = 0x36000000;
            auVar29._28_4_ = 0x36000000;
            auVar85 = vmulps_avx512vl(auVar110,auVar29);
            uVar60 = vcmpps_avx512vl(auVar85,local_a00,0xe);
            uVar71 = uVar71 & uVar60;
            bVar62 = (byte)uVar71;
            if (bVar62 != 0) {
              uVar60 = vcmpps_avx512vl(auVar87,ZEXT1632(auVar77),2);
              auVar252._8_4_ = 0x7f800000;
              auVar252._0_8_ = 0x7f8000007f800000;
              auVar252._12_4_ = 0x7f800000;
              auVar252._16_4_ = 0x7f800000;
              auVar252._20_4_ = 0x7f800000;
              auVar252._24_4_ = 0x7f800000;
              auVar252._28_4_ = 0x7f800000;
              auVar268._8_4_ = 0xff800000;
              auVar268._0_8_ = 0xff800000ff800000;
              auVar268._12_4_ = 0xff800000;
              auVar268._16_4_ = 0xff800000;
              auVar268._20_4_ = 0xff800000;
              auVar268._24_4_ = 0xff800000;
              auVar268._28_4_ = 0xff800000;
              auVar87 = vblendmps_avx512vl(auVar252,auVar268);
              bVar67 = (byte)uVar60;
              uVar72 = (uint)(bVar67 & 1) * auVar87._0_4_ |
                       (uint)!(bool)(bVar67 & 1) * auVar85._0_4_;
              bVar70 = (bool)((byte)(uVar60 >> 1) & 1);
              uVar59 = (uint)bVar70 * auVar87._4_4_ | (uint)!bVar70 * auVar85._4_4_;
              bVar70 = (bool)((byte)(uVar60 >> 2) & 1);
              uVar147 = (uint)bVar70 * auVar87._8_4_ | (uint)!bVar70 * auVar85._8_4_;
              bVar70 = (bool)((byte)(uVar60 >> 3) & 1);
              uVar148 = (uint)bVar70 * auVar87._12_4_ | (uint)!bVar70 * auVar85._12_4_;
              bVar70 = (bool)((byte)(uVar60 >> 4) & 1);
              uVar149 = (uint)bVar70 * auVar87._16_4_ | (uint)!bVar70 * auVar85._16_4_;
              bVar70 = (bool)((byte)(uVar60 >> 5) & 1);
              uVar150 = (uint)bVar70 * auVar87._20_4_ | (uint)!bVar70 * auVar85._20_4_;
              bVar70 = (bool)((byte)(uVar60 >> 6) & 1);
              uVar151 = (uint)bVar70 * auVar87._24_4_ | (uint)!bVar70 * auVar85._24_4_;
              bVar70 = SUB81(uVar60 >> 7,0);
              uVar152 = (uint)bVar70 * auVar87._28_4_ | (uint)!bVar70 * auVar85._28_4_;
              auVar133._0_4_ = (bVar62 & 1) * uVar72 | !(bool)(bVar62 & 1) * auVar133._0_4_;
              bVar70 = (bool)((byte)(uVar71 >> 1) & 1);
              auVar133._4_4_ = bVar70 * uVar59 | !bVar70 * auVar133._4_4_;
              bVar70 = (bool)((byte)(uVar71 >> 2) & 1);
              auVar133._8_4_ = bVar70 * uVar147 | !bVar70 * auVar133._8_4_;
              bVar70 = (bool)((byte)(uVar71 >> 3) & 1);
              auVar133._12_4_ = bVar70 * uVar148 | !bVar70 * auVar133._12_4_;
              bVar70 = (bool)((byte)(uVar71 >> 4) & 1);
              auVar133._16_4_ = bVar70 * uVar149 | !bVar70 * auVar133._16_4_;
              bVar70 = (bool)((byte)(uVar71 >> 5) & 1);
              auVar133._20_4_ = bVar70 * uVar150 | !bVar70 * auVar133._20_4_;
              bVar70 = (bool)((byte)(uVar71 >> 6) & 1);
              auVar133._24_4_ = bVar70 * uVar151 | !bVar70 * auVar133._24_4_;
              bVar70 = SUB81(uVar71 >> 7,0);
              auVar133._28_4_ = bVar70 * uVar152 | !bVar70 * auVar133._28_4_;
              auVar87 = vblendmps_avx512vl(auVar268,auVar252);
              bVar70 = (bool)((byte)(uVar60 >> 1) & 1);
              bVar8 = (bool)((byte)(uVar60 >> 2) & 1);
              bVar9 = (bool)((byte)(uVar60 >> 3) & 1);
              bVar10 = (bool)((byte)(uVar60 >> 4) & 1);
              bVar11 = (bool)((byte)(uVar60 >> 5) & 1);
              bVar12 = (bool)((byte)(uVar60 >> 6) & 1);
              bVar13 = SUB81(uVar60 >> 7,0);
              auVar134._0_4_ =
                   (uint)(bVar62 & 1) *
                   ((uint)(bVar67 & 1) * auVar87._0_4_ | !(bool)(bVar67 & 1) * uVar72) |
                   !(bool)(bVar62 & 1) * auVar134._0_4_;
              bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
              auVar134._4_4_ =
                   (uint)bVar14 * ((uint)bVar70 * auVar87._4_4_ | !bVar70 * uVar59) |
                   !bVar14 * auVar134._4_4_;
              bVar70 = (bool)((byte)(uVar71 >> 2) & 1);
              auVar134._8_4_ =
                   (uint)bVar70 * ((uint)bVar8 * auVar87._8_4_ | !bVar8 * uVar147) |
                   !bVar70 * auVar134._8_4_;
              bVar70 = (bool)((byte)(uVar71 >> 3) & 1);
              auVar134._12_4_ =
                   (uint)bVar70 * ((uint)bVar9 * auVar87._12_4_ | !bVar9 * uVar148) |
                   !bVar70 * auVar134._12_4_;
              bVar70 = (bool)((byte)(uVar71 >> 4) & 1);
              auVar134._16_4_ =
                   (uint)bVar70 * ((uint)bVar10 * auVar87._16_4_ | !bVar10 * uVar149) |
                   !bVar70 * auVar134._16_4_;
              bVar70 = (bool)((byte)(uVar71 >> 5) & 1);
              auVar134._20_4_ =
                   (uint)bVar70 * ((uint)bVar11 * auVar87._20_4_ | !bVar11 * uVar150) |
                   !bVar70 * auVar134._20_4_;
              bVar70 = (bool)((byte)(uVar71 >> 6) & 1);
              auVar134._24_4_ =
                   (uint)bVar70 * ((uint)bVar12 * auVar87._24_4_ | !bVar12 * uVar151) |
                   !bVar70 * auVar134._24_4_;
              bVar70 = SUB81(uVar71 >> 7,0);
              auVar134._28_4_ =
                   (uint)bVar70 * ((uint)bVar13 * auVar87._28_4_ | !bVar13 * uVar152) |
                   !bVar70 * auVar134._28_4_;
              bVar57 = (~bVar62 | bVar67) & bVar57;
            }
          }
          auVar265._0_4_ = local_860._0_4_ * auVar169._0_4_;
          auVar265._4_4_ = local_860._4_4_ * auVar169._4_4_;
          auVar265._8_4_ = local_860._8_4_ * auVar169._8_4_;
          auVar265._12_4_ = local_860._12_4_ * auVar169._12_4_;
          auVar265._16_4_ = local_860._16_4_ * auVar169._16_4_;
          auVar265._20_4_ = local_860._20_4_ * auVar169._20_4_;
          auVar265._28_36_ = auVar169._28_36_;
          auVar265._24_4_ = local_860._24_4_ * auVar169._24_4_;
          auVar257 = ZEXT3264(local_840);
          auVar75 = vfmadd231ps_fma(auVar265._0_32_,local_840,auVar99);
          auVar253 = ZEXT3264(_local_820);
          auVar75 = vfmadd231ps_fma(ZEXT1632(auVar75),_local_820,auVar86);
          auVar243._8_4_ = 0x7fffffff;
          auVar243._0_8_ = 0x7fffffff7fffffff;
          auVar243._12_4_ = 0x7fffffff;
          auVar243._16_4_ = 0x7fffffff;
          auVar243._20_4_ = 0x7fffffff;
          auVar243._24_4_ = 0x7fffffff;
          auVar243._28_4_ = 0x7fffffff;
          auVar87 = vandps_avx(ZEXT1632(auVar75),auVar243);
          auVar265 = ZEXT3264(_local_a20);
          _local_440 = _local_a20;
          auVar241._8_4_ = 0x3e99999a;
          auVar241._0_8_ = 0x3e99999a3e99999a;
          auVar241._12_4_ = 0x3e99999a;
          auVar241._16_4_ = 0x3e99999a;
          auVar241._20_4_ = 0x3e99999a;
          auVar241._24_4_ = 0x3e99999a;
          auVar241._28_4_ = 0x3e99999a;
          uVar16 = vcmpps_avx512vl(auVar87,auVar241,1);
          local_780._0_2_ = (short)uVar16;
          local_700 = vmaxps_avx(_local_a20,auVar134);
          auVar87 = vminps_avx(local_6e0,auVar133);
          uVar16 = vcmpps_avx512vl(_local_a20,auVar87,2);
          bVar62 = (byte)uVar16 & bVar55;
          uVar17 = vcmpps_avx512vl(local_700,local_6e0,2);
          if ((bVar55 & ((byte)uVar17 | (byte)uVar16)) != 0) {
            auVar49._4_4_ = local_860._4_4_ * auVar263._4_4_;
            auVar49._0_4_ = local_860._0_4_ * auVar263._0_4_;
            auVar49._8_4_ = local_860._8_4_ * auVar263._8_4_;
            auVar49._12_4_ = local_860._12_4_ * auVar263._12_4_;
            auVar49._16_4_ = local_860._16_4_ * auVar263._16_4_;
            auVar49._20_4_ = local_860._20_4_ * auVar263._20_4_;
            auVar49._24_4_ = local_860._24_4_ * auVar263._24_4_;
            auVar49._28_4_ = auVar87._28_4_;
            auVar75 = vfmadd213ps_fma(auVar103,local_840,auVar49);
            auVar75 = vfmadd213ps_fma(auVar98,_local_820,ZEXT1632(auVar75));
            auVar87 = vandps_avx(ZEXT1632(auVar75),auVar243);
            uVar16 = vcmpps_avx512vl(auVar87,auVar241,1);
            bVar67 = (byte)uVar16 | ~bVar57;
            auVar165._8_4_ = 2;
            auVar165._0_8_ = 0x200000002;
            auVar165._12_4_ = 2;
            auVar165._16_4_ = 2;
            auVar165._20_4_ = 2;
            auVar165._24_4_ = 2;
            auVar165._28_4_ = 2;
            auVar30._8_4_ = 3;
            auVar30._0_8_ = 0x300000003;
            auVar30._12_4_ = 3;
            auVar30._16_4_ = 3;
            auVar30._20_4_ = 3;
            auVar30._24_4_ = 3;
            auVar30._28_4_ = 3;
            auVar87 = vpblendmd_avx512vl(auVar165,auVar30);
            local_6a0._0_4_ = (uint)(bVar67 & 1) * auVar87._0_4_ | (uint)!(bool)(bVar67 & 1) * 2;
            bVar70 = (bool)(bVar67 >> 1 & 1);
            local_6a0._4_4_ = (uint)bVar70 * auVar87._4_4_ | (uint)!bVar70 * 2;
            bVar70 = (bool)(bVar67 >> 2 & 1);
            local_6a0._8_4_ = (uint)bVar70 * auVar87._8_4_ | (uint)!bVar70 * 2;
            bVar70 = (bool)(bVar67 >> 3 & 1);
            local_6a0._12_4_ = (uint)bVar70 * auVar87._12_4_ | (uint)!bVar70 * 2;
            bVar70 = (bool)(bVar67 >> 4 & 1);
            local_6a0._16_4_ = (uint)bVar70 * auVar87._16_4_ | (uint)!bVar70 * 2;
            bVar70 = (bool)(bVar67 >> 5 & 1);
            local_6a0._20_4_ = (uint)bVar70 * auVar87._20_4_ | (uint)!bVar70 * 2;
            bVar70 = (bool)(bVar67 >> 6 & 1);
            local_6a0._24_4_ = (uint)bVar70 * auVar87._24_4_ | (uint)!bVar70 * 2;
            local_6a0._28_4_ = (uint)(bVar67 >> 7) * auVar87._28_4_ | (uint)!(bool)(bVar67 >> 7) * 2
            ;
            local_720 = vpbroadcastd_avx512vl();
            uVar16 = vpcmpd_avx512vl(local_720,local_6a0,5);
            bVar67 = (byte)uVar16 & bVar62;
            if (bVar67 == 0) {
              auVar167._4_4_ = uVar65;
              auVar167._0_4_ = uVar65;
              auVar167._8_4_ = uVar65;
              auVar167._12_4_ = uVar65;
              auVar167._16_4_ = uVar65;
              auVar167._20_4_ = uVar65;
              auVar167._24_4_ = uVar65;
              auVar167._28_4_ = uVar65;
              auVar87 = local_700;
            }
            else {
              local_6c0 = local_700;
              auVar76 = vminps_avx(local_960._0_16_,local_9a0._0_16_);
              auVar75 = vmaxps_avx(local_960._0_16_,local_9a0._0_16_);
              auVar77 = vminps_avx(local_980._0_16_,local_9c0._0_16_);
              auVar264 = vminps_avx(auVar76,auVar77);
              auVar76 = vmaxps_avx(local_980._0_16_,local_9c0._0_16_);
              auVar77 = vmaxps_avx(auVar75,auVar76);
              auVar188._8_4_ = 0x7fffffff;
              auVar188._0_8_ = 0x7fffffff7fffffff;
              auVar188._12_4_ = 0x7fffffff;
              auVar75 = vandps_avx(auVar264,auVar188);
              auVar76 = vandps_avx(auVar77,auVar188);
              auVar75 = vmaxps_avx(auVar75,auVar76);
              auVar76 = vmovshdup_avx(auVar75);
              auVar76 = vmaxss_avx(auVar76,auVar75);
              auVar75 = vshufpd_avx(auVar75,auVar75,1);
              auVar75 = vmaxss_avx(auVar75,auVar76);
              fVar233 = auVar75._0_4_ * 1.9073486e-06;
              local_920 = vshufps_avx(auVar77,auVar77,0xff);
              local_760 = (float)local_a20._0_4_ + fVar153;
              fStack_75c = (float)local_a20._4_4_ + fVar153;
              fStack_758 = fStack_a18 + fVar153;
              fStack_754 = fStack_a14 + fVar153;
              fStack_750 = fStack_a10 + fVar153;
              fStack_74c = fStack_a0c + fVar153;
              fStack_748 = fStack_a08 + fVar153;
              fStack_744 = fStack_a04 + fVar153;
              do {
                auVar166._8_4_ = 0x7f800000;
                auVar166._0_8_ = 0x7f8000007f800000;
                auVar166._12_4_ = 0x7f800000;
                auVar166._16_4_ = 0x7f800000;
                auVar166._20_4_ = 0x7f800000;
                auVar166._24_4_ = 0x7f800000;
                auVar166._28_4_ = 0x7f800000;
                auVar87 = vblendmps_avx512vl(auVar166,_local_a20);
                auVar136._0_4_ =
                     (uint)(bVar67 & 1) * auVar87._0_4_ | (uint)!(bool)(bVar67 & 1) * 0x7f800000;
                bVar70 = (bool)(bVar67 >> 1 & 1);
                auVar136._4_4_ = (uint)bVar70 * auVar87._4_4_ | (uint)!bVar70 * 0x7f800000;
                bVar70 = (bool)(bVar67 >> 2 & 1);
                auVar136._8_4_ = (uint)bVar70 * auVar87._8_4_ | (uint)!bVar70 * 0x7f800000;
                bVar70 = (bool)(bVar67 >> 3 & 1);
                auVar136._12_4_ = (uint)bVar70 * auVar87._12_4_ | (uint)!bVar70 * 0x7f800000;
                bVar70 = (bool)(bVar67 >> 4 & 1);
                auVar136._16_4_ = (uint)bVar70 * auVar87._16_4_ | (uint)!bVar70 * 0x7f800000;
                bVar70 = (bool)(bVar67 >> 5 & 1);
                auVar136._20_4_ = (uint)bVar70 * auVar87._20_4_ | (uint)!bVar70 * 0x7f800000;
                auVar136._24_4_ =
                     (uint)(bVar67 >> 6) * auVar87._24_4_ | (uint)!(bool)(bVar67 >> 6) * 0x7f800000;
                auVar136._28_4_ = 0x7f800000;
                auVar87 = vshufps_avx(auVar136,auVar136,0xb1);
                auVar87 = vminps_avx(auVar136,auVar87);
                auVar98 = vshufpd_avx(auVar87,auVar87,5);
                auVar87 = vminps_avx(auVar87,auVar98);
                auVar98 = vpermpd_avx2(auVar87,0x4e);
                auVar87 = vminps_avx(auVar87,auVar98);
                uVar16 = vcmpps_avx512vl(auVar136,auVar87,0);
                bVar56 = (byte)uVar16 & bVar67;
                bVar58 = bVar67;
                if (bVar56 != 0) {
                  bVar58 = bVar56;
                }
                iVar19 = 0;
                for (uVar65 = (uint)bVar58; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x80000000) {
                  iVar19 = iVar19 + 1;
                }
                uVar65 = *(uint *)(local_520 + (uint)(iVar19 << 2));
                uVar72 = *(uint *)(local_440 + (uint)(iVar19 << 2));
                fVar213 = auVar15._0_4_;
                if ((float)local_9e0._0_4_ < 0.0) {
                  fVar213 = sqrtf((float)local_9e0._0_4_);
                }
                auVar75 = vinsertps_avx(ZEXT416(uVar72),ZEXT416(uVar65),0x10);
                auVar169 = ZEXT1664(auVar75);
                bVar70 = true;
                uVar71 = 0;
                do {
                  uVar170 = auVar169._0_4_;
                  auVar154._4_4_ = uVar170;
                  auVar154._0_4_ = uVar170;
                  auVar154._8_4_ = uVar170;
                  auVar154._12_4_ = uVar170;
                  auVar75 = vfmadd132ps_fma(auVar154,ZEXT816(0) << 0x40,local_9d0);
                  auVar76 = vmovshdup_avx(auVar169._0_16_);
                  fVar244 = auVar76._0_4_;
                  fVar211 = 1.0 - fVar244;
                  fVar228 = fVar244 * fVar244;
                  auVar79 = SUB6416(ZEXT464(0x40400000),0);
                  auVar78 = SUB6416(ZEXT464(0xc0a00000),0);
                  auVar264 = vfmadd213ss_fma(auVar79,auVar76,auVar78);
                  auVar77 = vfmadd213ss_fma(auVar264,ZEXT416((uint)fVar228),
                                            SUB6416(ZEXT464(0x40000000),0));
                  auVar74 = vfmadd213ss_fma(auVar79,ZEXT416((uint)fVar211),auVar78);
                  auVar74 = vfmadd213ss_fma(auVar74,ZEXT416((uint)(fVar211 * fVar211)),
                                            SUB6416(ZEXT464(0x40000000),0));
                  fVar229 = fVar211 * fVar211 * -fVar244 * 0.5;
                  fVar230 = auVar77._0_4_ * 0.5;
                  fVar231 = auVar74._0_4_ * 0.5;
                  fVar232 = fVar244 * fVar244 * -fVar211 * 0.5;
                  auVar215._0_4_ = fVar232 * (float)local_9c0._0_4_;
                  auVar215._4_4_ = fVar232 * (float)local_9c0._4_4_;
                  auVar215._8_4_ = fVar232 * fStack_9b8;
                  auVar215._12_4_ = fVar232 * fStack_9b4;
                  auVar234._4_4_ = fVar231;
                  auVar234._0_4_ = fVar231;
                  auVar234._8_4_ = fVar231;
                  auVar234._12_4_ = fVar231;
                  auVar77 = vfmadd132ps_fma(auVar234,auVar215,local_980._0_16_);
                  auVar189._4_4_ = fVar230;
                  auVar189._0_4_ = fVar230;
                  auVar189._8_4_ = fVar230;
                  auVar189._12_4_ = fVar230;
                  auVar77 = vfmadd132ps_fma(auVar189,auVar77,local_9a0._0_16_);
                  auVar216._4_4_ = fVar229;
                  auVar216._0_4_ = fVar229;
                  auVar216._8_4_ = fVar229;
                  auVar216._12_4_ = fVar229;
                  auVar77 = vfmadd132ps_fma(auVar216,auVar77,local_960._0_16_);
                  auVar74 = vfmadd231ss_fma(auVar78,auVar76,ZEXT416(0x41100000));
                  local_8a0._0_16_ = auVar74;
                  auVar74 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar76,
                                            ZEXT416(0x40800000));
                  local_8c0._0_16_ = auVar74;
                  auVar74 = vfmadd213ss_fma(auVar79,auVar76,ZEXT416(0xbf800000));
                  local_8e0._0_16_ = auVar74;
                  local_880._0_16_ = auVar77;
                  auVar77 = vsubps_avx(auVar75,auVar77);
                  auVar75 = vdpps_avx(auVar77,auVar77,0x7f);
                  fVar229 = auVar75._0_4_;
                  local_800 = auVar169;
                  if (fVar229 < 0.0) {
                    local_a00._0_4_ = fVar228;
                    auVar273._0_4_ = sqrtf(fVar229);
                    auVar273._4_60_ = extraout_var;
                    auVar264 = ZEXT416(auVar264._0_4_);
                    auVar74 = auVar273._0_16_;
                  }
                  else {
                    auVar74 = vsqrtss_avx(auVar75,auVar75);
                    local_a00._0_4_ = fVar228;
                  }
                  auVar80 = vfnmadd231ss_fma(ZEXT416((uint)(fVar244 * (fVar211 + fVar211))),
                                             ZEXT416((uint)fVar211),ZEXT416((uint)fVar211));
                  auVar264 = vfmadd213ss_fma(auVar264,ZEXT416((uint)(fVar244 + fVar244)),
                                             ZEXT416((uint)(fVar244 * fVar244 * 3.0)));
                  auVar78 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar76,
                                            SUB6416(ZEXT464(0x40000000),0));
                  auVar79 = vfmadd231ss_fma(ZEXT416((uint)(fVar211 * fVar211 * -3.0)),
                                            ZEXT416((uint)(fVar211 + fVar211)),auVar78);
                  auVar78 = vfmadd213ss_fma(ZEXT416((uint)(fVar211 * -2.0)),auVar76,
                                            ZEXT416((uint)local_a00._0_4_));
                  fVar228 = auVar80._0_4_ * 0.5;
                  fVar230 = auVar264._0_4_ * 0.5;
                  fVar231 = auVar79._0_4_ * 0.5;
                  fVar232 = auVar78._0_4_ * 0.5;
                  auVar217._0_4_ = fVar232 * (float)local_9c0._0_4_;
                  auVar217._4_4_ = fVar232 * (float)local_9c0._4_4_;
                  auVar217._8_4_ = fVar232 * fStack_9b8;
                  auVar217._12_4_ = fVar232 * fStack_9b4;
                  auVar190._4_4_ = fVar231;
                  auVar190._0_4_ = fVar231;
                  auVar190._8_4_ = fVar231;
                  auVar190._12_4_ = fVar231;
                  auVar264 = vfmadd132ps_fma(auVar190,auVar217,local_980._0_16_);
                  auVar172._4_4_ = fVar230;
                  auVar172._0_4_ = fVar230;
                  auVar172._8_4_ = fVar230;
                  auVar172._12_4_ = fVar230;
                  auVar264 = vfmadd132ps_fma(auVar172,auVar264,local_9a0._0_16_);
                  auVar266._4_4_ = fVar228;
                  auVar266._0_4_ = fVar228;
                  auVar266._8_4_ = fVar228;
                  auVar266._12_4_ = fVar228;
                  auVar264 = vfmadd132ps_fma(auVar266,auVar264,local_960._0_16_);
                  local_a00._0_16_ = vdpps_avx(auVar264,auVar264,0x7f);
                  auVar50._12_4_ = 0;
                  auVar50._0_12_ = ZEXT812(0);
                  fVar228 = local_a00._0_4_;
                  auVar78 = vrsqrt14ss_avx512f(auVar50 << 0x20,ZEXT416((uint)fVar228));
                  fVar230 = auVar78._0_4_;
                  auVar79 = vrcp14ss_avx512f(auVar50 << 0x20,ZEXT416((uint)fVar228));
                  auVar20._8_4_ = 0x80000000;
                  auVar20._0_8_ = 0x8000000080000000;
                  auVar20._12_4_ = 0x80000000;
                  auVar80 = vxorps_avx512vl(local_a00._0_16_,auVar20);
                  auVar78 = vfnmadd213ss_fma(auVar79,local_a00._0_16_,SUB6416(ZEXT464(0x40000000),0)
                                            );
                  uVar65 = auVar74._0_4_;
                  if (fVar228 < auVar80._0_4_) {
                    fVar231 = sqrtf(fVar228);
                    auVar74 = ZEXT416(uVar65);
                  }
                  else {
                    auVar80 = vsqrtss_avx(local_a00._0_16_,local_a00._0_16_);
                    fVar231 = auVar80._0_4_;
                  }
                  fVar228 = fVar230 * 1.5 + fVar228 * -0.5 * fVar230 * fVar230 * fVar230;
                  auVar155._0_4_ = auVar264._0_4_ * fVar228;
                  auVar155._4_4_ = auVar264._4_4_ * fVar228;
                  auVar155._8_4_ = auVar264._8_4_ * fVar228;
                  auVar155._12_4_ = auVar264._12_4_ * fVar228;
                  auVar80 = vdpps_avx(auVar77,auVar155,0x7f);
                  fVar211 = auVar74._0_4_;
                  fVar230 = auVar80._0_4_;
                  auVar156._0_4_ = fVar230 * fVar230;
                  auVar156._4_4_ = auVar80._4_4_ * auVar80._4_4_;
                  auVar156._8_4_ = auVar80._8_4_ * auVar80._8_4_;
                  auVar156._12_4_ = auVar80._12_4_ * auVar80._12_4_;
                  auVar81 = vsubps_avx512vl(auVar75,auVar156);
                  fVar232 = auVar81._0_4_;
                  auVar173._4_12_ = ZEXT812(0) << 0x20;
                  auVar173._0_4_ = fVar232;
                  auVar82 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar173);
                  auVar83 = vmulss_avx512f(auVar81,ZEXT416(0xbf000000));
                  if (fVar232 < 0.0) {
                    local_910 = fVar228;
                    fStack_90c = fVar228;
                    fStack_908 = fVar228;
                    fStack_904 = fVar228;
                    local_900 = auVar82;
                    fVar232 = sqrtf(fVar232);
                    auVar83 = ZEXT416(auVar83._0_4_);
                    auVar74 = ZEXT416(uVar65);
                    auVar81 = local_900;
                    fVar228 = local_910;
                    fVar244 = fStack_90c;
                    fVar245 = fStack_908;
                    fVar246 = fStack_904;
                  }
                  else {
                    auVar81 = vsqrtss_avx(auVar81,auVar81);
                    fVar232 = auVar81._0_4_;
                    auVar81 = auVar82;
                    fVar244 = fVar228;
                    fVar245 = fVar228;
                    fVar246 = fVar228;
                  }
                  auVar263 = ZEXT1664(auVar77);
                  auVar87 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                  auVar273 = ZEXT3264(auVar87);
                  auVar174._0_4_ = (float)local_8e0._0_4_ * (float)local_9c0._0_4_;
                  auVar174._4_4_ = (float)local_8e0._0_4_ * (float)local_9c0._4_4_;
                  auVar174._8_4_ = (float)local_8e0._0_4_ * fStack_9b8;
                  auVar174._12_4_ = (float)local_8e0._0_4_ * fStack_9b4;
                  auVar191._4_4_ = local_8c0._0_4_;
                  auVar191._0_4_ = local_8c0._0_4_;
                  auVar191._8_4_ = local_8c0._0_4_;
                  auVar191._12_4_ = local_8c0._0_4_;
                  auVar214 = vfmadd132ps_fma(auVar191,auVar174,local_980._0_16_);
                  auVar175._4_4_ = local_8a0._0_4_;
                  auVar175._0_4_ = local_8a0._0_4_;
                  auVar175._8_4_ = local_8a0._0_4_;
                  auVar175._12_4_ = local_8a0._0_4_;
                  auVar214 = vfmadd132ps_fma(auVar175,auVar214,local_9a0._0_16_);
                  auVar76 = vfmadd213ss_fma(auVar76,SUB6416(ZEXT464(0xc0400000),0),
                                            ZEXT416(0x40000000));
                  uVar170 = auVar76._0_4_;
                  auVar192._4_4_ = uVar170;
                  auVar192._0_4_ = uVar170;
                  auVar192._8_4_ = uVar170;
                  auVar192._12_4_ = uVar170;
                  auVar76 = vfmadd132ps_fma(auVar192,auVar214,local_960._0_16_);
                  auVar176._0_4_ = auVar76._0_4_ * (float)local_a00._0_4_;
                  auVar176._4_4_ = auVar76._4_4_ * (float)local_a00._0_4_;
                  auVar176._8_4_ = auVar76._8_4_ * (float)local_a00._0_4_;
                  auVar176._12_4_ = auVar76._12_4_ * (float)local_a00._0_4_;
                  auVar76 = vdpps_avx(auVar264,auVar76,0x7f);
                  fVar187 = auVar76._0_4_;
                  auVar193._0_4_ = auVar264._0_4_ * fVar187;
                  auVar193._4_4_ = auVar264._4_4_ * fVar187;
                  auVar193._8_4_ = auVar264._8_4_ * fVar187;
                  auVar193._12_4_ = auVar264._12_4_ * fVar187;
                  auVar76 = vsubps_avx(auVar176,auVar193);
                  local_c80 = auVar79._0_4_;
                  local_c80 = auVar78._0_4_ * local_c80;
                  auVar79 = vmaxss_avx(ZEXT416((uint)fVar233),
                                       ZEXT416((uint)(local_800._0_4_ * fVar213 * 1.9073486e-06)));
                  auVar21._8_4_ = 0x80000000;
                  auVar21._0_8_ = 0x8000000080000000;
                  auVar21._12_4_ = 0x80000000;
                  auVar142._16_48_ = local_800._16_48_;
                  auVar84 = vxorps_avx512vl(auVar264,auVar21);
                  auVar194._0_4_ = fVar228 * auVar76._0_4_ * local_c80;
                  auVar194._4_4_ = fVar244 * auVar76._4_4_ * local_c80;
                  auVar194._8_4_ = fVar245 * auVar76._8_4_ * local_c80;
                  auVar194._12_4_ = fVar246 * auVar76._12_4_ * local_c80;
                  auVar265 = ZEXT1664(auVar155);
                  auVar76 = vdpps_avx(auVar84,auVar155,0x7f);
                  auVar78 = vfmadd213ss_fma(auVar74,ZEXT416((uint)fVar233),auVar79);
                  auVar74 = vdpps_avx(auVar77,auVar194,0x7f);
                  auVar214 = vfmadd213ss_fma(ZEXT416((uint)(fVar211 + 1.0)),
                                             ZEXT416((uint)(fVar233 / fVar231)),auVar78);
                  fVar228 = auVar76._0_4_ + auVar74._0_4_;
                  auVar76 = vdpps_avx(local_9d0,auVar155,0x7f);
                  auVar74 = vdpps_avx(auVar77,auVar84,0x7f);
                  auVar78 = vmulss_avx512f(auVar83,auVar81);
                  fVar231 = auVar82._0_4_ * 1.5 + auVar78._0_4_ * auVar81._0_4_ * auVar81._0_4_;
                  auVar78 = vdpps_avx(auVar77,local_9d0,0x7f);
                  auVar82 = vfnmadd231ss_fma(auVar74,auVar80,ZEXT416((uint)fVar228));
                  auVar78 = vfnmadd231ss_fma(auVar78,auVar80,auVar76);
                  auVar74 = vpermilps_avx(local_880._0_16_,0xff);
                  fVar232 = fVar232 - auVar74._0_4_;
                  auVar81 = vshufps_avx(auVar264,auVar264,0xff);
                  auVar74 = vfmsub213ss_fma(auVar82,ZEXT416((uint)fVar231),auVar81);
                  auVar255._8_4_ = 0x80000000;
                  auVar255._0_8_ = 0x8000000080000000;
                  auVar255._12_4_ = 0x80000000;
                  auVar257 = ZEXT1664(auVar255);
                  auVar250._0_8_ = auVar74._0_8_ ^ 0x8000000080000000;
                  auVar250._8_4_ = auVar74._8_4_ ^ 0x80000000;
                  auVar250._12_4_ = auVar74._12_4_ ^ 0x80000000;
                  auVar253 = ZEXT1664(auVar250);
                  auVar78 = ZEXT416((uint)(auVar78._0_4_ * fVar231));
                  auVar82 = vfmsub231ss_fma(ZEXT416((uint)(auVar76._0_4_ * auVar74._0_4_)),
                                            ZEXT416((uint)fVar228),auVar78);
                  auVar74 = vinsertps_avx(auVar250,auVar78,0x1c);
                  auVar239._0_8_ = auVar76._0_8_ ^ 0x8000000080000000;
                  auVar239._8_4_ = auVar76._8_4_ ^ 0x80000000;
                  auVar239._12_4_ = auVar76._12_4_ ^ 0x80000000;
                  auVar78 = vinsertps_avx(ZEXT416((uint)fVar228),auVar239,0x10);
                  auVar218._0_4_ = auVar82._0_4_;
                  auVar218._4_4_ = auVar218._0_4_;
                  auVar218._8_4_ = auVar218._0_4_;
                  auVar218._12_4_ = auVar218._0_4_;
                  auVar76 = vdivps_avx(auVar74,auVar218);
                  auVar74 = vdivps_avx(auVar78,auVar218);
                  auVar219._0_4_ = fVar230 * auVar76._0_4_ + fVar232 * auVar74._0_4_;
                  auVar219._4_4_ = fVar230 * auVar76._4_4_ + fVar232 * auVar74._4_4_;
                  auVar219._8_4_ = fVar230 * auVar76._8_4_ + fVar232 * auVar74._8_4_;
                  auVar219._12_4_ = fVar230 * auVar76._12_4_ + fVar232 * auVar74._12_4_;
                  auVar76 = vsubps_avx(local_800._0_16_,auVar219);
                  auVar169 = ZEXT1664(auVar76);
                  auVar22._8_4_ = 0x7fffffff;
                  auVar22._0_8_ = 0x7fffffff7fffffff;
                  auVar22._12_4_ = 0x7fffffff;
                  auVar74 = vandps_avx512vl(auVar80,auVar22);
                  if (auVar74._0_4_ < auVar214._0_4_) {
                    auVar74 = vfmadd231ss_fma(ZEXT416((uint)(auVar214._0_4_ + auVar79._0_4_)),
                                              local_920,ZEXT416(0x36000000));
                    auVar23._8_4_ = 0x7fffffff;
                    auVar23._0_8_ = 0x7fffffff7fffffff;
                    auVar23._12_4_ = 0x7fffffff;
                    auVar78 = vandps_avx512vl(ZEXT416((uint)fVar232),auVar23);
                    if (auVar78._0_4_ < auVar74._0_4_) {
                      fVar213 = auVar76._0_4_ + (float)local_930._0_4_;
                      if (fVar213 < fVar212) {
LAB_01e79cf5:
                        bVar58 = 0;
                        goto LAB_01e79d1a;
                      }
                      fVar228 = *(float *)(ray + k * 4 + 0x200);
                      if (fVar213 <= fVar228) {
                        auVar76 = vmovshdup_avx(auVar76);
                        bVar58 = 0;
                        if ((auVar76._0_4_ < 0.0) || (1.0 < auVar76._0_4_)) goto LAB_01e79d1a;
                        auVar220._0_12_ = ZEXT812(0);
                        auVar220._12_4_ = 0;
                        auVar142._0_16_ = auVar220;
                        auVar141._4_60_ = auVar142._4_60_;
                        auVar141._0_4_ = fVar229;
                        auVar76 = vrsqrt14ss_avx512f(auVar220,auVar141._0_16_);
                        fVar229 = auVar76._0_4_;
                        auVar75 = vmulss_avx512f(auVar75,ZEXT416(0xbf000000));
                        pGVar3 = (context->scene->geometries).items[uVar63].ptr;
                        if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) goto LAB_01e79cf5;
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (bVar58 = 1, pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0))
                        goto LAB_01e79d1a;
                        fVar229 = fVar229 * 1.5 + auVar75._0_4_ * fVar229 * fVar229 * fVar229;
                        auVar195._0_4_ = auVar77._0_4_ * fVar229;
                        auVar195._4_4_ = auVar77._4_4_ * fVar229;
                        auVar195._8_4_ = auVar77._8_4_ * fVar229;
                        auVar195._12_4_ = auVar77._12_4_ * fVar229;
                        auVar74 = vfmadd213ps_fma(auVar81,auVar195,auVar264);
                        auVar75 = vshufps_avx(auVar195,auVar195,0xc9);
                        auVar76 = vshufps_avx(auVar264,auVar264,0xc9);
                        auVar196._0_4_ = auVar195._0_4_ * auVar76._0_4_;
                        auVar196._4_4_ = auVar195._4_4_ * auVar76._4_4_;
                        auVar196._8_4_ = auVar195._8_4_ * auVar76._8_4_;
                        auVar196._12_4_ = auVar195._12_4_ * auVar76._12_4_;
                        auVar264 = vfmsub231ps_fma(auVar196,auVar264,auVar75);
                        auVar75 = vshufps_avx(auVar264,auVar264,0xc9);
                        auVar76 = vshufps_avx(auVar74,auVar74,0xc9);
                        auVar264 = vshufps_avx(auVar264,auVar264,0xd2);
                        auVar157._0_4_ = auVar74._0_4_ * auVar264._0_4_;
                        auVar157._4_4_ = auVar74._4_4_ * auVar264._4_4_;
                        auVar157._8_4_ = auVar74._8_4_ * auVar264._8_4_;
                        auVar157._12_4_ = auVar74._12_4_ * auVar264._12_4_;
                        auVar75 = vfmsub231ps_fma(auVar157,auVar75,auVar76);
                        auVar140 = vbroadcastss_avx512f(ZEXT416(1));
                        local_340 = vpermps_avx512f(auVar140,auVar169);
                        auVar169 = vpermps_avx512f(auVar140,ZEXT1664(auVar75));
                        auVar140 = vbroadcastss_avx512f(ZEXT416(2));
                        local_3c0 = vpermps_avx512f(auVar140,ZEXT1664(auVar75));
                        local_380 = vbroadcastss_avx512f(auVar75);
                        local_400[0] = (RTCHitN)auVar169[0];
                        local_400[1] = (RTCHitN)auVar169[1];
                        local_400[2] = (RTCHitN)auVar169[2];
                        local_400[3] = (RTCHitN)auVar169[3];
                        local_400[4] = (RTCHitN)auVar169[4];
                        local_400[5] = (RTCHitN)auVar169[5];
                        local_400[6] = (RTCHitN)auVar169[6];
                        local_400[7] = (RTCHitN)auVar169[7];
                        local_400[8] = (RTCHitN)auVar169[8];
                        local_400[9] = (RTCHitN)auVar169[9];
                        local_400[10] = (RTCHitN)auVar169[10];
                        local_400[0xb] = (RTCHitN)auVar169[0xb];
                        local_400[0xc] = (RTCHitN)auVar169[0xc];
                        local_400[0xd] = (RTCHitN)auVar169[0xd];
                        local_400[0xe] = (RTCHitN)auVar169[0xe];
                        local_400[0xf] = (RTCHitN)auVar169[0xf];
                        local_400[0x10] = (RTCHitN)auVar169[0x10];
                        local_400[0x11] = (RTCHitN)auVar169[0x11];
                        local_400[0x12] = (RTCHitN)auVar169[0x12];
                        local_400[0x13] = (RTCHitN)auVar169[0x13];
                        local_400[0x14] = (RTCHitN)auVar169[0x14];
                        local_400[0x15] = (RTCHitN)auVar169[0x15];
                        local_400[0x16] = (RTCHitN)auVar169[0x16];
                        local_400[0x17] = (RTCHitN)auVar169[0x17];
                        local_400[0x18] = (RTCHitN)auVar169[0x18];
                        local_400[0x19] = (RTCHitN)auVar169[0x19];
                        local_400[0x1a] = (RTCHitN)auVar169[0x1a];
                        local_400[0x1b] = (RTCHitN)auVar169[0x1b];
                        local_400[0x1c] = (RTCHitN)auVar169[0x1c];
                        local_400[0x1d] = (RTCHitN)auVar169[0x1d];
                        local_400[0x1e] = (RTCHitN)auVar169[0x1e];
                        local_400[0x1f] = (RTCHitN)auVar169[0x1f];
                        local_400[0x20] = (RTCHitN)auVar169[0x20];
                        local_400[0x21] = (RTCHitN)auVar169[0x21];
                        local_400[0x22] = (RTCHitN)auVar169[0x22];
                        local_400[0x23] = (RTCHitN)auVar169[0x23];
                        local_400[0x24] = (RTCHitN)auVar169[0x24];
                        local_400[0x25] = (RTCHitN)auVar169[0x25];
                        local_400[0x26] = (RTCHitN)auVar169[0x26];
                        local_400[0x27] = (RTCHitN)auVar169[0x27];
                        local_400[0x28] = (RTCHitN)auVar169[0x28];
                        local_400[0x29] = (RTCHitN)auVar169[0x29];
                        local_400[0x2a] = (RTCHitN)auVar169[0x2a];
                        local_400[0x2b] = (RTCHitN)auVar169[0x2b];
                        local_400[0x2c] = (RTCHitN)auVar169[0x2c];
                        local_400[0x2d] = (RTCHitN)auVar169[0x2d];
                        local_400[0x2e] = (RTCHitN)auVar169[0x2e];
                        local_400[0x2f] = (RTCHitN)auVar169[0x2f];
                        local_400[0x30] = (RTCHitN)auVar169[0x30];
                        local_400[0x31] = (RTCHitN)auVar169[0x31];
                        local_400[0x32] = (RTCHitN)auVar169[0x32];
                        local_400[0x33] = (RTCHitN)auVar169[0x33];
                        local_400[0x34] = (RTCHitN)auVar169[0x34];
                        local_400[0x35] = (RTCHitN)auVar169[0x35];
                        local_400[0x36] = (RTCHitN)auVar169[0x36];
                        local_400[0x37] = (RTCHitN)auVar169[0x37];
                        local_400[0x38] = (RTCHitN)auVar169[0x38];
                        local_400[0x39] = (RTCHitN)auVar169[0x39];
                        local_400[0x3a] = (RTCHitN)auVar169[0x3a];
                        local_400[0x3b] = (RTCHitN)auVar169[0x3b];
                        local_400[0x3c] = (RTCHitN)auVar169[0x3c];
                        local_400[0x3d] = (RTCHitN)auVar169[0x3d];
                        local_400[0x3e] = (RTCHitN)auVar169[0x3e];
                        local_400[0x3f] = (RTCHitN)auVar169[0x3f];
                        local_300 = 0;
                        uStack_2f8 = 0;
                        uStack_2f0 = 0;
                        uStack_2e8 = 0;
                        uStack_2e0 = 0;
                        uStack_2d8 = 0;
                        uStack_2d0 = 0;
                        uStack_2c8 = 0;
                        local_2c0 = local_480._0_8_;
                        uStack_2b8 = local_480._8_8_;
                        uStack_2b0 = local_480._16_8_;
                        uStack_2a8 = local_480._24_8_;
                        uStack_2a0 = local_480._32_8_;
                        uStack_298 = local_480._40_8_;
                        uStack_290 = local_480._48_8_;
                        uStack_288 = local_480._56_8_;
                        auVar169 = vmovdqa64_avx512f(local_4c0);
                        local_280 = vmovdqa64_avx512f(auVar169);
                        vpcmpeqd_avx2(auVar169._0_32_,auVar169._0_32_);
                        local_240 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                        local_200 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                        *(float *)(ray + k * 4 + 0x200) = fVar213;
                        auVar169 = vmovdqa64_avx512f(local_500);
                        local_7c0 = vmovdqa64_avx512f(auVar169);
                        local_a50.valid = (int *)local_7c0;
                        local_a50.geometryUserPtr = pGVar3->userPtr;
                        local_a50.context = context->user;
                        local_a50.hit = local_400;
                        local_a50.N = 0x10;
                        local_a50.ray = (RTCRayN *)ray;
                        if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar253 = ZEXT1664(auVar250);
                          auVar257 = ZEXT1664(auVar255);
                          auVar263 = ZEXT1664(auVar77);
                          auVar265 = ZEXT1664(auVar155);
                          (*pGVar3->occlusionFilterN)(&local_a50);
                          auVar87 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar273 = ZEXT3264(auVar87);
                          auVar169 = vmovdqa64_avx512f(local_7c0);
                        }
                        uVar16 = vptestmd_avx512f(auVar169,auVar169);
                        if ((short)uVar16 != 0) {
                          p_Var7 = context->args->filter;
                          if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar253 = ZEXT1664(auVar253._0_16_);
                            auVar257 = ZEXT1664(auVar257._0_16_);
                            auVar263 = ZEXT1664(auVar263._0_16_);
                            auVar265 = ZEXT1664(auVar265._0_16_);
                            (*p_Var7)(&local_a50);
                            auVar87 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                            auVar273 = ZEXT3264(auVar87);
                            auVar169 = vmovdqa64_avx512f(local_7c0);
                          }
                          uVar71 = vptestmd_avx512f(auVar169,auVar169);
                          auVar169 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                          bVar14 = (bool)((byte)uVar71 & 1);
                          auVar143._0_4_ =
                               (uint)bVar14 * auVar169._0_4_ |
                               (uint)!bVar14 * *(int *)(local_a50.ray + 0x200);
                          bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
                          auVar143._4_4_ =
                               (uint)bVar14 * auVar169._4_4_ |
                               (uint)!bVar14 * *(int *)(local_a50.ray + 0x204);
                          bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
                          auVar143._8_4_ =
                               (uint)bVar14 * auVar169._8_4_ |
                               (uint)!bVar14 * *(int *)(local_a50.ray + 0x208);
                          bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
                          auVar143._12_4_ =
                               (uint)bVar14 * auVar169._12_4_ |
                               (uint)!bVar14 * *(int *)(local_a50.ray + 0x20c);
                          bVar14 = (bool)((byte)(uVar71 >> 4) & 1);
                          auVar143._16_4_ =
                               (uint)bVar14 * auVar169._16_4_ |
                               (uint)!bVar14 * *(int *)(local_a50.ray + 0x210);
                          bVar14 = (bool)((byte)(uVar71 >> 5) & 1);
                          auVar143._20_4_ =
                               (uint)bVar14 * auVar169._20_4_ |
                               (uint)!bVar14 * *(int *)(local_a50.ray + 0x214);
                          bVar14 = (bool)((byte)(uVar71 >> 6) & 1);
                          auVar143._24_4_ =
                               (uint)bVar14 * auVar169._24_4_ |
                               (uint)!bVar14 * *(int *)(local_a50.ray + 0x218);
                          bVar14 = (bool)((byte)(uVar71 >> 7) & 1);
                          auVar143._28_4_ =
                               (uint)bVar14 * auVar169._28_4_ |
                               (uint)!bVar14 * *(int *)(local_a50.ray + 0x21c);
                          bVar14 = (bool)((byte)(uVar71 >> 8) & 1);
                          auVar143._32_4_ =
                               (uint)bVar14 * auVar169._32_4_ |
                               (uint)!bVar14 * *(int *)(local_a50.ray + 0x220);
                          bVar14 = (bool)((byte)(uVar71 >> 9) & 1);
                          auVar143._36_4_ =
                               (uint)bVar14 * auVar169._36_4_ |
                               (uint)!bVar14 * *(int *)(local_a50.ray + 0x224);
                          bVar14 = (bool)((byte)(uVar71 >> 10) & 1);
                          auVar143._40_4_ =
                               (uint)bVar14 * auVar169._40_4_ |
                               (uint)!bVar14 * *(int *)(local_a50.ray + 0x228);
                          bVar14 = (bool)((byte)(uVar71 >> 0xb) & 1);
                          auVar143._44_4_ =
                               (uint)bVar14 * auVar169._44_4_ |
                               (uint)!bVar14 * *(int *)(local_a50.ray + 0x22c);
                          bVar14 = (bool)((byte)(uVar71 >> 0xc) & 1);
                          auVar143._48_4_ =
                               (uint)bVar14 * auVar169._48_4_ |
                               (uint)!bVar14 * *(int *)(local_a50.ray + 0x230);
                          bVar14 = (bool)((byte)(uVar71 >> 0xd) & 1);
                          auVar143._52_4_ =
                               (uint)bVar14 * auVar169._52_4_ |
                               (uint)!bVar14 * *(int *)(local_a50.ray + 0x234);
                          bVar14 = (bool)((byte)(uVar71 >> 0xe) & 1);
                          auVar143._56_4_ =
                               (uint)bVar14 * auVar169._56_4_ |
                               (uint)!bVar14 * *(int *)(local_a50.ray + 0x238);
                          bVar14 = SUB81(uVar71 >> 0xf,0);
                          auVar143._60_4_ =
                               (uint)bVar14 * auVar169._60_4_ |
                               (uint)!bVar14 * *(int *)(local_a50.ray + 0x23c);
                          *(undefined1 (*) [64])(local_a50.ray + 0x200) = auVar143;
                          bVar58 = 1;
                          if ((short)uVar71 != 0) goto LAB_01e79d1a;
                        }
                        *(float *)(ray + k * 4 + 0x200) = fVar228;
                      }
                      bVar58 = 0;
                      goto LAB_01e79d1a;
                    }
                  }
                  bVar70 = uVar71 < 4;
                  uVar71 = uVar71 + 1;
                } while (uVar71 != 5);
                bVar70 = false;
                bVar58 = 5;
LAB_01e79d1a:
                bVar69 = (bool)(bVar69 | bVar70 & bVar58);
                uVar170 = *(undefined4 *)(ray + k * 4 + 0x200);
                auVar167._4_4_ = uVar170;
                auVar167._0_4_ = uVar170;
                auVar167._8_4_ = uVar170;
                auVar167._12_4_ = uVar170;
                auVar167._16_4_ = uVar170;
                auVar167._20_4_ = uVar170;
                auVar167._24_4_ = uVar170;
                auVar167._28_4_ = uVar170;
                auVar52._4_4_ = fStack_75c;
                auVar52._0_4_ = local_760;
                auVar52._8_4_ = fStack_758;
                auVar52._12_4_ = fStack_754;
                auVar52._16_4_ = fStack_750;
                auVar52._20_4_ = fStack_74c;
                auVar52._24_4_ = fStack_748;
                auVar52._28_4_ = fStack_744;
                uVar16 = vcmpps_avx512vl(auVar167,auVar52,0xd);
                bVar67 = ~('\x01' << ((byte)iVar19 & 0x1f)) & bVar67 & (byte)uVar16;
                auVar87 = local_6c0;
              } while (bVar67 != 0);
            }
            auVar169 = ZEXT3264(local_700);
            bVar57 = local_780[0] | ~bVar57;
            auVar185._0_4_ = fVar153 + auVar87._0_4_;
            auVar185._4_4_ = fVar153 + auVar87._4_4_;
            auVar185._8_4_ = fVar153 + auVar87._8_4_;
            auVar185._12_4_ = fVar153 + auVar87._12_4_;
            auVar185._16_4_ = fVar153 + auVar87._16_4_;
            auVar185._20_4_ = fVar153 + auVar87._20_4_;
            auVar185._24_4_ = fVar153 + auVar87._24_4_;
            auVar185._28_4_ = fVar153 + auVar87._28_4_;
            uVar16 = vcmpps_avx512vl(auVar185,auVar167,2);
            bVar55 = (byte)uVar17 & bVar55 & (byte)uVar16;
            auVar186._8_4_ = 2;
            auVar186._0_8_ = 0x200000002;
            auVar186._12_4_ = 2;
            auVar186._16_4_ = 2;
            auVar186._20_4_ = 2;
            auVar186._24_4_ = 2;
            auVar186._28_4_ = 2;
            auVar31._8_4_ = 3;
            auVar31._0_8_ = 0x300000003;
            auVar31._12_4_ = 3;
            auVar31._16_4_ = 3;
            auVar31._20_4_ = 3;
            auVar31._24_4_ = 3;
            auVar31._28_4_ = 3;
            auVar87 = vpblendmd_avx512vl(auVar186,auVar31);
            auVar137._0_4_ = (uint)(bVar57 & 1) * auVar87._0_4_ | (uint)!(bool)(bVar57 & 1) * 2;
            bVar70 = (bool)(bVar57 >> 1 & 1);
            auVar137._4_4_ = (uint)bVar70 * auVar87._4_4_ | (uint)!bVar70 * 2;
            bVar70 = (bool)(bVar57 >> 2 & 1);
            auVar137._8_4_ = (uint)bVar70 * auVar87._8_4_ | (uint)!bVar70 * 2;
            bVar70 = (bool)(bVar57 >> 3 & 1);
            auVar137._12_4_ = (uint)bVar70 * auVar87._12_4_ | (uint)!bVar70 * 2;
            bVar70 = (bool)(bVar57 >> 4 & 1);
            auVar137._16_4_ = (uint)bVar70 * auVar87._16_4_ | (uint)!bVar70 * 2;
            bVar70 = (bool)(bVar57 >> 5 & 1);
            auVar137._20_4_ = (uint)bVar70 * auVar87._20_4_ | (uint)!bVar70 * 2;
            bVar70 = (bool)(bVar57 >> 6 & 1);
            auVar137._24_4_ = (uint)bVar70 * auVar87._24_4_ | (uint)!bVar70 * 2;
            auVar137._28_4_ = (uint)(bVar57 >> 7) * auVar87._28_4_ | (uint)!(bool)(bVar57 >> 7) * 2;
            uVar16 = vpcmpd_avx512vl(local_720,auVar137,5);
            bVar57 = (byte)uVar16 & bVar55;
            if (bVar57 != 0) {
              auVar76 = vminps_avx(local_960._0_16_,local_9a0._0_16_);
              auVar75 = vmaxps_avx(local_960._0_16_,local_9a0._0_16_);
              auVar77 = vminps_avx(local_980._0_16_,local_9c0._0_16_);
              auVar264 = vminps_avx(auVar76,auVar77);
              auVar76 = vmaxps_avx(local_980._0_16_,local_9c0._0_16_);
              auVar77 = vmaxps_avx(auVar75,auVar76);
              auVar197._8_4_ = 0x7fffffff;
              auVar197._0_8_ = 0x7fffffff7fffffff;
              auVar197._12_4_ = 0x7fffffff;
              auVar75 = vandps_avx(auVar264,auVar197);
              auVar76 = vandps_avx(auVar77,auVar197);
              auVar75 = vmaxps_avx(auVar75,auVar76);
              auVar76 = vmovshdup_avx(auVar75);
              auVar76 = vmaxss_avx(auVar76,auVar75);
              auVar75 = vshufpd_avx(auVar75,auVar75,1);
              auVar75 = vmaxss_avx(auVar75,auVar76);
              fVar233 = auVar75._0_4_ * 1.9073486e-06;
              local_920 = vshufps_avx(auVar77,auVar77,0xff);
              local_760 = fVar153 + local_700._0_4_;
              fStack_75c = fVar153 + local_700._4_4_;
              fStack_758 = fVar153 + local_700._8_4_;
              fStack_754 = fVar153 + local_700._12_4_;
              fStack_750 = fVar153 + local_700._16_4_;
              fStack_74c = fVar153 + local_700._20_4_;
              fStack_748 = fVar153 + local_700._24_4_;
              fStack_744 = fVar153 + local_700._28_4_;
              _local_a20 = local_700;
              local_780 = auVar137;
              do {
                auVar168._8_4_ = 0x7f800000;
                auVar168._0_8_ = 0x7f8000007f800000;
                auVar168._12_4_ = 0x7f800000;
                auVar168._16_4_ = 0x7f800000;
                auVar168._20_4_ = 0x7f800000;
                auVar168._24_4_ = 0x7f800000;
                auVar168._28_4_ = 0x7f800000;
                auVar87 = vblendmps_avx512vl(auVar168,auVar169._0_32_);
                auVar138._0_4_ =
                     (uint)(bVar57 & 1) * auVar87._0_4_ | (uint)!(bool)(bVar57 & 1) * 0x7f800000;
                bVar70 = (bool)(bVar57 >> 1 & 1);
                auVar138._4_4_ = (uint)bVar70 * auVar87._4_4_ | (uint)!bVar70 * 0x7f800000;
                bVar70 = (bool)(bVar57 >> 2 & 1);
                auVar138._8_4_ = (uint)bVar70 * auVar87._8_4_ | (uint)!bVar70 * 0x7f800000;
                bVar70 = (bool)(bVar57 >> 3 & 1);
                auVar138._12_4_ = (uint)bVar70 * auVar87._12_4_ | (uint)!bVar70 * 0x7f800000;
                bVar70 = (bool)(bVar57 >> 4 & 1);
                auVar138._16_4_ = (uint)bVar70 * auVar87._16_4_ | (uint)!bVar70 * 0x7f800000;
                bVar70 = (bool)(bVar57 >> 5 & 1);
                auVar138._20_4_ = (uint)bVar70 * auVar87._20_4_ | (uint)!bVar70 * 0x7f800000;
                auVar138._24_4_ =
                     (uint)(bVar57 >> 6) * auVar87._24_4_ | (uint)!(bool)(bVar57 >> 6) * 0x7f800000;
                auVar138._28_4_ = 0x7f800000;
                auVar87 = vshufps_avx(auVar138,auVar138,0xb1);
                auVar87 = vminps_avx(auVar138,auVar87);
                auVar98 = vshufpd_avx(auVar87,auVar87,5);
                auVar87 = vminps_avx(auVar87,auVar98);
                auVar98 = vpermpd_avx2(auVar87,0x4e);
                auVar87 = vminps_avx(auVar87,auVar98);
                uVar16 = vcmpps_avx512vl(auVar138,auVar87,0);
                bVar58 = (byte)uVar16 & bVar57;
                bVar67 = bVar57;
                if (bVar58 != 0) {
                  bVar67 = bVar58;
                }
                iVar19 = 0;
                for (uVar65 = (uint)bVar67; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x80000000) {
                  iVar19 = iVar19 + 1;
                }
                uVar65 = *(uint *)(local_540 + (uint)(iVar19 << 2));
                uVar72 = *(uint *)(local_6e0 + (uint)(iVar19 << 2));
                fVar213 = auVar73._0_4_;
                if ((float)local_9e0._0_4_ < 0.0) {
                  fVar213 = sqrtf((float)local_9e0._0_4_);
                }
                auVar75 = vinsertps_avx(ZEXT416(uVar72),ZEXT416(uVar65),0x10);
                auVar140 = ZEXT1664(auVar75);
                bVar70 = true;
                uVar71 = 0;
                do {
                  uVar170 = auVar140._0_4_;
                  auVar158._4_4_ = uVar170;
                  auVar158._0_4_ = uVar170;
                  auVar158._8_4_ = uVar170;
                  auVar158._12_4_ = uVar170;
                  auVar75 = vfmadd132ps_fma(auVar158,ZEXT816(0) << 0x40,local_9d0);
                  auVar76 = vmovshdup_avx(auVar140._0_16_);
                  fVar244 = auVar76._0_4_;
                  fVar211 = 1.0 - fVar244;
                  fVar228 = fVar244 * fVar244;
                  auVar79 = SUB6416(ZEXT464(0x40400000),0);
                  auVar78 = SUB6416(ZEXT464(0xc0a00000),0);
                  auVar264 = vfmadd213ss_fma(auVar79,auVar76,auVar78);
                  auVar77 = vfmadd213ss_fma(auVar264,ZEXT416((uint)fVar228),
                                            SUB6416(ZEXT464(0x40000000),0));
                  auVar74 = vfmadd213ss_fma(auVar79,ZEXT416((uint)fVar211),auVar78);
                  auVar74 = vfmadd213ss_fma(auVar74,ZEXT416((uint)(fVar211 * fVar211)),
                                            SUB6416(ZEXT464(0x40000000),0));
                  fVar229 = fVar211 * fVar211 * -fVar244 * 0.5;
                  fVar230 = auVar77._0_4_ * 0.5;
                  fVar231 = auVar74._0_4_ * 0.5;
                  fVar232 = fVar244 * fVar244 * -fVar211 * 0.5;
                  auVar221._0_4_ = fVar232 * (float)local_9c0._0_4_;
                  auVar221._4_4_ = fVar232 * (float)local_9c0._4_4_;
                  auVar221._8_4_ = fVar232 * fStack_9b8;
                  auVar221._12_4_ = fVar232 * fStack_9b4;
                  auVar235._4_4_ = fVar231;
                  auVar235._0_4_ = fVar231;
                  auVar235._8_4_ = fVar231;
                  auVar235._12_4_ = fVar231;
                  auVar77 = vfmadd132ps_fma(auVar235,auVar221,local_980._0_16_);
                  auVar198._4_4_ = fVar230;
                  auVar198._0_4_ = fVar230;
                  auVar198._8_4_ = fVar230;
                  auVar198._12_4_ = fVar230;
                  auVar77 = vfmadd132ps_fma(auVar198,auVar77,local_9a0._0_16_);
                  auVar222._4_4_ = fVar229;
                  auVar222._0_4_ = fVar229;
                  auVar222._8_4_ = fVar229;
                  auVar222._12_4_ = fVar229;
                  auVar77 = vfmadd132ps_fma(auVar222,auVar77,local_960._0_16_);
                  auVar74 = vfmadd231ss_fma(auVar78,auVar76,ZEXT416(0x41100000));
                  local_8a0._0_16_ = auVar74;
                  auVar74 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar76,
                                            ZEXT416(0x40800000));
                  local_8c0._0_16_ = auVar74;
                  auVar74 = vfmadd213ss_fma(auVar79,auVar76,ZEXT416(0xbf800000));
                  local_8e0._0_16_ = auVar74;
                  local_880._0_16_ = auVar77;
                  auVar77 = vsubps_avx(auVar75,auVar77);
                  auVar75 = vdpps_avx(auVar77,auVar77,0x7f);
                  fVar229 = auVar75._0_4_;
                  local_800 = auVar140;
                  if (fVar229 < 0.0) {
                    local_a00._0_4_ = fVar228;
                    auVar263._0_4_ = sqrtf(fVar229);
                    auVar263._4_60_ = extraout_var_00;
                    auVar264 = ZEXT416(auVar264._0_4_);
                    auVar74 = auVar263._0_16_;
                  }
                  else {
                    auVar74 = vsqrtss_avx(auVar75,auVar75);
                    local_a00._0_4_ = fVar228;
                  }
                  auVar80 = vfnmadd231ss_fma(ZEXT416((uint)(fVar244 * (fVar211 + fVar211))),
                                             ZEXT416((uint)fVar211),ZEXT416((uint)fVar211));
                  auVar264 = vfmadd213ss_fma(auVar264,ZEXT416((uint)(fVar244 + fVar244)),
                                             ZEXT416((uint)(fVar244 * fVar244 * 3.0)));
                  auVar78 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar76,
                                            SUB6416(ZEXT464(0x40000000),0));
                  auVar79 = vfmadd231ss_fma(ZEXT416((uint)(fVar211 * fVar211 * -3.0)),
                                            ZEXT416((uint)(fVar211 + fVar211)),auVar78);
                  auVar78 = vfmadd213ss_fma(ZEXT416((uint)(fVar211 * -2.0)),auVar76,
                                            ZEXT416((uint)local_a00._0_4_));
                  fVar228 = auVar80._0_4_ * 0.5;
                  fVar230 = auVar264._0_4_ * 0.5;
                  fVar231 = auVar79._0_4_ * 0.5;
                  fVar232 = auVar78._0_4_ * 0.5;
                  auVar223._0_4_ = fVar232 * (float)local_9c0._0_4_;
                  auVar223._4_4_ = fVar232 * (float)local_9c0._4_4_;
                  auVar223._8_4_ = fVar232 * fStack_9b8;
                  auVar223._12_4_ = fVar232 * fStack_9b4;
                  auVar199._4_4_ = fVar231;
                  auVar199._0_4_ = fVar231;
                  auVar199._8_4_ = fVar231;
                  auVar199._12_4_ = fVar231;
                  auVar264 = vfmadd132ps_fma(auVar199,auVar223,local_980._0_16_);
                  auVar177._4_4_ = fVar230;
                  auVar177._0_4_ = fVar230;
                  auVar177._8_4_ = fVar230;
                  auVar177._12_4_ = fVar230;
                  auVar264 = vfmadd132ps_fma(auVar177,auVar264,local_9a0._0_16_);
                  auVar267._4_4_ = fVar228;
                  auVar267._0_4_ = fVar228;
                  auVar267._8_4_ = fVar228;
                  auVar267._12_4_ = fVar228;
                  auVar264 = vfmadd132ps_fma(auVar267,auVar264,local_960._0_16_);
                  local_a00._0_16_ = vdpps_avx(auVar264,auVar264,0x7f);
                  auVar51._12_4_ = 0;
                  auVar51._0_12_ = ZEXT812(0);
                  fVar228 = local_a00._0_4_;
                  auVar78 = vrsqrt14ss_avx512f(auVar51 << 0x20,ZEXT416((uint)fVar228));
                  fVar230 = auVar78._0_4_;
                  auVar79 = vrcp14ss_avx512f(auVar51 << 0x20,ZEXT416((uint)fVar228));
                  auVar24._8_4_ = 0x80000000;
                  auVar24._0_8_ = 0x8000000080000000;
                  auVar24._12_4_ = 0x80000000;
                  auVar80 = vxorps_avx512vl(local_a00._0_16_,auVar24);
                  auVar78 = vfnmadd213ss_fma(auVar79,local_a00._0_16_,SUB6416(ZEXT464(0x40000000),0)
                                            );
                  uVar65 = auVar74._0_4_;
                  if (fVar228 < auVar80._0_4_) {
                    fVar231 = sqrtf(fVar228);
                    auVar74 = ZEXT416(uVar65);
                  }
                  else {
                    auVar80 = vsqrtss_avx(local_a00._0_16_,local_a00._0_16_);
                    fVar231 = auVar80._0_4_;
                  }
                  fVar228 = fVar230 * 1.5 + fVar228 * -0.5 * fVar230 * fVar230 * fVar230;
                  auVar159._0_4_ = auVar264._0_4_ * fVar228;
                  auVar159._4_4_ = auVar264._4_4_ * fVar228;
                  auVar159._8_4_ = auVar264._8_4_ * fVar228;
                  auVar159._12_4_ = auVar264._12_4_ * fVar228;
                  auVar80 = vdpps_avx(auVar77,auVar159,0x7f);
                  fVar211 = auVar74._0_4_;
                  fVar230 = auVar80._0_4_;
                  auVar160._0_4_ = fVar230 * fVar230;
                  auVar160._4_4_ = auVar80._4_4_ * auVar80._4_4_;
                  auVar160._8_4_ = auVar80._8_4_ * auVar80._8_4_;
                  auVar160._12_4_ = auVar80._12_4_ * auVar80._12_4_;
                  auVar81 = vsubps_avx512vl(auVar75,auVar160);
                  fVar232 = auVar81._0_4_;
                  auVar178._4_12_ = ZEXT812(0) << 0x20;
                  auVar178._0_4_ = fVar232;
                  auVar82 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar178);
                  auVar83 = vmulss_avx512f(auVar81,ZEXT416(0xbf000000));
                  if (fVar232 < 0.0) {
                    local_910 = fVar228;
                    fStack_90c = fVar228;
                    fStack_908 = fVar228;
                    fStack_904 = fVar228;
                    local_900 = auVar82;
                    fVar232 = sqrtf(fVar232);
                    auVar83 = ZEXT416(auVar83._0_4_);
                    auVar74 = ZEXT416(uVar65);
                    auVar81 = local_900;
                    fVar228 = local_910;
                    fVar244 = fStack_90c;
                    fVar245 = fStack_908;
                    fVar246 = fStack_904;
                  }
                  else {
                    auVar81 = vsqrtss_avx(auVar81,auVar81);
                    fVar232 = auVar81._0_4_;
                    auVar81 = auVar82;
                    fVar244 = fVar228;
                    fVar245 = fVar228;
                    fVar246 = fVar228;
                  }
                  auVar263 = ZEXT1664(auVar77);
                  auVar87 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                  auVar273 = ZEXT3264(auVar87);
                  auVar179._0_4_ = (float)local_8e0._0_4_ * (float)local_9c0._0_4_;
                  auVar179._4_4_ = (float)local_8e0._0_4_ * (float)local_9c0._4_4_;
                  auVar179._8_4_ = (float)local_8e0._0_4_ * fStack_9b8;
                  auVar179._12_4_ = (float)local_8e0._0_4_ * fStack_9b4;
                  auVar200._4_4_ = local_8c0._0_4_;
                  auVar200._0_4_ = local_8c0._0_4_;
                  auVar200._8_4_ = local_8c0._0_4_;
                  auVar200._12_4_ = local_8c0._0_4_;
                  auVar214 = vfmadd132ps_fma(auVar200,auVar179,local_980._0_16_);
                  auVar180._4_4_ = local_8a0._0_4_;
                  auVar180._0_4_ = local_8a0._0_4_;
                  auVar180._8_4_ = local_8a0._0_4_;
                  auVar180._12_4_ = local_8a0._0_4_;
                  auVar214 = vfmadd132ps_fma(auVar180,auVar214,local_9a0._0_16_);
                  auVar76 = vfmadd213ss_fma(auVar76,SUB6416(ZEXT464(0xc0400000),0),
                                            ZEXT416(0x40000000));
                  uVar170 = auVar76._0_4_;
                  auVar201._4_4_ = uVar170;
                  auVar201._0_4_ = uVar170;
                  auVar201._8_4_ = uVar170;
                  auVar201._12_4_ = uVar170;
                  auVar76 = vfmadd132ps_fma(auVar201,auVar214,local_960._0_16_);
                  auVar181._0_4_ = auVar76._0_4_ * (float)local_a00._0_4_;
                  auVar181._4_4_ = auVar76._4_4_ * (float)local_a00._0_4_;
                  auVar181._8_4_ = auVar76._8_4_ * (float)local_a00._0_4_;
                  auVar181._12_4_ = auVar76._12_4_ * (float)local_a00._0_4_;
                  auVar76 = vdpps_avx(auVar264,auVar76,0x7f);
                  fVar187 = auVar76._0_4_;
                  auVar202._0_4_ = auVar264._0_4_ * fVar187;
                  auVar202._4_4_ = auVar264._4_4_ * fVar187;
                  auVar202._8_4_ = auVar264._8_4_ * fVar187;
                  auVar202._12_4_ = auVar264._12_4_ * fVar187;
                  auVar76 = vsubps_avx(auVar181,auVar202);
                  local_c80 = auVar79._0_4_;
                  local_c80 = auVar78._0_4_ * local_c80;
                  auVar79 = vmaxss_avx(ZEXT416((uint)fVar233),
                                       ZEXT416((uint)(local_800._0_4_ * fVar213 * 1.9073486e-06)));
                  auVar25._8_4_ = 0x80000000;
                  auVar25._0_8_ = 0x8000000080000000;
                  auVar25._12_4_ = 0x80000000;
                  auVar145._16_48_ = local_800._16_48_;
                  auVar84 = vxorps_avx512vl(auVar264,auVar25);
                  auVar203._0_4_ = fVar228 * auVar76._0_4_ * local_c80;
                  auVar203._4_4_ = fVar244 * auVar76._4_4_ * local_c80;
                  auVar203._8_4_ = fVar245 * auVar76._8_4_ * local_c80;
                  auVar203._12_4_ = fVar246 * auVar76._12_4_ * local_c80;
                  auVar265 = ZEXT1664(auVar159);
                  auVar76 = vdpps_avx(auVar84,auVar159,0x7f);
                  auVar78 = vfmadd213ss_fma(auVar74,ZEXT416((uint)fVar233),auVar79);
                  auVar74 = vdpps_avx(auVar77,auVar203,0x7f);
                  auVar214 = vfmadd213ss_fma(ZEXT416((uint)(fVar211 + 1.0)),
                                             ZEXT416((uint)(fVar233 / fVar231)),auVar78);
                  fVar228 = auVar76._0_4_ + auVar74._0_4_;
                  auVar76 = vdpps_avx(local_9d0,auVar159,0x7f);
                  auVar74 = vdpps_avx(auVar77,auVar84,0x7f);
                  auVar78 = vmulss_avx512f(auVar83,auVar81);
                  fVar231 = auVar82._0_4_ * 1.5 + auVar78._0_4_ * auVar81._0_4_ * auVar81._0_4_;
                  auVar78 = vdpps_avx(auVar77,local_9d0,0x7f);
                  auVar82 = vfnmadd231ss_fma(auVar74,auVar80,ZEXT416((uint)fVar228));
                  auVar78 = vfnmadd231ss_fma(auVar78,auVar80,auVar76);
                  auVar74 = vpermilps_avx(local_880._0_16_,0xff);
                  fVar232 = fVar232 - auVar74._0_4_;
                  auVar81 = vshufps_avx(auVar264,auVar264,0xff);
                  auVar74 = vfmsub213ss_fma(auVar82,ZEXT416((uint)fVar231),auVar81);
                  auVar256._8_4_ = 0x80000000;
                  auVar256._0_8_ = 0x8000000080000000;
                  auVar256._12_4_ = 0x80000000;
                  auVar257 = ZEXT1664(auVar256);
                  auVar251._0_8_ = auVar74._0_8_ ^ 0x8000000080000000;
                  auVar251._8_4_ = auVar74._8_4_ ^ 0x80000000;
                  auVar251._12_4_ = auVar74._12_4_ ^ 0x80000000;
                  auVar253 = ZEXT1664(auVar251);
                  auVar78 = ZEXT416((uint)(auVar78._0_4_ * fVar231));
                  auVar82 = vfmsub231ss_fma(ZEXT416((uint)(auVar76._0_4_ * auVar74._0_4_)),
                                            ZEXT416((uint)fVar228),auVar78);
                  auVar74 = vinsertps_avx(auVar251,auVar78,0x1c);
                  auVar240._0_8_ = auVar76._0_8_ ^ 0x8000000080000000;
                  auVar240._8_4_ = auVar76._8_4_ ^ 0x80000000;
                  auVar240._12_4_ = auVar76._12_4_ ^ 0x80000000;
                  auVar78 = vinsertps_avx(ZEXT416((uint)fVar228),auVar240,0x10);
                  auVar224._0_4_ = auVar82._0_4_;
                  auVar224._4_4_ = auVar224._0_4_;
                  auVar224._8_4_ = auVar224._0_4_;
                  auVar224._12_4_ = auVar224._0_4_;
                  auVar76 = vdivps_avx(auVar74,auVar224);
                  auVar74 = vdivps_avx(auVar78,auVar224);
                  auVar225._0_4_ = fVar230 * auVar76._0_4_ + fVar232 * auVar74._0_4_;
                  auVar225._4_4_ = fVar230 * auVar76._4_4_ + fVar232 * auVar74._4_4_;
                  auVar225._8_4_ = fVar230 * auVar76._8_4_ + fVar232 * auVar74._8_4_;
                  auVar225._12_4_ = fVar230 * auVar76._12_4_ + fVar232 * auVar74._12_4_;
                  auVar76 = vsubps_avx(local_800._0_16_,auVar225);
                  auVar140 = ZEXT1664(auVar76);
                  auVar26._8_4_ = 0x7fffffff;
                  auVar26._0_8_ = 0x7fffffff7fffffff;
                  auVar26._12_4_ = 0x7fffffff;
                  auVar74 = vandps_avx512vl(auVar80,auVar26);
                  if (auVar74._0_4_ < auVar214._0_4_) {
                    auVar74 = vfmadd231ss_fma(ZEXT416((uint)(auVar214._0_4_ + auVar79._0_4_)),
                                              local_920,ZEXT416(0x36000000));
                    auVar27._8_4_ = 0x7fffffff;
                    auVar27._0_8_ = 0x7fffffff7fffffff;
                    auVar27._12_4_ = 0x7fffffff;
                    auVar78 = vandps_avx512vl(ZEXT416((uint)fVar232),auVar27);
                    if (auVar78._0_4_ < auVar74._0_4_) {
                      fVar213 = auVar76._0_4_ + (float)local_930._0_4_;
                      if (fVar213 < fVar212) {
                        bVar67 = 0;
                        goto LAB_01e7a9a1;
                      }
                      fVar228 = *(float *)(ray + k * 4 + 0x200);
                      auVar253 = ZEXT464((uint)fVar228);
                      auVar169 = ZEXT3264(_local_a20);
                      if (fVar213 <= fVar228) {
                        auVar76 = vmovshdup_avx(auVar76);
                        bVar67 = 0;
                        if ((auVar76._0_4_ < 0.0) || (1.0 < auVar76._0_4_)) goto LAB_01e7a9aa;
                        auVar226._0_12_ = ZEXT812(0);
                        auVar226._12_4_ = 0;
                        auVar145._0_16_ = auVar226;
                        auVar144._4_60_ = auVar145._4_60_;
                        auVar144._0_4_ = fVar229;
                        auVar76 = vrsqrt14ss_avx512f(auVar226,auVar144._0_16_);
                        fVar229 = auVar76._0_4_;
                        auVar75 = vmulss_avx512f(auVar75,ZEXT416(0xbf000000));
                        pGVar3 = (context->scene->geometries).items[uVar63].ptr;
                        if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) {
                          bVar67 = 0;
                          goto LAB_01e7a9aa;
                        }
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (bVar67 = 1, pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0))
                        goto LAB_01e7a9aa;
                        fVar229 = fVar229 * 1.5 + auVar75._0_4_ * fVar229 * fVar229 * fVar229;
                        auVar204._0_4_ = auVar77._0_4_ * fVar229;
                        auVar204._4_4_ = auVar77._4_4_ * fVar229;
                        auVar204._8_4_ = auVar77._8_4_ * fVar229;
                        auVar204._12_4_ = auVar77._12_4_ * fVar229;
                        auVar74 = vfmadd213ps_fma(auVar81,auVar204,auVar264);
                        auVar75 = vshufps_avx(auVar204,auVar204,0xc9);
                        auVar76 = vshufps_avx(auVar264,auVar264,0xc9);
                        auVar205._0_4_ = auVar204._0_4_ * auVar76._0_4_;
                        auVar205._4_4_ = auVar204._4_4_ * auVar76._4_4_;
                        auVar205._8_4_ = auVar204._8_4_ * auVar76._8_4_;
                        auVar205._12_4_ = auVar204._12_4_ * auVar76._12_4_;
                        auVar264 = vfmsub231ps_fma(auVar205,auVar264,auVar75);
                        auVar75 = vshufps_avx(auVar264,auVar264,0xc9);
                        auVar76 = vshufps_avx(auVar74,auVar74,0xc9);
                        auVar264 = vshufps_avx(auVar264,auVar264,0xd2);
                        auVar161._0_4_ = auVar74._0_4_ * auVar264._0_4_;
                        auVar161._4_4_ = auVar74._4_4_ * auVar264._4_4_;
                        auVar161._8_4_ = auVar74._8_4_ * auVar264._8_4_;
                        auVar161._12_4_ = auVar74._12_4_ * auVar264._12_4_;
                        auVar75 = vfmsub231ps_fma(auVar161,auVar75,auVar76);
                        auVar253 = vbroadcastss_avx512f(ZEXT416(1));
                        local_340 = vpermps_avx512f(auVar253,auVar140);
                        auVar140 = vpermps_avx512f(auVar253,ZEXT1664(auVar75));
                        auVar253 = vbroadcastss_avx512f(ZEXT416(2));
                        local_3c0 = vpermps_avx512f(auVar253,ZEXT1664(auVar75));
                        local_380 = vbroadcastss_avx512f(auVar75);
                        local_400[0] = (RTCHitN)auVar140[0];
                        local_400[1] = (RTCHitN)auVar140[1];
                        local_400[2] = (RTCHitN)auVar140[2];
                        local_400[3] = (RTCHitN)auVar140[3];
                        local_400[4] = (RTCHitN)auVar140[4];
                        local_400[5] = (RTCHitN)auVar140[5];
                        local_400[6] = (RTCHitN)auVar140[6];
                        local_400[7] = (RTCHitN)auVar140[7];
                        local_400[8] = (RTCHitN)auVar140[8];
                        local_400[9] = (RTCHitN)auVar140[9];
                        local_400[10] = (RTCHitN)auVar140[10];
                        local_400[0xb] = (RTCHitN)auVar140[0xb];
                        local_400[0xc] = (RTCHitN)auVar140[0xc];
                        local_400[0xd] = (RTCHitN)auVar140[0xd];
                        local_400[0xe] = (RTCHitN)auVar140[0xe];
                        local_400[0xf] = (RTCHitN)auVar140[0xf];
                        local_400[0x10] = (RTCHitN)auVar140[0x10];
                        local_400[0x11] = (RTCHitN)auVar140[0x11];
                        local_400[0x12] = (RTCHitN)auVar140[0x12];
                        local_400[0x13] = (RTCHitN)auVar140[0x13];
                        local_400[0x14] = (RTCHitN)auVar140[0x14];
                        local_400[0x15] = (RTCHitN)auVar140[0x15];
                        local_400[0x16] = (RTCHitN)auVar140[0x16];
                        local_400[0x17] = (RTCHitN)auVar140[0x17];
                        local_400[0x18] = (RTCHitN)auVar140[0x18];
                        local_400[0x19] = (RTCHitN)auVar140[0x19];
                        local_400[0x1a] = (RTCHitN)auVar140[0x1a];
                        local_400[0x1b] = (RTCHitN)auVar140[0x1b];
                        local_400[0x1c] = (RTCHitN)auVar140[0x1c];
                        local_400[0x1d] = (RTCHitN)auVar140[0x1d];
                        local_400[0x1e] = (RTCHitN)auVar140[0x1e];
                        local_400[0x1f] = (RTCHitN)auVar140[0x1f];
                        local_400[0x20] = (RTCHitN)auVar140[0x20];
                        local_400[0x21] = (RTCHitN)auVar140[0x21];
                        local_400[0x22] = (RTCHitN)auVar140[0x22];
                        local_400[0x23] = (RTCHitN)auVar140[0x23];
                        local_400[0x24] = (RTCHitN)auVar140[0x24];
                        local_400[0x25] = (RTCHitN)auVar140[0x25];
                        local_400[0x26] = (RTCHitN)auVar140[0x26];
                        local_400[0x27] = (RTCHitN)auVar140[0x27];
                        local_400[0x28] = (RTCHitN)auVar140[0x28];
                        local_400[0x29] = (RTCHitN)auVar140[0x29];
                        local_400[0x2a] = (RTCHitN)auVar140[0x2a];
                        local_400[0x2b] = (RTCHitN)auVar140[0x2b];
                        local_400[0x2c] = (RTCHitN)auVar140[0x2c];
                        local_400[0x2d] = (RTCHitN)auVar140[0x2d];
                        local_400[0x2e] = (RTCHitN)auVar140[0x2e];
                        local_400[0x2f] = (RTCHitN)auVar140[0x2f];
                        local_400[0x30] = (RTCHitN)auVar140[0x30];
                        local_400[0x31] = (RTCHitN)auVar140[0x31];
                        local_400[0x32] = (RTCHitN)auVar140[0x32];
                        local_400[0x33] = (RTCHitN)auVar140[0x33];
                        local_400[0x34] = (RTCHitN)auVar140[0x34];
                        local_400[0x35] = (RTCHitN)auVar140[0x35];
                        local_400[0x36] = (RTCHitN)auVar140[0x36];
                        local_400[0x37] = (RTCHitN)auVar140[0x37];
                        local_400[0x38] = (RTCHitN)auVar140[0x38];
                        local_400[0x39] = (RTCHitN)auVar140[0x39];
                        local_400[0x3a] = (RTCHitN)auVar140[0x3a];
                        local_400[0x3b] = (RTCHitN)auVar140[0x3b];
                        local_400[0x3c] = (RTCHitN)auVar140[0x3c];
                        local_400[0x3d] = (RTCHitN)auVar140[0x3d];
                        local_400[0x3e] = (RTCHitN)auVar140[0x3e];
                        local_400[0x3f] = (RTCHitN)auVar140[0x3f];
                        local_300 = 0;
                        uStack_2f8 = 0;
                        uStack_2f0 = 0;
                        uStack_2e8 = 0;
                        uStack_2e0 = 0;
                        uStack_2d8 = 0;
                        uStack_2d0 = 0;
                        uStack_2c8 = 0;
                        local_2c0 = local_480._0_8_;
                        uStack_2b8 = local_480._8_8_;
                        uStack_2b0 = local_480._16_8_;
                        uStack_2a8 = local_480._24_8_;
                        uStack_2a0 = local_480._32_8_;
                        uStack_298 = local_480._40_8_;
                        uStack_290 = local_480._48_8_;
                        uStack_288 = local_480._56_8_;
                        auVar140 = vmovdqa64_avx512f(local_4c0);
                        local_280 = vmovdqa64_avx512f(auVar140);
                        vpcmpeqd_avx2(auVar140._0_32_,auVar140._0_32_);
                        local_240 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                        local_200 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                        *(float *)(ray + k * 4 + 0x200) = fVar213;
                        auVar140 = vmovdqa64_avx512f(local_500);
                        local_7c0 = vmovdqa64_avx512f(auVar140);
                        local_a50.valid = (int *)local_7c0;
                        local_a50.geometryUserPtr = pGVar3->userPtr;
                        local_a50.context = context->user;
                        local_a50.hit = local_400;
                        local_a50.N = 0x10;
                        local_a50.ray = (RTCRayN *)ray;
                        if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar257 = ZEXT1664(auVar256);
                          auVar263 = ZEXT1664(auVar77);
                          auVar265 = ZEXT1664(auVar159);
                          (*pGVar3->occlusionFilterN)(&local_a50);
                          auVar169 = ZEXT3264(_local_a20);
                          auVar87 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar273 = ZEXT3264(auVar87);
                          auVar140 = vmovdqa64_avx512f(local_7c0);
                        }
                        uVar16 = vptestmd_avx512f(auVar140,auVar140);
                        if ((short)uVar16 != 0) {
                          p_Var7 = context->args->filter;
                          if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar257 = ZEXT1664(auVar257._0_16_);
                            auVar263 = ZEXT1664(auVar263._0_16_);
                            auVar265 = ZEXT1664(auVar265._0_16_);
                            (*p_Var7)(&local_a50);
                            auVar169 = ZEXT3264(_local_a20);
                            auVar87 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                            auVar273 = ZEXT3264(auVar87);
                            auVar140 = vmovdqa64_avx512f(local_7c0);
                          }
                          auVar253 = ZEXT464((uint)fVar228);
                          uVar71 = vptestmd_avx512f(auVar140,auVar140);
                          auVar140 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                          bVar14 = (bool)((byte)uVar71 & 1);
                          auVar146._0_4_ =
                               (uint)bVar14 * auVar140._0_4_ |
                               (uint)!bVar14 * *(int *)(local_a50.ray + 0x200);
                          bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
                          auVar146._4_4_ =
                               (uint)bVar14 * auVar140._4_4_ |
                               (uint)!bVar14 * *(int *)(local_a50.ray + 0x204);
                          bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
                          auVar146._8_4_ =
                               (uint)bVar14 * auVar140._8_4_ |
                               (uint)!bVar14 * *(int *)(local_a50.ray + 0x208);
                          bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
                          auVar146._12_4_ =
                               (uint)bVar14 * auVar140._12_4_ |
                               (uint)!bVar14 * *(int *)(local_a50.ray + 0x20c);
                          bVar14 = (bool)((byte)(uVar71 >> 4) & 1);
                          auVar146._16_4_ =
                               (uint)bVar14 * auVar140._16_4_ |
                               (uint)!bVar14 * *(int *)(local_a50.ray + 0x210);
                          bVar14 = (bool)((byte)(uVar71 >> 5) & 1);
                          auVar146._20_4_ =
                               (uint)bVar14 * auVar140._20_4_ |
                               (uint)!bVar14 * *(int *)(local_a50.ray + 0x214);
                          bVar14 = (bool)((byte)(uVar71 >> 6) & 1);
                          auVar146._24_4_ =
                               (uint)bVar14 * auVar140._24_4_ |
                               (uint)!bVar14 * *(int *)(local_a50.ray + 0x218);
                          bVar14 = (bool)((byte)(uVar71 >> 7) & 1);
                          auVar146._28_4_ =
                               (uint)bVar14 * auVar140._28_4_ |
                               (uint)!bVar14 * *(int *)(local_a50.ray + 0x21c);
                          bVar14 = (bool)((byte)(uVar71 >> 8) & 1);
                          auVar146._32_4_ =
                               (uint)bVar14 * auVar140._32_4_ |
                               (uint)!bVar14 * *(int *)(local_a50.ray + 0x220);
                          bVar14 = (bool)((byte)(uVar71 >> 9) & 1);
                          auVar146._36_4_ =
                               (uint)bVar14 * auVar140._36_4_ |
                               (uint)!bVar14 * *(int *)(local_a50.ray + 0x224);
                          bVar14 = (bool)((byte)(uVar71 >> 10) & 1);
                          auVar146._40_4_ =
                               (uint)bVar14 * auVar140._40_4_ |
                               (uint)!bVar14 * *(int *)(local_a50.ray + 0x228);
                          bVar14 = (bool)((byte)(uVar71 >> 0xb) & 1);
                          auVar146._44_4_ =
                               (uint)bVar14 * auVar140._44_4_ |
                               (uint)!bVar14 * *(int *)(local_a50.ray + 0x22c);
                          bVar14 = (bool)((byte)(uVar71 >> 0xc) & 1);
                          auVar146._48_4_ =
                               (uint)bVar14 * auVar140._48_4_ |
                               (uint)!bVar14 * *(int *)(local_a50.ray + 0x230);
                          bVar14 = (bool)((byte)(uVar71 >> 0xd) & 1);
                          auVar146._52_4_ =
                               (uint)bVar14 * auVar140._52_4_ |
                               (uint)!bVar14 * *(int *)(local_a50.ray + 0x234);
                          bVar14 = (bool)((byte)(uVar71 >> 0xe) & 1);
                          auVar146._56_4_ =
                               (uint)bVar14 * auVar140._56_4_ |
                               (uint)!bVar14 * *(int *)(local_a50.ray + 0x238);
                          bVar14 = SUB81(uVar71 >> 0xf,0);
                          auVar146._60_4_ =
                               (uint)bVar14 * auVar140._60_4_ |
                               (uint)!bVar14 * *(int *)(local_a50.ray + 0x23c);
                          *(undefined1 (*) [64])(local_a50.ray + 0x200) = auVar146;
                          bVar67 = 1;
                          if ((short)uVar71 != 0) goto LAB_01e7a9aa;
                        }
                        *(float *)(ray + k * 4 + 0x200) = fVar228;
                      }
                      auVar253 = ZEXT464((uint)fVar228);
                      bVar67 = 0;
                      goto LAB_01e7a9aa;
                    }
                  }
                  bVar70 = uVar71 < 4;
                  uVar71 = uVar71 + 1;
                } while (uVar71 != 5);
                bVar70 = false;
                bVar67 = 5;
LAB_01e7a9a1:
                auVar169 = ZEXT3264(_local_a20);
LAB_01e7a9aa:
                bVar69 = (bool)(bVar69 | bVar70 & bVar67);
                uVar170 = *(undefined4 *)(ray + k * 4 + 0x200);
                auVar167._4_4_ = uVar170;
                auVar167._0_4_ = uVar170;
                auVar167._8_4_ = uVar170;
                auVar167._12_4_ = uVar170;
                auVar167._16_4_ = uVar170;
                auVar167._20_4_ = uVar170;
                auVar167._24_4_ = uVar170;
                auVar167._28_4_ = uVar170;
                auVar53._4_4_ = fStack_75c;
                auVar53._0_4_ = local_760;
                auVar53._8_4_ = fStack_758;
                auVar53._12_4_ = fStack_754;
                auVar53._16_4_ = fStack_750;
                auVar53._20_4_ = fStack_74c;
                auVar53._24_4_ = fStack_748;
                auVar53._28_4_ = fStack_744;
                uVar16 = vcmpps_avx512vl(auVar167,auVar53,0xd);
                bVar57 = ~('\x01' << ((byte)iVar19 & 0x1f)) & bVar57 & (byte)uVar16;
                auVar137 = local_780;
              } while (bVar57 != 0);
            }
            uVar17 = vpcmpgtd_avx512vl(auVar137,local_720);
            uVar18 = vpcmpd_avx512vl(local_720,local_6a0,1);
            auVar209._0_4_ = fVar153 + (float)local_440._0_4_;
            auVar209._4_4_ = fVar153 + (float)local_440._4_4_;
            auVar209._8_4_ = fVar153 + fStack_438;
            auVar209._12_4_ = fVar153 + fStack_434;
            auVar209._16_4_ = fVar153 + fStack_430;
            auVar209._20_4_ = fVar153 + fStack_42c;
            auVar209._24_4_ = fVar153 + fStack_428;
            auVar209._28_4_ = fVar153 + fStack_424;
            uVar16 = vcmpps_avx512vl(auVar209,auVar167,2);
            bVar62 = bVar62 & (byte)uVar18 & (byte)uVar16;
            auVar210._0_4_ = fVar153 + local_700._0_4_;
            auVar210._4_4_ = fVar153 + local_700._4_4_;
            auVar210._8_4_ = fVar153 + local_700._8_4_;
            auVar210._12_4_ = fVar153 + local_700._12_4_;
            auVar210._16_4_ = fVar153 + local_700._16_4_;
            auVar210._20_4_ = fVar153 + local_700._20_4_;
            auVar210._24_4_ = fVar153 + local_700._24_4_;
            auVar210._28_4_ = fVar153 + local_700._28_4_;
            uVar16 = vcmpps_avx512vl(auVar210,auVar167,2);
            bVar55 = bVar55 & (byte)uVar17 & (byte)uVar16 | bVar62;
            if (bVar55 != 0) {
              uVar60 = (ulong)uVar64;
              abStack_1a0[uVar60 * 0x60] = bVar55;
              auVar139._0_4_ =
                   (uint)(bVar62 & 1) * local_440._0_4_ |
                   (uint)!(bool)(bVar62 & 1) * (int)local_700._0_4_;
              bVar70 = (bool)(bVar62 >> 1 & 1);
              auVar139._4_4_ = (uint)bVar70 * local_440._4_4_ | (uint)!bVar70 * (int)local_700._4_4_
              ;
              bVar70 = (bool)(bVar62 >> 2 & 1);
              auVar139._8_4_ = (uint)bVar70 * (int)fStack_438 | (uint)!bVar70 * (int)local_700._8_4_
              ;
              bVar70 = (bool)(bVar62 >> 3 & 1);
              auVar139._12_4_ =
                   (uint)bVar70 * (int)fStack_434 | (uint)!bVar70 * (int)local_700._12_4_;
              bVar70 = (bool)(bVar62 >> 4 & 1);
              auVar139._16_4_ =
                   (uint)bVar70 * (int)fStack_430 | (uint)!bVar70 * (int)local_700._16_4_;
              bVar70 = (bool)(bVar62 >> 5 & 1);
              auVar139._20_4_ =
                   (uint)bVar70 * (int)fStack_42c | (uint)!bVar70 * (int)local_700._20_4_;
              auVar139._24_4_ =
                   (uint)(bVar62 >> 6) * (int)fStack_428 |
                   (uint)!(bool)(bVar62 >> 6) * (int)local_700._24_4_;
              auVar139._28_4_ = local_700._28_4_;
              *(undefined1 (*) [32])(auStack_180 + uVar60 * 0x60) = auVar139;
              uVar71 = vmovlps_avx(local_730);
              (&uStack_160)[uVar60 * 0xc] = uVar71;
              aiStack_158[uVar60 * 0x18] = iVar66 + 1;
              uVar64 = uVar64 + 1;
            }
          }
        }
      }
    }
    do {
      uVar72 = uVar64;
      uVar65 = uVar72 - 1;
      if (uVar72 == 0) {
        if (bVar69 != false) {
          return bVar69;
        }
        uVar170 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar33._4_4_ = uVar170;
        auVar33._0_4_ = uVar170;
        auVar33._8_4_ = uVar170;
        auVar33._12_4_ = uVar170;
        auVar33._16_4_ = uVar170;
        auVar33._20_4_ = uVar170;
        auVar33._24_4_ = uVar170;
        auVar33._28_4_ = uVar170;
        uVar16 = vcmpps_avx512vl(local_680,auVar33,2);
        uVar63 = (uint)uVar16 & (uint)local_8e8 - 1 & (uint)local_8e8;
        local_8e8 = (ulong)uVar63;
        if (uVar63 == 0) {
          return false;
        }
        goto LAB_01e78451;
      }
      uVar71 = (ulong)uVar65;
      lVar61 = uVar71 * 0x60;
      auVar87 = *(undefined1 (*) [32])(auStack_180 + lVar61);
      auVar183._0_4_ = fVar153 + auVar87._0_4_;
      auVar183._4_4_ = fVar153 + auVar87._4_4_;
      auVar183._8_4_ = fVar153 + auVar87._8_4_;
      auVar183._12_4_ = fVar153 + auVar87._12_4_;
      auVar183._16_4_ = fVar153 + auVar87._16_4_;
      auVar183._20_4_ = fVar153 + auVar87._20_4_;
      auVar183._24_4_ = fVar153 + auVar87._24_4_;
      auVar183._28_4_ = fVar153 + auVar87._28_4_;
      uVar170 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar32._4_4_ = uVar170;
      auVar32._0_4_ = uVar170;
      auVar32._8_4_ = uVar170;
      auVar32._12_4_ = uVar170;
      auVar32._16_4_ = uVar170;
      auVar32._20_4_ = uVar170;
      auVar32._24_4_ = uVar170;
      auVar32._28_4_ = uVar170;
      uVar16 = vcmpps_avx512vl(auVar183,auVar32,2);
      uVar59 = (uint)uVar16 & (uint)abStack_1a0[lVar61];
      uVar64 = uVar65;
    } while (uVar59 == 0);
    uVar60 = (&uStack_160)[uVar71 * 0xc];
    auVar171._8_8_ = 0;
    auVar171._0_8_ = uVar60;
    auVar208._8_4_ = 0x7f800000;
    auVar208._0_8_ = 0x7f8000007f800000;
    auVar208._12_4_ = 0x7f800000;
    auVar208._16_4_ = 0x7f800000;
    auVar208._20_4_ = 0x7f800000;
    auVar208._24_4_ = 0x7f800000;
    auVar208._28_4_ = 0x7f800000;
    auVar98 = vblendmps_avx512vl(auVar208,auVar87);
    bVar55 = (byte)uVar59;
    auVar135._0_4_ =
         (uint)(bVar55 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar55 & 1) * (int)auVar87._0_4_;
    bVar70 = (bool)((byte)(uVar59 >> 1) & 1);
    auVar135._4_4_ = (uint)bVar70 * auVar98._4_4_ | (uint)!bVar70 * (int)auVar87._4_4_;
    bVar70 = (bool)((byte)(uVar59 >> 2) & 1);
    auVar135._8_4_ = (uint)bVar70 * auVar98._8_4_ | (uint)!bVar70 * (int)auVar87._8_4_;
    bVar70 = (bool)((byte)(uVar59 >> 3) & 1);
    auVar135._12_4_ = (uint)bVar70 * auVar98._12_4_ | (uint)!bVar70 * (int)auVar87._12_4_;
    bVar70 = (bool)((byte)(uVar59 >> 4) & 1);
    auVar135._16_4_ = (uint)bVar70 * auVar98._16_4_ | (uint)!bVar70 * (int)auVar87._16_4_;
    bVar70 = (bool)((byte)(uVar59 >> 5) & 1);
    auVar135._20_4_ = (uint)bVar70 * auVar98._20_4_ | (uint)!bVar70 * (int)auVar87._20_4_;
    bVar70 = (bool)((byte)(uVar59 >> 6) & 1);
    auVar135._24_4_ = (uint)bVar70 * auVar98._24_4_ | (uint)!bVar70 * (int)auVar87._24_4_;
    auVar135._28_4_ =
         (uVar59 >> 7) * auVar98._28_4_ | (uint)!SUB41(uVar59 >> 7,0) * (int)auVar87._28_4_;
    auVar87 = vshufps_avx(auVar135,auVar135,0xb1);
    auVar87 = vminps_avx(auVar135,auVar87);
    auVar98 = vshufpd_avx(auVar87,auVar87,5);
    auVar87 = vminps_avx(auVar87,auVar98);
    auVar98 = vpermpd_avx2(auVar87,0x4e);
    auVar87 = vminps_avx(auVar87,auVar98);
    uVar16 = vcmpps_avx512vl(auVar135,auVar87,0);
    bVar57 = (byte)uVar16 & bVar55;
    if (bVar57 != 0) {
      uVar59 = (uint)bVar57;
    }
    uVar147 = 0;
    for (; (uVar59 & 1) == 0; uVar59 = uVar59 >> 1 | 0x80000000) {
      uVar147 = uVar147 + 1;
    }
    iVar66 = aiStack_158[uVar71 * 0x18];
    bVar55 = ~('\x01' << ((byte)uVar147 & 0x1f)) & bVar55;
    abStack_1a0[lVar61] = bVar55;
    uVar64 = uVar72;
    if (bVar55 == 0) {
      uVar64 = uVar65;
    }
    uVar170 = (undefined4)uVar60;
    auVar164._4_4_ = uVar170;
    auVar164._0_4_ = uVar170;
    auVar164._8_4_ = uVar170;
    auVar164._12_4_ = uVar170;
    auVar164._16_4_ = uVar170;
    auVar164._20_4_ = uVar170;
    auVar164._24_4_ = uVar170;
    auVar164._28_4_ = uVar170;
    auVar75 = vmovshdup_avx(auVar171);
    auVar75 = vsubps_avx(auVar75,auVar171);
    auVar184._0_4_ = auVar75._0_4_;
    auVar184._4_4_ = auVar184._0_4_;
    auVar184._8_4_ = auVar184._0_4_;
    auVar184._12_4_ = auVar184._0_4_;
    auVar184._16_4_ = auVar184._0_4_;
    auVar184._20_4_ = auVar184._0_4_;
    auVar184._24_4_ = auVar184._0_4_;
    auVar184._28_4_ = auVar184._0_4_;
    auVar75 = vfmadd132ps_fma(auVar184,auVar164,_DAT_01faff20);
    auVar87 = ZEXT1632(auVar75);
    local_400[0] = (RTCHitN)auVar87[0];
    local_400[1] = (RTCHitN)auVar87[1];
    local_400[2] = (RTCHitN)auVar87[2];
    local_400[3] = (RTCHitN)auVar87[3];
    local_400[4] = (RTCHitN)auVar87[4];
    local_400[5] = (RTCHitN)auVar87[5];
    local_400[6] = (RTCHitN)auVar87[6];
    local_400[7] = (RTCHitN)auVar87[7];
    local_400[8] = (RTCHitN)auVar87[8];
    local_400[9] = (RTCHitN)auVar87[9];
    local_400[10] = (RTCHitN)auVar87[10];
    local_400[0xb] = (RTCHitN)auVar87[0xb];
    local_400[0xc] = (RTCHitN)auVar87[0xc];
    local_400[0xd] = (RTCHitN)auVar87[0xd];
    local_400[0xe] = (RTCHitN)auVar87[0xe];
    local_400[0xf] = (RTCHitN)auVar87[0xf];
    local_400[0x10] = (RTCHitN)auVar87[0x10];
    local_400[0x11] = (RTCHitN)auVar87[0x11];
    local_400[0x12] = (RTCHitN)auVar87[0x12];
    local_400[0x13] = (RTCHitN)auVar87[0x13];
    local_400[0x14] = (RTCHitN)auVar87[0x14];
    local_400[0x15] = (RTCHitN)auVar87[0x15];
    local_400[0x16] = (RTCHitN)auVar87[0x16];
    local_400[0x17] = (RTCHitN)auVar87[0x17];
    local_400[0x18] = (RTCHitN)auVar87[0x18];
    local_400[0x19] = (RTCHitN)auVar87[0x19];
    local_400[0x1a] = (RTCHitN)auVar87[0x1a];
    local_400[0x1b] = (RTCHitN)auVar87[0x1b];
    local_400[0x1c] = (RTCHitN)auVar87[0x1c];
    local_400[0x1d] = (RTCHitN)auVar87[0x1d];
    local_400[0x1e] = (RTCHitN)auVar87[0x1e];
    local_400[0x1f] = (RTCHitN)auVar87[0x1f];
    auVar140 = ZEXT864(*(ulong *)(local_400 + (ulong)uVar147 * 4));
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }